

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O0

void aom_lpf_vertical_8_dual_sse2
               (uint8_t *s,int p,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0,
               uint8_t *_blimit1,uint8_t *_limit1,uint8_t *_thresh1)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  longlong lVar5;
  longlong lVar6;
  longlong lVar7;
  longlong lVar8;
  longlong lVar9;
  __m128i *d2d3_00;
  __m128i *d4d5_00;
  undefined4 uVar10;
  undefined6 uVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  undefined6 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined4 uVar31;
  undefined6 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined4 uVar37;
  undefined6 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  ulong *puVar84;
  undefined8 *in_RCX;
  ulong *puVar85;
  undefined8 *in_RDX;
  int in_ESI;
  ulong *puVar86;
  long in_RDI;
  undefined1 *puVar87;
  undefined8 *in_R8;
  undefined8 *in_R9;
  byte bVar88;
  short sVar89;
  ushort uVar90;
  ushort uVar91;
  byte bVar97;
  ushort uVar98;
  ushort uVar99;
  byte bVar101;
  ushort uVar102;
  ushort uVar103;
  byte bVar105;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  ushort uVar106;
  ushort uVar107;
  byte bVar109;
  short sVar110;
  ushort uVar111;
  ushort uVar112;
  byte bVar117;
  ushort uVar118;
  byte bVar121;
  ushort uVar122;
  byte bVar125;
  undefined8 extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  undefined1 auVar94 [16];
  ulong uVar92;
  ulong uVar93;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  byte bVar96;
  byte bVar100;
  byte bVar104;
  byte bVar108;
  ulong uVar113;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  byte bVar116;
  byte bVar120;
  byte bVar124;
  byte bVar128;
  undefined1 auVar95 [16];
  ulong uVar114;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  ushort uVar119;
  ushort uVar123;
  ushort uVar126;
  ushort uVar127;
  ulong uVar115;
  __m128i alVar129;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000010;
  __m128i d6d7;
  __m128i d4d5;
  __m128i d2d3;
  __m128i d0d1;
  __m128i q1;
  __m128i p1;
  __m128i p1p0;
  __m128i q1q0;
  __m128i d7;
  __m128i d5;
  __m128i d3;
  __m128i d1;
  __m128i x7;
  __m128i x6;
  __m128i x5;
  __m128i x4;
  __m128i x3;
  __m128i x2;
  __m128i x1;
  __m128i x0;
  __m128i thresh;
  __m128i limit;
  __m128i blimit;
  __m128i workp_shft2;
  __m128i workp_shft1;
  __m128i workp_shft0;
  __m128i workp_b;
  __m128i workp_a;
  __m128i four;
  __m128i work;
  __m128i abs_p1p0;
  __m128i abs_q1q0;
  __m128i abs_p0q0;
  __m128i abs_p1q1;
  __m128i ff;
  __m128i fe;
  __m128i one;
  __m128i pq2;
  __m128i opq2;
  __m128i work_pq;
  __m128i qs1qs0;
  __m128i ps1ps0;
  __m128i p1p0_1;
  __m128i q1q0_1;
  __m128i q0p0;
  __m128i q1p1;
  __m128i q2p2;
  __m128i flat_q0q1;
  __m128i flat_p1p0;
  __m128i q3p3;
  __m128i q3_16;
  __m128i p3_16;
  __m128i q1_16;
  __m128i q0_16;
  __m128i p0_16;
  __m128i p1_16;
  __m128i q2_16;
  __m128i p2_16;
  __m128i flat;
  __m128i hev;
  __m128i mask;
  __m128i zero;
  __m128i ff_1;
  __m128i hev1;
  __m128i qs1qs0_work;
  __m128i ps1ps0_work;
  __m128i work_1;
  __m128i filter2filter1;
  __m128i filter;
  __m128i t80;
  __m128i t3t4;
  ulong local_1788;
  longlong lStack_1780;
  longlong local_1778;
  longlong lStack_1770;
  ulong local_1768;
  ulong uStack_1760;
  longlong local_1758;
  ulong uStack_1750;
  undefined8 local_1748;
  undefined8 uStack_1740;
  undefined8 local_1738;
  undefined8 uStack_1730;
  ulong local_1728;
  undefined8 uStack_1720;
  ulong local_1718;
  undefined8 uStack_1710;
  longlong local_1708 [3];
  undefined8 uStack_16f0;
  ulong local_16e8 [3];
  undefined8 uStack_16d0;
  longlong local_16c8 [3];
  undefined8 uStack_16b0;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  undefined8 local_1698;
  undefined8 uStack_1690;
  undefined8 local_1688;
  undefined8 uStack_1680;
  undefined8 local_1678;
  undefined8 uStack_1670;
  undefined8 local_1668;
  __m128i *x6_00;
  __m128i *x7_00;
  __m128i *d0d1_00;
  undefined4 uVar130;
  undefined4 uVar131;
  undefined4 uVar132;
  undefined4 uVar133;
  undefined4 uVar134;
  undefined4 uVar135;
  undefined1 local_1628 [52];
  int local_15f4;
  long local_15f0;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  undefined8 local_15a8;
  undefined8 uStack_15a0;
  undefined8 local_1598;
  undefined8 uStack_1590;
  longlong local_1588;
  undefined8 uStack_1580;
  longlong *local_1570;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined8 *local_1550;
  undefined8 local_1548;
  undefined8 uStack_1540;
  undefined8 *local_1530;
  undefined8 local_1528;
  undefined8 uStack_1520;
  undefined8 *local_1510;
  undefined8 local_1508;
  undefined8 uStack_1500;
  undefined8 *local_14f0;
  undefined8 local_14e8;
  undefined8 uStack_14e0;
  undefined8 *local_14d0;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined8 *local_14b0;
  __m128i *local_14a8;
  undefined8 uStack_14a0;
  undefined8 *local_1490;
  ushort local_1358;
  ushort uStack_1356;
  ushort uStack_1354;
  ushort uStack_1352;
  ushort uStack_1350;
  ushort uStack_134e;
  ushort uStack_134c;
  ushort uStack_134a;
  ushort local_1348;
  ushort uStack_1346;
  ushort uStack_1344;
  ushort uStack_1342;
  ushort uStack_1340;
  ushort uStack_133e;
  ushort uStack_133c;
  ushort uStack_133a;
  ushort local_1338;
  ushort uStack_1336;
  ushort uStack_1334;
  ushort uStack_1332;
  ushort uStack_1330;
  ushort uStack_132e;
  ushort uStack_132c;
  ushort uStack_132a;
  short local_1328;
  short sStack_1326;
  short sStack_1324;
  short sStack_1322;
  short sStack_1320;
  short sStack_131e;
  short sStack_131c;
  short sStack_131a;
  short local_1318;
  short sStack_1316;
  short sStack_1314;
  short sStack_1312;
  short sStack_1310;
  short sStack_130e;
  short sStack_130c;
  short sStack_130a;
  undefined8 local_1308;
  undefined8 uStack_1300;
  byte local_12f8;
  byte bStack_12f7;
  byte bStack_12f6;
  byte bStack_12f5;
  byte bStack_12f4;
  byte bStack_12f3;
  byte bStack_12f2;
  byte bStack_12f1;
  byte bStack_12f0;
  byte bStack_12ef;
  byte bStack_12ee;
  byte bStack_12ed;
  byte bStack_12ec;
  byte bStack_12eb;
  byte bStack_12ea;
  byte bStack_12e9;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined1 local_12c8 [16];
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined1 local_12a8;
  undefined1 uStack_12a7;
  undefined1 uStack_12a6;
  undefined1 uStack_12a5;
  undefined1 uStack_12a4;
  undefined1 uStack_12a3;
  undefined1 uStack_12a2;
  undefined1 uStack_12a1;
  undefined1 uStack_12a0;
  undefined1 uStack_129f;
  undefined1 uStack_129e;
  undefined1 uStack_129d;
  undefined1 uStack_129c;
  undefined1 uStack_129b;
  undefined1 uStack_129a;
  undefined1 uStack_1299;
  ulong local_1298;
  undefined8 uStack_1290;
  undefined8 local_1288;
  undefined8 uStack_1280;
  ulong local_1278;
  ulong uStack_1270;
  char local_1268;
  char cStack_1267;
  char cStack_1266;
  char cStack_1265;
  char cStack_1264;
  char cStack_1263;
  char cStack_1262;
  char cStack_1261;
  char cStack_1260;
  char cStack_125f;
  char cStack_125e;
  char cStack_125d;
  char cStack_125c;
  char cStack_125b;
  char cStack_125a;
  char cStack_1259;
  ulong local_1258;
  ulong uStack_1250;
  ulong local_1248;
  ulong uStack_1240;
  uint local_1238;
  uint uStack_1234;
  uint uStack_1230;
  uint uStack_122c;
  ulong local_1228;
  ulong uStack_1220;
  ulong local_1218;
  undefined8 uStack_1210;
  undefined4 local_1208;
  undefined4 uStack_1204;
  undefined4 uStack_11fc;
  undefined4 uStack_11ec;
  ulong local_11e8;
  ulong uStack_11e0;
  char local_11d8;
  char cStack_11d7;
  char cStack_11d6;
  char cStack_11d5;
  char cStack_11d4;
  char cStack_11d3;
  char cStack_11d2;
  char cStack_11d1;
  char cStack_11d0;
  char cStack_11cf;
  char cStack_11ce;
  char cStack_11cd;
  char cStack_11cc;
  char cStack_11cb;
  char cStack_11ca;
  char cStack_11c9;
  char local_11c8;
  char cStack_11c7;
  char cStack_11c6;
  char cStack_11c5;
  char cStack_11c4;
  char cStack_11c3;
  char cStack_11c2;
  char cStack_11c1;
  char cStack_11c0;
  char cStack_11bf;
  char cStack_11be;
  char cStack_11bd;
  char cStack_11bc;
  char cStack_11bb;
  char cStack_11ba;
  char cStack_11b9;
  undefined1 local_11a8;
  char cStack_11a7;
  undefined1 uStack_11a6;
  char cStack_11a5;
  undefined1 uStack_11a4;
  char cStack_11a3;
  undefined1 uStack_11a2;
  char cStack_11a1;
  undefined1 uStack_11a0;
  char cStack_119f;
  undefined1 uStack_119e;
  char cStack_119d;
  undefined1 uStack_119c;
  char cStack_119b;
  undefined1 uStack_119a;
  char cStack_1199;
  undefined1 local_1198;
  char cStack_1197;
  undefined1 uStack_1196;
  char cStack_1195;
  undefined1 uStack_1194;
  char cStack_1193;
  undefined1 uStack_1192;
  char cStack_1191;
  undefined1 uStack_1190;
  char cStack_118f;
  undefined1 uStack_118e;
  char cStack_118d;
  undefined1 uStack_118c;
  char cStack_118b;
  undefined1 uStack_118a;
  char cStack_1189;
  undefined1 local_1188;
  char cStack_1187;
  undefined1 uStack_1186;
  char cStack_1185;
  undefined1 uStack_1184;
  char cStack_1183;
  undefined1 uStack_1182;
  char cStack_1181;
  undefined1 uStack_1180;
  char cStack_117f;
  undefined1 uStack_117e;
  char cStack_117d;
  undefined1 uStack_117c;
  char cStack_117b;
  undefined1 uStack_117a;
  char cStack_1179;
  undefined1 local_1178;
  char cStack_1177;
  undefined1 uStack_1176;
  char cStack_1175;
  undefined1 uStack_1174;
  char cStack_1173;
  undefined1 uStack_1172;
  char cStack_1171;
  undefined1 uStack_1170;
  char cStack_116f;
  undefined1 uStack_116e;
  char cStack_116d;
  undefined1 uStack_116c;
  char cStack_116b;
  undefined1 uStack_116a;
  char cStack_1169;
  undefined1 local_1168;
  char cStack_1167;
  undefined1 uStack_1166;
  char cStack_1165;
  undefined1 uStack_1164;
  char cStack_1163;
  undefined1 uStack_1162;
  char cStack_1161;
  undefined1 uStack_1160;
  char cStack_115f;
  undefined1 uStack_115e;
  char cStack_115d;
  undefined1 uStack_115c;
  char cStack_115b;
  undefined1 uStack_115a;
  char cStack_1159;
  undefined1 local_1158;
  char cStack_1157;
  undefined1 uStack_1156;
  char cStack_1155;
  undefined1 uStack_1154;
  char cStack_1153;
  undefined1 uStack_1152;
  char cStack_1151;
  undefined1 uStack_1150;
  char cStack_114f;
  undefined1 uStack_114e;
  char cStack_114d;
  undefined1 uStack_114c;
  char cStack_114b;
  undefined1 uStack_114a;
  char cStack_1149;
  undefined1 local_1148;
  char cStack_1147;
  undefined1 uStack_1146;
  char cStack_1145;
  undefined1 uStack_1144;
  char cStack_1143;
  undefined1 uStack_1142;
  char cStack_1141;
  undefined1 uStack_1140;
  char cStack_113f;
  undefined1 uStack_113e;
  char cStack_113d;
  undefined1 uStack_113c;
  char cStack_113b;
  undefined1 uStack_113a;
  char cStack_1139;
  undefined1 local_1138;
  char cStack_1137;
  undefined1 uStack_1136;
  char cStack_1135;
  undefined1 uStack_1134;
  char cStack_1133;
  undefined1 uStack_1132;
  char cStack_1131;
  undefined1 uStack_1130;
  char cStack_112f;
  undefined1 uStack_112e;
  char cStack_112d;
  undefined1 uStack_112c;
  char cStack_112b;
  undefined1 uStack_112a;
  char cStack_1129;
  undefined8 local_1128;
  undefined8 uStack_1120;
  ulong local_1118;
  ulong uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined1 (*local_10e0) [16];
  undefined1 (*local_10d8) [16];
  undefined1 (*local_10d0) [16];
  ulong *local_10c8;
  ulong *local_10c0;
  __m128i *local_10b8;
  ulong *local_10b0;
  longlong *local_10a8;
  __m128i *local_10a0;
  ulong *local_1098;
  ulong *local_1090;
  longlong *local_1088;
  __m128i *local_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  longlong lStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  longlong lStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  ulong uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  longlong lStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 local_fd8;
  longlong lStack_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fb8;
  ulong uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  longlong lStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined8 local_f78;
  ulong uStack_f70;
  ulong local_f68;
  ulong uStack_f60;
  ulong local_f58;
  ulong uStack_f50;
  ulong local_f48;
  ulong uStack_f40;
  ulong local_f38;
  ulong uStack_f30;
  undefined8 uStack_ed0;
  undefined8 uStack_ec0;
  undefined8 uStack_e90;
  undefined8 uStack_e80;
  undefined1 local_e5a;
  undefined1 local_e59;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  ulong uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  ulong local_db8;
  undefined8 uStack_db0;
  ulong local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  byte local_d58;
  byte bStack_d57;
  byte bStack_d56;
  byte bStack_d55;
  byte bStack_d54;
  byte bStack_d53;
  byte bStack_d52;
  byte bStack_d51;
  byte bStack_d50;
  byte bStack_d4f;
  byte bStack_d4e;
  byte bStack_d4d;
  byte bStack_d4c;
  byte bStack_d4b;
  byte bStack_d4a;
  byte bStack_d49;
  byte local_d48;
  byte bStack_d47;
  byte bStack_d46;
  byte bStack_d45;
  byte bStack_d44;
  byte bStack_d43;
  byte bStack_d42;
  byte bStack_d41;
  byte bStack_d40;
  byte bStack_d3f;
  byte bStack_d3e;
  byte bStack_d3d;
  byte bStack_d3c;
  byte bStack_d3b;
  byte bStack_d3a;
  byte bStack_d39;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  byte local_cf8;
  byte bStack_cf7;
  byte bStack_cf6;
  byte bStack_cf5;
  byte bStack_cf4;
  byte bStack_cf3;
  byte bStack_cf2;
  byte bStack_cf1;
  byte bStack_cf0;
  byte bStack_cef;
  byte bStack_cee;
  byte bStack_ced;
  byte bStack_cec;
  byte bStack_ceb;
  byte bStack_cea;
  byte bStack_ce9;
  byte local_ce8;
  byte bStack_ce7;
  byte bStack_ce6;
  byte bStack_ce5;
  byte bStack_ce4;
  byte bStack_ce3;
  byte bStack_ce2;
  byte bStack_ce1;
  byte bStack_ce0;
  byte bStack_cdf;
  byte bStack_cde;
  byte bStack_cdd;
  byte bStack_cdc;
  byte bStack_cdb;
  byte bStack_cda;
  byte bStack_cd9;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  ulong local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined4 local_c4c;
  ushort local_c48;
  ushort uStack_c46;
  ushort uStack_c44;
  ushort uStack_c42;
  ushort uStack_c40;
  ushort uStack_c3e;
  ushort uStack_c3c;
  ushort uStack_c3a;
  undefined4 local_c2c;
  ushort local_c28;
  ushort uStack_c26;
  ushort uStack_c24;
  ushort uStack_c22;
  ushort uStack_c20;
  ushort uStack_c1e;
  ushort uStack_c1c;
  ushort uStack_c1a;
  undefined4 local_c0c;
  ushort local_c08;
  ushort uStack_c06;
  ushort uStack_c04;
  ushort uStack_c02;
  ushort uStack_c00;
  ushort uStack_bfe;
  ushort uStack_bfc;
  ushort uStack_bfa;
  undefined4 local_bec;
  ushort local_be8;
  ushort uStack_be6;
  ushort uStack_be4;
  ushort uStack_be2;
  ushort uStack_be0;
  ushort uStack_bde;
  ushort uStack_bdc;
  ushort uStack_bda;
  undefined4 local_bcc;
  ushort local_bc8;
  ushort uStack_bc6;
  ushort uStack_bc4;
  ushort uStack_bc2;
  ushort uStack_bc0;
  ushort uStack_bbe;
  ushort uStack_bbc;
  ushort uStack_bba;
  undefined4 local_bac;
  ushort local_ba8;
  ushort uStack_ba6;
  ushort uStack_ba4;
  ushort uStack_ba2;
  ushort uStack_ba0;
  ushort uStack_b9e;
  ushort uStack_b9c;
  ushort uStack_b9a;
  undefined4 local_b8c;
  undefined8 local_b88;
  undefined8 uStack_b80;
  ulong local_b78;
  ulong uStack_b70;
  ulong local_b68;
  ulong uStack_b60;
  ulong local_b58;
  ulong uStack_b50;
  ulong local_b48;
  ulong uStack_b40;
  ulong local_b38;
  ulong uStack_b30;
  ulong local_b28;
  ulong uStack_b20;
  ulong local_b18;
  ulong uStack_b10;
  ulong local_b08;
  ulong uStack_b00;
  ulong local_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined1 local_a88 [16];
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  ulong local_a58;
  ulong uStack_a50;
  char local_a48;
  char cStack_a47;
  char cStack_a46;
  char cStack_a45;
  char cStack_a44;
  char cStack_a43;
  char cStack_a42;
  char cStack_a41;
  char cStack_a40;
  char cStack_a3f;
  char cStack_a3e;
  char cStack_a3d;
  char cStack_a3c;
  char cStack_a3b;
  char cStack_a3a;
  char cStack_a39;
  ulong local_a38;
  ulong uStack_a30;
  char local_a28;
  char cStack_a27;
  char cStack_a26;
  char cStack_a25;
  char cStack_a24;
  char cStack_a23;
  char cStack_a22;
  char cStack_a21;
  char cStack_a20;
  char cStack_a1f;
  char cStack_a1e;
  char cStack_a1d;
  char cStack_a1c;
  char cStack_a1b;
  char cStack_a1a;
  char cStack_a19;
  char local_a18;
  char cStack_a17;
  char cStack_a16;
  char cStack_a15;
  char cStack_a14;
  char cStack_a13;
  char cStack_a12;
  char cStack_a11;
  char cStack_a10;
  char cStack_a0f;
  char cStack_a0e;
  char cStack_a0d;
  char cStack_a0c;
  char cStack_a0b;
  char cStack_a0a;
  byte bStack_a09;
  ulong local_a08;
  ulong uStack_a00;
  ulong local_9f8;
  ulong uStack_9f0;
  ulong local_9e8;
  ulong uStack_9e0;
  ulong local_9d8;
  ulong uStack_9d0;
  ulong local_9c8;
  ulong uStack_9c0;
  ulong local_9b8;
  ulong uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  ulong local_988;
  ulong uStack_980;
  ulong local_978;
  ulong uStack_970;
  ulong local_968;
  ulong uStack_960;
  ulong local_958;
  ulong uStack_950;
  undefined2 local_93a;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  short local_908;
  short sStack_906;
  short sStack_904;
  short sStack_902;
  short sStack_900;
  short sStack_8fe;
  short sStack_8fc;
  short sStack_8fa;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  short local_8e8;
  short sStack_8e6;
  short sStack_8e4;
  short sStack_8e2;
  short sStack_8e0;
  short sStack_8de;
  short sStack_8dc;
  short sStack_8da;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  short local_8a8;
  short sStack_8a6;
  short sStack_8a4;
  short sStack_8a2;
  short sStack_8a0;
  short sStack_89e;
  short sStack_89c;
  short sStack_89a;
  undefined8 local_898;
  undefined8 uStack_890;
  short local_888;
  short sStack_886;
  short sStack_884;
  short sStack_882;
  short sStack_880;
  short sStack_87e;
  short sStack_87c;
  short sStack_87a;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  short local_848;
  short sStack_846;
  short sStack_844;
  short sStack_842;
  short sStack_840;
  short sStack_83e;
  short sStack_83c;
  short sStack_83a;
  undefined8 local_838;
  undefined8 uStack_830;
  short local_828;
  short sStack_826;
  short sStack_824;
  short sStack_822;
  short sStack_820;
  short sStack_81e;
  short sStack_81c;
  short sStack_81a;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  short local_7e8;
  short sStack_7e6;
  short sStack_7e4;
  short sStack_7e2;
  short sStack_7e0;
  short sStack_7de;
  short sStack_7dc;
  short sStack_7da;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  short local_7c8;
  short sStack_7c6;
  short sStack_7c4;
  short sStack_7c2;
  short sStack_7c0;
  short sStack_7be;
  short sStack_7bc;
  short sStack_7ba;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  short local_788;
  short sStack_786;
  short sStack_784;
  short sStack_782;
  short sStack_780;
  short sStack_77e;
  short sStack_77c;
  short sStack_77a;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  short local_728;
  short sStack_726;
  short sStack_724;
  short sStack_722;
  short sStack_720;
  short sStack_71e;
  short sStack_71c;
  short sStack_71a;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  short local_6e8;
  short sStack_6e6;
  short sStack_6e4;
  short sStack_6e2;
  short sStack_6e0;
  short sStack_6de;
  short sStack_6dc;
  short sStack_6da;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  short local_6b8;
  short sStack_6b6;
  short sStack_6b4;
  short sStack_6b2;
  short sStack_6b0;
  short sStack_6ae;
  short sStack_6ac;
  short sStack_6aa;
  short local_6a8;
  short sStack_6a6;
  short sStack_6a4;
  short sStack_6a2;
  short sStack_6a0;
  short sStack_69e;
  short sStack_69c;
  short sStack_69a;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined1 local_548;
  undefined1 local_547;
  undefined1 local_546;
  undefined1 local_545;
  undefined1 local_544;
  undefined1 local_543;
  undefined1 local_542;
  undefined1 local_541;
  undefined1 local_540;
  undefined1 local_53f;
  undefined1 local_53e;
  undefined1 local_53d;
  undefined1 local_53c;
  undefined1 local_53b;
  undefined1 local_53a;
  undefined1 local_539;
  ulong local_538;
  undefined8 uStack_530;
  undefined1 local_528;
  undefined1 local_527;
  undefined1 local_526;
  undefined1 local_525;
  undefined1 local_524;
  undefined1 local_523;
  undefined1 local_522;
  undefined1 local_521;
  undefined1 local_520;
  undefined1 local_51f;
  undefined1 local_51e;
  undefined1 local_51d;
  undefined1 local_51c;
  undefined1 local_51b;
  undefined1 local_51a;
  undefined1 local_519;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined4 uStack_4b0;
  undefined4 uStack_4ac;
  undefined4 local_4a8;
  undefined4 uStack_4a4;
  undefined4 uStack_4a0;
  undefined4 uStack_49c;
  undefined1 local_498;
  undefined1 uStack_497;
  undefined1 uStack_496;
  undefined1 uStack_495;
  undefined1 uStack_494;
  undefined1 uStack_493;
  undefined1 uStack_492;
  undefined1 uStack_491;
  undefined1 uStack_490;
  undefined1 uStack_48f;
  undefined1 uStack_48e;
  undefined1 uStack_48d;
  undefined1 uStack_48c;
  undefined1 uStack_48b;
  undefined1 uStack_48a;
  undefined1 uStack_489;
  undefined8 local_488;
  undefined4 uStack_480;
  undefined4 uStack_47c;
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  ulong local_428;
  ulong uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  ulong *local_408;
  ulong *local_400;
  undefined8 *local_3f8;
  ulong *local_3f0;
  ulong *local_3e8;
  ulong *local_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  ulong local_398;
  ulong uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  ulong local_378;
  ulong uStack_370;
  ulong local_368;
  ulong uStack_360;
  undefined1 local_349;
  ulong local_348;
  ulong uStack_340;
  ulong local_338;
  ulong uStack_330;
  ulong local_328;
  ulong uStack_320;
  ulong local_318;
  ulong uStack_310;
  ulong local_308;
  ulong uStack_300;
  ulong local_2f8;
  undefined8 uStack_2f0;
  ulong local_2e8;
  ulong uStack_2e0;
  ulong local_2d8;
  ulong uStack_2d0;
  ulong local_2c8;
  ulong uStack_2c0;
  ulong local_2b8;
  ulong uStack_2b0;
  ulong local_2a8;
  ulong uStack_2a0;
  ulong uStack_290;
  ulong local_288;
  ulong uStack_280;
  undefined8 local_268;
  ulong uStack_260;
  undefined8 local_258;
  ulong uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  ulong uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  ulong uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  ulong uStack_1e0;
  ulong local_1d8;
  undefined8 uStack_1d0;
  ulong local_1c8;
  ulong uStack_1c0;
  ulong local_1b8;
  ulong uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  ulong local_198;
  ulong uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  ulong local_178;
  ulong uStack_170;
  ulong local_168;
  ulong uStack_160;
  ulong local_158;
  ulong uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  ulong local_e8;
  ulong uStack_e0;
  undefined1 local_d8;
  undefined1 local_d7;
  undefined1 local_d6;
  undefined1 local_d5;
  undefined1 local_d4;
  undefined1 local_d3;
  undefined1 local_d2;
  undefined1 local_d1;
  undefined1 local_d0;
  undefined1 local_cf;
  undefined1 local_ce;
  undefined1 local_cd;
  undefined1 local_cc;
  undefined1 local_cb;
  undefined1 local_ca;
  undefined1 local_c9;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined1 local_ac;
  undefined1 local_ab;
  undefined1 local_aa;
  undefined1 local_a9;
  undefined1 local_a8;
  undefined1 local_a7;
  undefined1 local_a6;
  undefined1 local_a5;
  undefined1 local_a4;
  undefined1 local_a3;
  undefined1 local_a2;
  undefined1 local_a1;
  undefined1 local_a0;
  undefined1 local_9f;
  undefined1 local_9e;
  undefined1 local_9d;
  undefined4 local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  ulong local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  
  uVar1 = *in_RDX;
  uStack_1590 = in_RDX[1];
  uVar2 = *in_R9;
  uStack_15a0 = in_R9[1];
  local_1598._0_4_ = (undefined4)uVar1;
  local_1598._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
  local_15a8._0_4_ = (undefined4)uVar2;
  local_15a8._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
  local_1628._0_4_ = (undefined4)local_1598;
  local_1628._4_4_ = (undefined4)local_15a8;
  local_1628._8_4_ = local_1598._4_4_;
  local_1628._12_4_ = local_15a8._4_4_;
  local_15b8 = *in_RCX;
  uStack_15b0 = in_RCX[1];
  local_15c8 = *in_stack_00000008;
  uStack_15c0 = in_stack_00000008[1];
  uVar3 = *in_R8;
  uStack_15d0 = in_R8[1];
  uVar4 = *in_stack_00000010;
  uStack_15e0 = in_stack_00000010[1];
  local_15d8._0_4_ = (undefined4)uVar3;
  local_15d8._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
  local_15e8._0_4_ = (undefined4)uVar4;
  local_15e8._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
  local_1490 = (undefined8 *)(in_RDI + -4);
  x7_00 = (__m128i *)*local_1490;
  uStack_14a0 = 0;
  d0d1_00 = (__m128i *)0x0;
  local_14b0 = (undefined8 *)(in_RDI + -4 + (long)in_ESI);
  local_1668 = *local_14b0;
  uStack_14c0 = 0;
  x6_00 = (__m128i *)0x0;
  local_14d0 = (undefined8 *)(in_RDI + -4 + (long)(in_ESI * 2));
  local_1678 = *local_14d0;
  uStack_14e0 = 0;
  uStack_1670 = 0;
  local_14f0 = (undefined8 *)(in_RDI + -4 + (long)(in_ESI * 3));
  local_1688 = *local_14f0;
  uStack_1500 = 0;
  uStack_1680 = 0;
  local_1510 = (undefined8 *)(in_RDI + -4 + (long)(in_ESI << 2));
  local_1698 = *local_1510;
  uStack_1520 = 0;
  uStack_1690 = 0;
  local_1530 = (undefined8 *)(in_RDI + -4 + (long)(in_ESI * 5));
  local_16a8 = *local_1530;
  uStack_1540 = 0;
  uStack_16a0 = 0;
  local_1550 = (undefined8 *)(in_RDI + -4 + (long)(in_ESI * 6));
  local_16c8[2] = *local_1550;
  uStack_1560 = 0;
  uStack_16b0 = 0;
  local_1570 = (longlong *)(in_RDI + -4 + (long)(in_ESI * 7));
  local_16c8[0] = *local_1570;
  uStack_1580 = 0;
  local_16c8[1] = 0;
  puVar87 = &stack0xffffffffffffe9a8;
  d2d3_00 = (__m128i *)CONCAT44((undefined4)local_15e8,(undefined4)local_15d8);
  d4d5_00 = (__m128i *)CONCAT44(local_15e8._4_4_,local_15d8._4_4_);
  uVar130 = (undefined4)local_15d8;
  uVar131 = (undefined4)local_15e8;
  uVar132 = local_15d8._4_4_;
  uVar133 = local_15e8._4_4_;
  uVar134 = (undefined4)local_15b8;
  uVar135 = (undefined4)local_15c8;
  local_15f4 = in_ESI;
  local_15f0 = in_RDI;
  local_15e8 = uVar4;
  local_15d8 = uVar3;
  local_15a8 = uVar2;
  local_1598 = uVar1;
  local_1588 = local_16c8[0];
  local_1568 = local_16c8[2];
  local_1548 = local_16a8;
  local_1528 = local_1698;
  local_1508 = local_1688;
  local_14e8 = local_1678;
  local_14c8 = local_1668;
  local_14a8 = x7_00;
  transpose8x8_sse2((__m128i *)&local_1778,(__m128i *)&local_1768,(__m128i *)&local_1758,
                    (__m128i *)local_16c8,(__m128i *)(local_16c8 + 2),(__m128i *)0x3e9bc7,
                    (__m128i *)0x0,x7_00,(__m128i *)0x0,d2d3_00,d4d5_00,
                    (__m128i *)CONCAT44((undefined4)local_15c8,(undefined4)local_15b8));
  local_16e8[2] = uStack_1750;
  uStack_16d0 = 0;
  local_16e8[0] = uStack_1760;
  local_16e8[1] = 0;
  local_1708[2] = lStack_1770;
  uStack_16f0 = 0;
  local_1708[0] = lStack_1780;
  local_1708[1] = 0;
  local_1088 = local_1708;
  puVar86 = local_16e8 + 2;
  local_10a8 = local_1708 + 2;
  puVar85 = local_16e8;
  local_10c0 = &local_1718;
  local_10c8 = &local_1728;
  local_10d0 = (undefined1 (*) [16])local_1628;
  local_10d8 = (undefined1 (*) [16])&stack0xffffffffffffe9c8;
  local_10e0 = (undefined1 (*) [16])&stack0xffffffffffffe9b8;
  local_1078 = 0;
  uStack_1070 = 0;
  local_10f8 = 0;
  uStack_10f0 = 0;
  uStack_e80 = 0;
  uStack_e90 = 0;
  uStack_11e0 = local_1788;
  uStack_1220 = local_1768;
  uStack_ec0 = 0;
  local_1228 = uStack_1760;
  uStack_ed0 = 0;
  uStack_11fc = (undefined4)((ulong)local_1778 >> 0x20);
  uStack_11ec = (undefined4)((ulong)lStack_1770 >> 0x20);
  local_11e8._0_4_ = (undefined4)uStack_1750;
  uStack_49c = uStack_11fc;
  local_498 = (undefined1)local_1768;
  uStack_497 = (undefined1)(local_1768 >> 8);
  uStack_496 = (undefined1)(local_1768 >> 0x10);
  uStack_495 = (undefined1)(local_1768 >> 0x18);
  uStack_4ac = uStack_11ec;
  _local_4a8 = CONCAT44((int)(uStack_1760 >> 0x20),(undefined4)local_11e8);
  uStack_1210 = CONCAT44(uStack_11fc,uStack_4a0);
  _local_1208 = CONCAT44(uStack_11ec,uStack_4b0);
  local_e59 = 1;
  local_539 = 1;
  local_53a = 1;
  local_53b = 1;
  local_53c = 1;
  local_53d = 1;
  local_53e = 1;
  local_53f = 1;
  local_540 = 1;
  local_541 = 1;
  local_542 = 1;
  local_543 = 1;
  local_544 = 1;
  local_545 = 1;
  local_546 = 1;
  local_547 = 1;
  local_548 = 1;
  local_1288 = 0x101010101010101;
  uStack_1280 = 0x101010101010101;
  local_e5a = 0xfe;
  local_519 = 0xfe;
  local_51a = 0xfe;
  local_51b = 0xfe;
  local_51c = 0xfe;
  local_51d = 0xfe;
  local_51e = 0xfe;
  local_51f = 0xfe;
  local_520 = 0xfe;
  local_521 = 0xfe;
  local_522 = 0xfe;
  local_523 = 0xfe;
  local_524 = 0xfe;
  local_525 = 0xfe;
  local_526 = 0xfe;
  local_527 = 0xfe;
  local_528 = 0xfe;
  local_1298 = 0xfefefefefefefefe;
  uStack_1290 = 0xfefefefefefefefe;
  local_12a8 = 0xff;
  uStack_12a7 = 0xff;
  uStack_12a6 = 0xff;
  uStack_12a5 = 0xff;
  uStack_12a4 = 0xff;
  uStack_12a3 = 0xff;
  uStack_12a2 = 0xff;
  uStack_12a1 = 0xff;
  uStack_12a0 = 0xff;
  uStack_129f = 0xff;
  uStack_129e = 0xff;
  uStack_129d = 0xff;
  uStack_129c = 0xff;
  uStack_129b = 0xff;
  uStack_129a = 0xff;
  uStack_1299 = 0xff;
  alVar129[1] = (longlong)puVar85;
  alVar129[0] = (longlong)&local_1788;
  a[1] = (longlong)puVar86;
  a[0] = (longlong)puVar87;
  local_11e8 = uStack_1750;
  local_10b8 = (__m128i *)&local_1778;
  local_10b0 = puVar85;
  local_10a0 = (__m128i *)&local_1768;
  local_1098 = &local_1788;
  local_1090 = puVar86;
  local_1080 = (__m128i *)&local_1758;
  local_db8 = local_1298;
  uStack_db0 = uStack_1290;
  local_da8 = local_1298;
  uStack_da0 = uStack_1290;
  local_558 = local_1288;
  uStack_550 = uStack_1280;
  local_538 = local_1298;
  uStack_530 = uStack_1290;
  alVar129 = abs_diff(a,alVar129);
  b[0] = alVar129[1];
  uStack_12d0 = 0;
  b[1] = (longlong)puVar85;
  a_00[1] = (longlong)puVar86;
  a_00[0] = (longlong)puVar87;
  local_12e8 = extraout_XMM0_Qa;
  uStack_12e0 = extraout_XMM0_Qb;
  local_12d8 = extraout_XMM0_Qb;
  alVar129 = abs_diff(a_00,b);
  b_00[0] = alVar129[1];
  local_ca8 = local_12e8;
  uVar17 = local_ca8;
  uStack_ca0 = uStack_12e0;
  uVar18 = uStack_ca0;
  local_cb8 = local_12d8;
  uVar15 = local_cb8;
  uStack_cb0 = uStack_12d0;
  uVar16 = uStack_cb0;
  local_ca8._0_1_ = (byte)local_12e8;
  local_ca8._1_1_ = (byte)((ulong)local_12e8 >> 8);
  local_ca8._2_1_ = (byte)((ulong)local_12e8 >> 0x10);
  local_ca8._3_1_ = (byte)((ulong)local_12e8 >> 0x18);
  local_ca8._4_1_ = (byte)((ulong)local_12e8 >> 0x20);
  local_ca8._5_1_ = (byte)((ulong)local_12e8 >> 0x28);
  local_ca8._6_1_ = (byte)((ulong)local_12e8 >> 0x30);
  local_ca8._7_1_ = (byte)((ulong)local_12e8 >> 0x38);
  uStack_ca0._0_1_ = (byte)uStack_12e0;
  uStack_ca0._1_1_ = (byte)((ulong)uStack_12e0 >> 8);
  uStack_ca0._2_1_ = (byte)((ulong)uStack_12e0 >> 0x10);
  uStack_ca0._3_1_ = (byte)((ulong)uStack_12e0 >> 0x18);
  uStack_ca0._4_1_ = (byte)((ulong)uStack_12e0 >> 0x20);
  uStack_ca0._5_1_ = (byte)((ulong)uStack_12e0 >> 0x28);
  uStack_ca0._6_1_ = (byte)((ulong)uStack_12e0 >> 0x30);
  uStack_ca0._7_1_ = (byte)((ulong)uStack_12e0 >> 0x38);
  local_cb8._0_1_ = (byte)local_12d8;
  local_cb8._1_1_ = (byte)((ulong)local_12d8 >> 8);
  local_cb8._2_1_ = (byte)((ulong)local_12d8 >> 0x10);
  local_cb8._3_1_ = (byte)((ulong)local_12d8 >> 0x18);
  local_cb8._4_1_ = (byte)((ulong)local_12d8 >> 0x20);
  local_cb8._5_1_ = (byte)((ulong)local_12d8 >> 0x28);
  local_cb8._6_1_ = (byte)((ulong)local_12d8 >> 0x30);
  local_cb8._7_1_ = (byte)((ulong)local_12d8 >> 0x38);
  uStack_cb0._0_1_ = (byte)uStack_12d0;
  uStack_cb0._1_1_ = (byte)((ulong)uStack_12d0 >> 8);
  uStack_cb0._2_1_ = (byte)((ulong)uStack_12d0 >> 0x10);
  uStack_cb0._3_1_ = (byte)((ulong)uStack_12d0 >> 0x18);
  uStack_cb0._4_1_ = (byte)((ulong)uStack_12d0 >> 0x20);
  uStack_cb0._5_1_ = (byte)((ulong)uStack_12d0 >> 0x28);
  uStack_cb0._6_1_ = (byte)((ulong)uStack_12d0 >> 0x30);
  uStack_cb0._7_1_ = (byte)((ulong)uStack_12d0 >> 0x38);
  local_1128._0_2_ =
       CONCAT11((local_ca8._1_1_ < local_cb8._1_1_) * local_cb8._1_1_ |
                (local_ca8._1_1_ >= local_cb8._1_1_) * local_ca8._1_1_,
                ((byte)local_ca8 < (byte)local_cb8) * (byte)local_cb8 |
                ((byte)local_ca8 >= (byte)local_cb8) * (byte)local_ca8);
  local_1128._0_3_ =
       CONCAT12((local_ca8._2_1_ < local_cb8._2_1_) * local_cb8._2_1_ |
                (local_ca8._2_1_ >= local_cb8._2_1_) * local_ca8._2_1_,(undefined2)local_1128);
  local_1128._0_4_ =
       CONCAT13((local_ca8._3_1_ < local_cb8._3_1_) * local_cb8._3_1_ |
                (local_ca8._3_1_ >= local_cb8._3_1_) * local_ca8._3_1_,(undefined3)local_1128);
  local_1128._0_5_ =
       CONCAT14((local_ca8._4_1_ < local_cb8._4_1_) * local_cb8._4_1_ |
                (local_ca8._4_1_ >= local_cb8._4_1_) * local_ca8._4_1_,(undefined4)local_1128);
  local_1128._0_6_ =
       CONCAT15((local_ca8._5_1_ < local_cb8._5_1_) * local_cb8._5_1_ |
                (local_ca8._5_1_ >= local_cb8._5_1_) * local_ca8._5_1_,(undefined5)local_1128);
  local_1128._0_7_ =
       CONCAT16((local_ca8._6_1_ < local_cb8._6_1_) * local_cb8._6_1_ |
                (local_ca8._6_1_ >= local_cb8._6_1_) * local_ca8._6_1_,(undefined6)local_1128);
  local_1128 = CONCAT17((local_ca8._7_1_ < local_cb8._7_1_) * local_cb8._7_1_ |
                        (local_ca8._7_1_ >= local_cb8._7_1_) * local_ca8._7_1_,
                        (undefined7)local_1128);
  uStack_1120._0_1_ =
       ((byte)uStack_ca0 < (byte)uStack_cb0) * (byte)uStack_cb0 |
       ((byte)uStack_ca0 >= (byte)uStack_cb0) * (byte)uStack_ca0;
  uStack_1120._1_1_ =
       (uStack_ca0._1_1_ < uStack_cb0._1_1_) * uStack_cb0._1_1_ |
       (uStack_ca0._1_1_ >= uStack_cb0._1_1_) * uStack_ca0._1_1_;
  uStack_1120._2_1_ =
       (uStack_ca0._2_1_ < uStack_cb0._2_1_) * uStack_cb0._2_1_ |
       (uStack_ca0._2_1_ >= uStack_cb0._2_1_) * uStack_ca0._2_1_;
  uStack_1120._3_1_ =
       (uStack_ca0._3_1_ < uStack_cb0._3_1_) * uStack_cb0._3_1_ |
       (uStack_ca0._3_1_ >= uStack_cb0._3_1_) * uStack_ca0._3_1_;
  uStack_1120._4_1_ =
       (uStack_ca0._4_1_ < uStack_cb0._4_1_) * uStack_cb0._4_1_ |
       (uStack_ca0._4_1_ >= uStack_cb0._4_1_) * uStack_ca0._4_1_;
  uStack_1120._5_1_ =
       (uStack_ca0._5_1_ < uStack_cb0._5_1_) * uStack_cb0._5_1_ |
       (uStack_ca0._5_1_ >= uStack_cb0._5_1_) * uStack_ca0._5_1_;
  uStack_1120._6_1_ =
       (uStack_ca0._6_1_ < uStack_cb0._6_1_) * uStack_cb0._6_1_ |
       (uStack_ca0._6_1_ >= uStack_cb0._6_1_) * uStack_ca0._6_1_;
  uStack_1120._7_1_ =
       (uStack_ca0._7_1_ < uStack_cb0._7_1_) * uStack_cb0._7_1_ |
       (uStack_ca0._7_1_ >= uStack_cb0._7_1_) * uStack_ca0._7_1_;
  local_a78 = *(undefined8 *)*local_10e0;
  uStack_a70 = *(undefined8 *)(*local_10e0 + 8);
  local_a68 = local_1128;
  uStack_a60 = uStack_1120;
  auVar69._8_8_ = uStack_1120;
  auVar69._0_8_ = local_1128;
  auVar94 = psubusb(auVar69,*local_10e0);
  local_1118 = auVar94._0_8_;
  uStack_1110 = auVar94._8_8_;
  local_dc8 = local_1118;
  uVar114 = local_dc8;
  uStack_dc0 = uStack_1110;
  uVar12 = uStack_dc0;
  local_dd8 = local_10f8;
  uVar3 = local_dd8;
  uStack_dd0 = uStack_10f0;
  uVar4 = uStack_dd0;
  local_dc8._0_1_ = auVar94[0];
  local_dc8._1_1_ = auVar94[1];
  local_dc8._2_1_ = auVar94[2];
  local_dc8._3_1_ = auVar94[3];
  local_dc8._4_1_ = auVar94[4];
  local_dc8._5_1_ = auVar94[5];
  local_dc8._6_1_ = auVar94[6];
  local_dc8._7_1_ = auVar94[7];
  uStack_dc0._0_1_ = auVar94[8];
  uStack_dc0._1_1_ = auVar94[9];
  uStack_dc0._2_1_ = auVar94[10];
  uStack_dc0._3_1_ = auVar94[0xb];
  uStack_dc0._4_1_ = auVar94[0xc];
  uStack_dc0._5_1_ = auVar94[0xd];
  uStack_dc0._6_1_ = auVar94[0xe];
  uStack_dc0._7_1_ = auVar94[0xf];
  local_dd8._0_1_ = (char)local_10f8;
  local_dd8._1_1_ = (char)((ulong)local_10f8 >> 8);
  local_dd8._2_1_ = (char)((ulong)local_10f8 >> 0x10);
  local_dd8._3_1_ = (char)((ulong)local_10f8 >> 0x18);
  local_dd8._4_1_ = (char)((ulong)local_10f8 >> 0x20);
  local_dd8._5_1_ = (char)((ulong)local_10f8 >> 0x28);
  local_dd8._6_1_ = (char)((ulong)local_10f8 >> 0x30);
  local_dd8._7_1_ = (char)((ulong)local_10f8 >> 0x38);
  uStack_dd0._0_1_ = (char)uStack_10f0;
  uStack_dd0._1_1_ = (char)((ulong)uStack_10f0 >> 8);
  uStack_dd0._2_1_ = (char)((ulong)uStack_10f0 >> 0x10);
  uStack_dd0._3_1_ = (char)((ulong)uStack_10f0 >> 0x18);
  uStack_dd0._4_1_ = (char)((ulong)uStack_10f0 >> 0x20);
  uStack_dd0._5_1_ = (char)((ulong)uStack_10f0 >> 0x28);
  uStack_dd0._6_1_ = (char)((ulong)uStack_10f0 >> 0x30);
  uStack_dd0._7_1_ = (char)((ulong)uStack_10f0 >> 0x38);
  local_a28 = -((char)local_dc8 == (char)local_dd8);
  cStack_a27 = -(local_dc8._1_1_ == local_dd8._1_1_);
  cStack_a26 = -(local_dc8._2_1_ == local_dd8._2_1_);
  cStack_a25 = -(local_dc8._3_1_ == local_dd8._3_1_);
  cStack_a24 = -(local_dc8._4_1_ == local_dd8._4_1_);
  cStack_a23 = -(local_dc8._5_1_ == local_dd8._5_1_);
  cStack_a22 = -(local_dc8._6_1_ == local_dd8._6_1_);
  cStack_a21 = -(local_dc8._7_1_ == local_dd8._7_1_);
  cStack_a20 = -((char)uStack_dc0 == (char)uStack_dd0);
  cStack_a1f = -(uStack_dc0._1_1_ == uStack_dd0._1_1_);
  cStack_a1e = -(uStack_dc0._2_1_ == uStack_dd0._2_1_);
  cStack_a1d = -(uStack_dc0._3_1_ == uStack_dd0._3_1_);
  cStack_a1c = -(uStack_dc0._4_1_ == uStack_dd0._4_1_);
  cStack_a1b = -(uStack_dc0._5_1_ == uStack_dd0._5_1_);
  cStack_a1a = -(uStack_dc0._6_1_ == uStack_dd0._6_1_);
  cStack_a19 = -(uStack_dc0._7_1_ == uStack_dd0._7_1_);
  local_a38 = CONCAT17(uStack_12a1,
                       CONCAT16(uStack_12a2,
                                CONCAT15(uStack_12a3,
                                         CONCAT14(uStack_12a4,
                                                  CONCAT13(uStack_12a5,
                                                           CONCAT12(uStack_12a6,
                                                                    CONCAT11(uStack_12a7,local_12a8)
                                                                   ))))));
  uStack_a30 = CONCAT17(uStack_1299,
                        CONCAT16(uStack_129a,
                                 CONCAT15(uStack_129b,
                                          CONCAT14(uStack_129c,
                                                   CONCAT13(uStack_129d,
                                                            CONCAT12(uStack_129e,
                                                                     CONCAT11(uStack_129f,
                                                                              uStack_12a0)))))));
  local_f48 = CONCAT17(cStack_a21,
                       CONCAT16(cStack_a22,
                                CONCAT15(cStack_a23,
                                         CONCAT14(cStack_a24,
                                                  CONCAT13(cStack_a25,
                                                           CONCAT12(cStack_a26,
                                                                    CONCAT11(cStack_a27,local_a28)))
                                                 )))) ^ local_a38;
  uStack_f40 = CONCAT17(cStack_a19,
                        CONCAT16(cStack_a1a,
                                 CONCAT15(cStack_a1b,
                                          CONCAT14(cStack_a1c,
                                                   CONCAT13(cStack_a1d,
                                                            CONCAT12(cStack_a1e,
                                                                     CONCAT11(cStack_a1f,cStack_a20)
                                                                    )))))) ^ uStack_a30;
  auVar65._8_8_ = extraout_XMM0_Qa_00;
  auVar65._0_8_ = extraout_XMM0_Qa_00;
  auVar95._8_8_ = extraout_XMM0_Qa_00;
  auVar95._0_8_ = extraout_XMM0_Qa_00;
  local_12c8 = paddusb(auVar65,auVar95);
  uStack_ae0 = 0;
  local_af8 = local_1298;
  uStack_af0 = uStack_1290;
  uVar92 = extraout_XMM0_Qb_00 & local_1298;
  uStack_b80 = 0;
  local_b8c = 1;
  local_b88._0_2_ = (ushort)uVar92;
  local_b88._2_2_ = (ushort)(uVar92 >> 0x10);
  local_b88._4_2_ = (ushort)(uVar92 >> 0x20);
  local_12b8 = CONCAT26((ushort)(uVar92 >> 0x31),
                        CONCAT24(local_b88._4_2_ >> 1,
                                 CONCAT22(local_b88._2_2_ >> 1,(ushort)local_b88 >> 1)));
  uStack_12b0 = 0;
  local_c88 = local_12c8._0_8_;
  uStack_c80 = local_12c8._8_8_;
  local_c98 = local_12b8;
  uStack_c90 = 0;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = local_12b8;
  local_a88 = paddusb(local_12c8,auVar94);
  local_a98 = *(undefined8 *)*local_10d0;
  uStack_a90 = *(undefined8 *)(*local_10d0 + 8);
  auVar94 = psubusb(local_a88,*local_10d0);
  local_1108 = auVar94._0_8_;
  uStack_1100 = auVar94._8_8_;
  local_de8 = local_1108;
  uVar1 = local_de8;
  uStack_de0 = uStack_1100;
  uVar2 = uStack_de0;
  local_df8 = local_10f8;
  uStack_df0 = uStack_10f0;
  local_de8._0_1_ = auVar94[0];
  local_de8._1_1_ = auVar94[1];
  local_de8._2_1_ = auVar94[2];
  local_de8._3_1_ = auVar94[3];
  local_de8._4_1_ = auVar94[4];
  local_de8._5_1_ = auVar94[5];
  local_de8._6_1_ = auVar94[6];
  local_de8._7_1_ = auVar94[7];
  uStack_de0._0_1_ = auVar94[8];
  uStack_de0._1_1_ = auVar94[9];
  uStack_de0._2_1_ = auVar94[10];
  uStack_de0._3_1_ = auVar94[0xb];
  uStack_de0._4_1_ = auVar94[0xc];
  uStack_de0._5_1_ = auVar94[0xd];
  uStack_de0._6_1_ = auVar94[0xe];
  uStack_de0._7_1_ = auVar94[0xf];
  local_a48 = -((char)local_de8 == (char)local_dd8);
  cStack_a47 = -(local_de8._1_1_ == local_dd8._1_1_);
  cStack_a46 = -(local_de8._2_1_ == local_dd8._2_1_);
  cStack_a45 = -(local_de8._3_1_ == local_dd8._3_1_);
  cStack_a44 = -(local_de8._4_1_ == local_dd8._4_1_);
  cStack_a43 = -(local_de8._5_1_ == local_dd8._5_1_);
  cStack_a42 = -(local_de8._6_1_ == local_dd8._6_1_);
  cStack_a41 = -(local_de8._7_1_ == local_dd8._7_1_);
  cStack_a40 = -((char)uStack_de0 == (char)uStack_dd0);
  cStack_a3f = -(uStack_de0._1_1_ == uStack_dd0._1_1_);
  cStack_a3e = -(uStack_de0._2_1_ == uStack_dd0._2_1_);
  cStack_a3d = -(uStack_de0._3_1_ == uStack_dd0._3_1_);
  cStack_a3c = -(uStack_de0._4_1_ == uStack_dd0._4_1_);
  cStack_a3b = -(uStack_de0._5_1_ == uStack_dd0._5_1_);
  cStack_a3a = -(uStack_de0._6_1_ == uStack_dd0._6_1_);
  cStack_a39 = -(uStack_de0._7_1_ == uStack_dd0._7_1_);
  local_a58 = CONCAT17(uStack_12a1,
                       CONCAT16(uStack_12a2,
                                CONCAT15(uStack_12a3,
                                         CONCAT14(uStack_12a4,
                                                  CONCAT13(uStack_12a5,
                                                           CONCAT12(uStack_12a6,
                                                                    CONCAT11(uStack_12a7,local_12a8)
                                                                   ))))));
  uStack_a50 = CONCAT17(uStack_1299,
                        CONCAT16(uStack_129a,
                                 CONCAT15(uStack_129b,
                                          CONCAT14(uStack_129c,
                                                   CONCAT13(uStack_129d,
                                                            CONCAT12(uStack_129e,
                                                                     CONCAT11(uStack_129f,
                                                                              uStack_12a0)))))));
  uVar93 = CONCAT17(cStack_a41,
                    CONCAT16(cStack_a42,
                             CONCAT15(cStack_a43,
                                      CONCAT14(cStack_a44,
                                               CONCAT13(cStack_a45,
                                                        CONCAT12(cStack_a46,
                                                                 CONCAT11(cStack_a47,local_a48))))))
                   ) ^ local_a58;
  uVar113 = CONCAT17(cStack_a39,
                     CONCAT16(cStack_a3a,
                              CONCAT15(cStack_a3b,
                                       CONCAT14(cStack_a3c,
                                                CONCAT13(cStack_a3d,
                                                         CONCAT12(cStack_a3e,
                                                                  CONCAT11(cStack_a3f,cStack_a40))))
                                      ))) ^ uStack_a50;
  local_cc8 = local_12e8;
  uStack_cc0 = uStack_12e0;
  local_cd8._0_1_ = (byte)uVar93;
  local_cd8._1_1_ = (byte)(uVar93 >> 8);
  local_cd8._2_1_ = (byte)(uVar93 >> 0x10);
  local_cd8._3_1_ = (byte)(uVar93 >> 0x18);
  local_cd8._4_1_ = (byte)(uVar93 >> 0x20);
  local_cd8._5_1_ = (byte)(uVar93 >> 0x28);
  local_cd8._6_1_ = (byte)(uVar93 >> 0x30);
  local_cd8._7_1_ = (byte)(uVar93 >> 0x38);
  uStack_cd0._0_1_ = (byte)uVar113;
  uStack_cd0._1_1_ = (byte)(uVar113 >> 8);
  uStack_cd0._2_1_ = (byte)(uVar113 >> 0x10);
  uStack_cd0._3_1_ = (byte)(uVar113 >> 0x18);
  uStack_cd0._4_1_ = (byte)(uVar113 >> 0x20);
  uStack_cd0._5_1_ = (byte)(uVar113 >> 0x28);
  uStack_cd0._6_1_ = (byte)(uVar113 >> 0x30);
  uStack_cd0._7_1_ = (byte)(uVar113 >> 0x38);
  local_1108._1_1_ =
       (local_ca8._1_1_ < local_cd8._1_1_) * local_cd8._1_1_ |
       (local_ca8._1_1_ >= local_cd8._1_1_) * local_ca8._1_1_;
  local_1108._0_1_ =
       ((byte)local_ca8 < (byte)local_cd8) * (byte)local_cd8 |
       ((byte)local_ca8 >= (byte)local_cd8) * (byte)local_ca8;
  local_1108._2_1_ =
       (local_ca8._2_1_ < local_cd8._2_1_) * local_cd8._2_1_ |
       (local_ca8._2_1_ >= local_cd8._2_1_) * local_ca8._2_1_;
  local_1108._3_1_ =
       (local_ca8._3_1_ < local_cd8._3_1_) * local_cd8._3_1_ |
       (local_ca8._3_1_ >= local_cd8._3_1_) * local_ca8._3_1_;
  local_1108._4_1_ =
       (local_ca8._4_1_ < local_cd8._4_1_) * local_cd8._4_1_ |
       (local_ca8._4_1_ >= local_cd8._4_1_) * local_ca8._4_1_;
  local_1108._5_1_ =
       (local_ca8._5_1_ < local_cd8._5_1_) * local_cd8._5_1_ |
       (local_ca8._5_1_ >= local_cd8._5_1_) * local_ca8._5_1_;
  local_1108._6_1_ =
       (local_ca8._6_1_ < local_cd8._6_1_) * local_cd8._6_1_ |
       (local_ca8._6_1_ >= local_cd8._6_1_) * local_ca8._6_1_;
  local_1108._7_1_ =
       (local_ca8._7_1_ < local_cd8._7_1_) * local_cd8._7_1_ |
       (local_ca8._7_1_ >= local_cd8._7_1_) * local_ca8._7_1_;
  uStack_1100._0_1_ =
       ((byte)uStack_ca0 < (byte)uStack_cd0) * (byte)uStack_cd0 |
       ((byte)uStack_ca0 >= (byte)uStack_cd0) * (byte)uStack_ca0;
  uStack_1100._1_1_ =
       (uStack_ca0._1_1_ < uStack_cd0._1_1_) * uStack_cd0._1_1_ |
       (uStack_ca0._1_1_ >= uStack_cd0._1_1_) * uStack_ca0._1_1_;
  uStack_1100._2_1_ =
       (uStack_ca0._2_1_ < uStack_cd0._2_1_) * uStack_cd0._2_1_ |
       (uStack_ca0._2_1_ >= uStack_cd0._2_1_) * uStack_ca0._2_1_;
  uStack_1100._3_1_ =
       (uStack_ca0._3_1_ < uStack_cd0._3_1_) * uStack_cd0._3_1_ |
       (uStack_ca0._3_1_ >= uStack_cd0._3_1_) * uStack_ca0._3_1_;
  uStack_1100._4_1_ =
       (uStack_ca0._4_1_ < uStack_cd0._4_1_) * uStack_cd0._4_1_ |
       (uStack_ca0._4_1_ >= uStack_cd0._4_1_) * uStack_ca0._4_1_;
  uStack_1100._5_1_ =
       (uStack_ca0._5_1_ < uStack_cd0._5_1_) * uStack_cd0._5_1_ |
       (uStack_ca0._5_1_ >= uStack_cd0._5_1_) * uStack_ca0._5_1_;
  uStack_1100._6_1_ =
       (uStack_ca0._6_1_ < uStack_cd0._6_1_) * uStack_cd0._6_1_ |
       (uStack_ca0._6_1_ >= uStack_cd0._6_1_) * uStack_ca0._6_1_;
  uStack_1100._7_1_ =
       (uStack_ca0._7_1_ < uStack_cd0._7_1_) * uStack_cd0._7_1_ |
       (uStack_ca0._7_1_ >= uStack_cd0._7_1_) * uStack_ca0._7_1_;
  b_00[1] = (longlong)puVar85;
  a_01[1] = (longlong)puVar86;
  a_01[0] = (longlong)puVar87;
  local_f38 = local_f48;
  uStack_f30 = uStack_f40;
  local_de8 = uVar1;
  uStack_de0 = uVar2;
  local_dd8 = uVar3;
  uStack_dd0 = uVar4;
  local_dc8 = uVar114;
  uStack_dc0 = uVar12;
  local_cd8 = uVar93;
  uStack_cd0 = uVar113;
  local_cb8 = uVar15;
  uStack_cb0 = uVar16;
  local_ca8 = uVar17;
  uStack_ca0 = uVar18;
  local_b88 = uVar92;
  local_1118 = local_f48;
  uStack_1110 = local_f48;
  alVar129 = abs_diff(a_01,b_00);
  b_01[0] = alVar129[1];
  b_01[1] = (longlong)puVar85;
  a_02[1] = (longlong)puVar86;
  a_02[0] = (longlong)puVar87;
  abs_diff(a_02,b_01);
  puVar85 = local_10c0;
  local_ce8 = (byte)extraout_XMM0_Qa_01;
  bStack_ce7 = (byte)((ulong)extraout_XMM0_Qa_01 >> 8);
  bStack_ce6 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x10);
  bStack_ce5 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x18);
  bStack_ce4 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x20);
  bStack_ce3 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x28);
  bStack_ce2 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x30);
  bStack_ce1 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x38);
  bStack_ce0 = (byte)extraout_XMM0_Qb_01;
  bStack_cdf = (byte)((ulong)extraout_XMM0_Qb_01 >> 8);
  bStack_cde = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x10);
  bStack_cdd = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x18);
  bStack_cdc = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x20);
  bStack_cdb = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x28);
  bStack_cda = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x30);
  bStack_cd9 = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x38);
  local_cf8 = (byte)extraout_XMM0_Qa_02;
  bStack_cf7 = (byte)((ulong)extraout_XMM0_Qa_02 >> 8);
  bStack_cf6 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x10);
  bStack_cf5 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x18);
  bStack_cf4 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x20);
  bStack_cf3 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x28);
  bStack_cf2 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x30);
  bStack_cf1 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x38);
  bStack_cf0 = (byte)extraout_XMM0_Qb_02;
  bStack_cef = (byte)((ulong)extraout_XMM0_Qb_02 >> 8);
  bStack_cee = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x10);
  bStack_ced = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x18);
  bStack_cec = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x20);
  bStack_ceb = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x28);
  bStack_cea = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x30);
  bStack_ce9 = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x38);
  local_12f8 = (local_ce8 < local_cf8) * local_cf8 | (local_ce8 >= local_cf8) * local_ce8;
  bStack_12f7 = (bStack_ce7 < bStack_cf7) * bStack_cf7 | (bStack_ce7 >= bStack_cf7) * bStack_ce7;
  bStack_12f6 = (bStack_ce6 < bStack_cf6) * bStack_cf6 | (bStack_ce6 >= bStack_cf6) * bStack_ce6;
  bStack_12f5 = (bStack_ce5 < bStack_cf5) * bStack_cf5 | (bStack_ce5 >= bStack_cf5) * bStack_ce5;
  bStack_12f4 = (bStack_ce4 < bStack_cf4) * bStack_cf4 | (bStack_ce4 >= bStack_cf4) * bStack_ce4;
  bStack_12f3 = (bStack_ce3 < bStack_cf3) * bStack_cf3 | (bStack_ce3 >= bStack_cf3) * bStack_ce3;
  bStack_12f2 = (bStack_ce2 < bStack_cf2) * bStack_cf2 | (bStack_ce2 >= bStack_cf2) * bStack_ce2;
  bStack_12f1 = (bStack_ce1 < bStack_cf1) * bStack_cf1 | (bStack_ce1 >= bStack_cf1) * bStack_ce1;
  bStack_12f0 = (bStack_ce0 < bStack_cf0) * bStack_cf0 | (bStack_ce0 >= bStack_cf0) * bStack_ce0;
  bStack_12ef = (bStack_cdf < bStack_cef) * bStack_cef | (bStack_cdf >= bStack_cef) * bStack_cdf;
  bStack_12ee = (bStack_cde < bStack_cee) * bStack_cee | (bStack_cde >= bStack_cee) * bStack_cde;
  bStack_12ed = (bStack_cdd < bStack_ced) * bStack_ced | (bStack_cdd >= bStack_ced) * bStack_cdd;
  bStack_12ec = (bStack_cdc < bStack_cec) * bStack_cec | (bStack_cdc >= bStack_cec) * bStack_cdc;
  bStack_12eb = (bStack_cdb < bStack_ceb) * bStack_ceb | (bStack_cdb >= bStack_ceb) * bStack_cdb;
  bStack_12ea = (bStack_cda < bStack_cea) * bStack_cea | (bStack_cda >= bStack_cea) * bStack_cda;
  bStack_12e9 = (bStack_cd9 < bStack_ce9) * bStack_ce9 | (bStack_cd9 >= bStack_ce9) * bStack_cd9;
  local_d08 = CONCAT17(bStack_12f1,
                       CONCAT16(bStack_12f2,
                                CONCAT15(bStack_12f3,
                                         CONCAT14(bStack_12f4,
                                                  CONCAT13(bStack_12f5,
                                                           CONCAT12(bStack_12f6,
                                                                    CONCAT11(bStack_12f7,local_12f8)
                                                                   ))))));
  uStack_d00 = CONCAT17(bStack_12e9,
                        CONCAT16(bStack_12ea,
                                 CONCAT15(bStack_12eb,
                                          CONCAT14(bStack_12ec,
                                                   CONCAT13(bStack_12ed,
                                                            CONCAT12(bStack_12ee,
                                                                     CONCAT11(bStack_12ef,
                                                                              bStack_12f0)))))));
  local_d18 = local_1108;
  uVar12 = local_d18;
  uStack_d10 = uStack_1100;
  uVar15 = uStack_d10;
  local_d18._0_1_ = (byte)local_1108;
  local_d18._1_1_ = local_1108._1_1_;
  local_d18._2_1_ = local_1108._2_1_;
  local_d18._3_1_ = local_1108._3_1_;
  local_d18._4_1_ = local_1108._4_1_;
  local_d18._5_1_ = local_1108._5_1_;
  local_d18._6_1_ = local_1108._6_1_;
  local_d18._7_1_ = local_1108._7_1_;
  uStack_d10._0_1_ = local_1108._8_1_;
  uStack_d10._1_1_ = local_1108._9_1_;
  uStack_d10._2_1_ = local_1108._10_1_;
  uStack_d10._3_1_ = local_1108._11_1_;
  uStack_d10._4_1_ = local_1108._12_1_;
  uStack_d10._5_1_ = local_1108._13_1_;
  uStack_d10._6_1_ = local_1108._14_1_;
  uStack_d10._7_1_ = local_1108._15_1_;
  bVar88 = (local_12f8 < (byte)local_d18) * (byte)local_d18 |
           (local_12f8 >= (byte)local_d18) * local_12f8;
  bVar96 = (bStack_12f7 < local_d18._1_1_) * local_d18._1_1_ |
           (bStack_12f7 >= local_d18._1_1_) * bStack_12f7;
  bVar97 = (bStack_12f6 < local_d18._2_1_) * local_d18._2_1_ |
           (bStack_12f6 >= local_d18._2_1_) * bStack_12f6;
  bVar100 = (bStack_12f5 < local_d18._3_1_) * local_d18._3_1_ |
            (bStack_12f5 >= local_d18._3_1_) * bStack_12f5;
  bVar101 = (bStack_12f4 < local_d18._4_1_) * local_d18._4_1_ |
            (bStack_12f4 >= local_d18._4_1_) * bStack_12f4;
  bVar104 = (bStack_12f3 < local_d18._5_1_) * local_d18._5_1_ |
            (bStack_12f3 >= local_d18._5_1_) * bStack_12f3;
  bVar105 = (bStack_12f2 < local_d18._6_1_) * local_d18._6_1_ |
            (bStack_12f2 >= local_d18._6_1_) * bStack_12f2;
  bVar108 = (bStack_12f1 < local_d18._7_1_) * local_d18._7_1_ |
            (bStack_12f1 >= local_d18._7_1_) * bStack_12f1;
  bVar109 = (bStack_12f0 < (byte)uStack_d10) * (byte)uStack_d10 |
            (bStack_12f0 >= (byte)uStack_d10) * bStack_12f0;
  bVar116 = (bStack_12ef < uStack_d10._1_1_) * uStack_d10._1_1_ |
            (bStack_12ef >= uStack_d10._1_1_) * bStack_12ef;
  bVar117 = (bStack_12ee < uStack_d10._2_1_) * uStack_d10._2_1_ |
            (bStack_12ee >= uStack_d10._2_1_) * bStack_12ee;
  bVar120 = (bStack_12ed < uStack_d10._3_1_) * uStack_d10._3_1_ |
            (bStack_12ed >= uStack_d10._3_1_) * bStack_12ed;
  bVar121 = (bStack_12ec < uStack_d10._4_1_) * uStack_d10._4_1_ |
            (bStack_12ec >= uStack_d10._4_1_) * bStack_12ec;
  bVar124 = (bStack_12eb < uStack_d10._5_1_) * uStack_d10._5_1_ |
            (bStack_12eb >= uStack_d10._5_1_) * bStack_12eb;
  bVar125 = (bStack_12ea < uStack_d10._6_1_) * uStack_d10._6_1_ |
            (bStack_12ea >= uStack_d10._6_1_) * bStack_12ea;
  bVar128 = (bStack_12e9 < uStack_d10._7_1_) * uStack_d10._7_1_ |
            (bStack_12e9 >= uStack_d10._7_1_) * bStack_12e9;
  local_1108._0_2_ = CONCAT11(bVar96,bVar88);
  local_1108._0_3_ = CONCAT12(bVar97,(undefined2)local_1108);
  local_1108._0_4_ = CONCAT13(bVar100,(undefined3)local_1108);
  local_1108._0_5_ = CONCAT14(bVar101,(undefined4)local_1108);
  local_1108._0_6_ = CONCAT15(bVar104,(undefined5)local_1108);
  local_1108._0_7_ = CONCAT16(bVar105,(undefined6)local_1108);
  local_1108 = CONCAT17(bVar108,(undefined7)local_1108);
  uStack_1100._0_1_ = bVar109;
  uStack_1100._1_1_ = bVar116;
  uStack_1100._2_1_ = bVar117;
  uStack_1100._3_1_ = bVar120;
  uStack_1100._4_1_ = bVar121;
  uStack_1100._5_1_ = bVar124;
  uStack_1100._6_1_ = bVar125;
  uStack_1100._7_1_ = bVar128;
  local_d28 = local_1108;
  uStack_d20 = uStack_1100;
  local_d38 = uStack_1100;
  uStack_d30 = 0;
  local_1108._0_2_ =
       CONCAT11((bVar96 < bVar116) * bVar116 | (bVar96 >= bVar116) * bVar96,
                (bVar88 < bVar109) * bVar109 | (bVar88 >= bVar109) * bVar88);
  local_1108._0_3_ =
       CONCAT12((bVar97 < bVar117) * bVar117 | (bVar97 >= bVar117) * bVar97,(undefined2)local_1108);
  local_1108._0_4_ =
       CONCAT13((bVar100 < bVar120) * bVar120 | (bVar100 >= bVar120) * bVar100,
                (undefined3)local_1108);
  local_1108._0_5_ =
       CONCAT14((bVar101 < bVar121) * bVar121 | (bVar101 >= bVar121) * bVar101,
                (undefined4)local_1108);
  local_1108._0_6_ =
       CONCAT15((bVar104 < bVar124) * bVar124 | (bVar104 >= bVar124) * bVar104,
                (undefined5)local_1108);
  local_1108._0_7_ =
       CONCAT16((bVar105 < bVar125) * bVar125 | (bVar105 >= bVar125) * bVar105,
                (undefined6)local_1108);
  local_1108 = CONCAT17((bVar108 < bVar128) * bVar128 | (bVar108 >= bVar128) * bVar108,
                        (undefined7)local_1108);
  local_ab8 = *(undefined8 *)*local_10d8;
  uStack_ab0 = *(undefined8 *)(*local_10d8 + 8);
  local_aa8 = local_1108;
  uStack_aa0 = uStack_1100;
  auVar68._8_8_ = uStack_1100;
  auVar68._0_8_ = local_1108;
  auVar94 = psubusb(auVar68,*local_10d8);
  local_1108 = auVar94._0_8_;
  uStack_1100 = auVar94._8_8_;
  local_e08 = local_1108;
  uVar3 = local_e08;
  uStack_e00 = uStack_1100;
  uVar4 = uStack_e00;
  local_e18 = local_10f8;
  uVar1 = local_e18;
  uStack_e10 = uStack_10f0;
  uVar2 = uStack_e10;
  local_e08._0_1_ = auVar94[0];
  local_e08._1_1_ = auVar94[1];
  local_e08._2_1_ = auVar94[2];
  local_e08._3_1_ = auVar94[3];
  local_e08._4_1_ = auVar94[4];
  local_e08._5_1_ = auVar94[5];
  local_e08._6_1_ = auVar94[6];
  local_e08._7_1_ = auVar94[7];
  uStack_e00._0_1_ = auVar94[8];
  uStack_e00._1_1_ = auVar94[9];
  uStack_e00._2_1_ = auVar94[10];
  uStack_e00._3_1_ = auVar94[0xb];
  uStack_e00._4_1_ = auVar94[0xc];
  uStack_e00._5_1_ = auVar94[0xd];
  uStack_e00._6_1_ = auVar94[0xe];
  uStack_e00._7_1_ = auVar94[0xf];
  local_e18._0_1_ = (char)local_10f8;
  local_e18._1_1_ = (char)((ulong)local_10f8 >> 8);
  local_e18._2_1_ = (char)((ulong)local_10f8 >> 0x10);
  local_e18._3_1_ = (char)((ulong)local_10f8 >> 0x18);
  local_e18._4_1_ = (char)((ulong)local_10f8 >> 0x20);
  local_e18._5_1_ = (char)((ulong)local_10f8 >> 0x28);
  local_e18._6_1_ = (char)((ulong)local_10f8 >> 0x30);
  local_e18._7_1_ = (char)((ulong)local_10f8 >> 0x38);
  uStack_e10._0_1_ = (char)uStack_10f0;
  uStack_e10._1_1_ = (char)((ulong)uStack_10f0 >> 8);
  uStack_e10._2_1_ = (char)((ulong)uStack_10f0 >> 0x10);
  uStack_e10._3_1_ = (char)((ulong)uStack_10f0 >> 0x18);
  uStack_e10._4_1_ = (char)((ulong)uStack_10f0 >> 0x20);
  uStack_e10._5_1_ = (char)((ulong)uStack_10f0 >> 0x28);
  uStack_e10._6_1_ = (char)((ulong)uStack_10f0 >> 0x30);
  uStack_e10._7_1_ = (char)((ulong)uStack_10f0 >> 0x38);
  local_1108._0_2_ =
       CONCAT11(-(local_e08._1_1_ == local_e18._1_1_),-((char)local_e08 == (char)local_e18));
  local_1108._0_3_ = CONCAT12(-(local_e08._2_1_ == local_e18._2_1_),(undefined2)local_1108);
  local_1108._0_4_ = CONCAT13(-(local_e08._3_1_ == local_e18._3_1_),(undefined3)local_1108);
  local_1108._0_5_ = CONCAT14(-(local_e08._4_1_ == local_e18._4_1_),(undefined4)local_1108);
  local_1108._0_6_ = CONCAT15(-(local_e08._5_1_ == local_e18._5_1_),(undefined5)local_1108);
  local_1108._0_7_ = CONCAT16(-(local_e08._6_1_ == local_e18._6_1_),(undefined6)local_1108);
  local_1108 = CONCAT17(-(local_e08._7_1_ == local_e18._7_1_),(undefined7)local_1108);
  uStack_1100._0_1_ = -((char)uStack_e00 == (char)uStack_e10);
  uStack_1100._1_1_ = -(uStack_e00._1_1_ == uStack_e10._1_1_);
  uStack_1100._2_1_ = -(uStack_e00._2_1_ == uStack_e10._2_1_);
  uStack_1100._3_1_ = -(uStack_e00._3_1_ == uStack_e10._3_1_);
  uStack_1100._4_1_ = -(uStack_e00._4_1_ == uStack_e10._4_1_);
  uStack_1100._5_1_ = -(uStack_e00._5_1_ == uStack_e10._5_1_);
  uStack_1100._6_1_ = -(uStack_e00._6_1_ == uStack_e10._6_1_);
  uStack_1100._7_1_ = -(uStack_e00._7_1_ == uStack_e10._7_1_);
  local_3e0 = &local_1228;
  local_3e8 = &local_1218;
  local_3f0 = &local_1118;
  local_400 = local_10c0;
  local_408 = local_10c8;
  local_9d = 3;
  local_9e = 3;
  local_9f = 3;
  local_a0 = 3;
  local_a1 = 3;
  local_a2 = 3;
  local_a3 = 3;
  local_a4 = 3;
  local_a5 = 4;
  local_a6 = 4;
  local_a7 = 4;
  local_a8 = 4;
  local_a9 = 4;
  local_aa = 4;
  local_ab = 4;
  local_ac = 4;
  local_418 = 0x404040404040404;
  uStack_410 = 0x303030303030303;
  local_349 = 0x80;
  local_c9 = 0x80;
  local_ca = 0x80;
  local_cb = 0x80;
  local_cc = 0x80;
  local_cd = 0x80;
  local_ce = 0x80;
  local_cf = 0x80;
  local_d0 = 0x80;
  local_d1 = 0x80;
  local_d2 = 0x80;
  local_d3 = 0x80;
  local_d4 = 0x80;
  local_d5 = 0x80;
  local_d6 = 0x80;
  local_d7 = 0x80;
  local_d8 = 0x80;
  local_428 = 0x8080808080808080;
  uStack_420 = 0x8080808080808080;
  local_498 = 0xff;
  uStack_497 = 0xff;
  uStack_496 = 0xff;
  uStack_495 = 0xff;
  uStack_494 = 0xff;
  uStack_493 = 0xff;
  uStack_492 = 0xff;
  uStack_491 = 0xff;
  uStack_490 = 0xff;
  uStack_48f = 0xff;
  uStack_48e = 0xff;
  uStack_48d = 0xff;
  uStack_48c = 0xff;
  uStack_48b = 0xff;
  uStack_48a = 0xff;
  uStack_489 = 0xff;
  local_1b8 = local_1228 ^ 0x8080808080808080;
  uStack_1b0 = uStack_1220 ^ 0x8080808080808080;
  uStack_290 = uStack_1210;
  local_1c8 = local_1218 ^ 0x8080808080808080;
  uStack_250 = uStack_1210 ^ 0x8080808080808080;
  auVar76._8_8_ = uStack_1b0;
  auVar76._0_8_ = local_1b8;
  auVar75._8_8_ = uStack_250;
  auVar75._0_8_ = local_1c8;
  local_458 = psubsb(auVar76,auVar75);
  local_308 = local_1118;
  uStack_300 = uStack_1110;
  local_2f8 = local_458._8_8_;
  uStack_2f0 = 0;
  local_1d8 = local_458._8_8_ & local_1118;
  uStack_1d0 = 0;
  local_1e8 = local_458._0_8_;
  uStack_1e0 = local_458._8_8_;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = local_1d8;
  auVar94 = psubsb(auVar74,local_458);
  local_438 = auVar94._0_8_;
  uStack_430 = auVar94._8_8_;
  local_1f8 = local_438;
  uStack_1f0 = uStack_430;
  local_208 = local_458._0_8_;
  uStack_200 = local_458._8_8_;
  auVar94 = psubsb(auVar94,local_458);
  local_438 = auVar94._0_8_;
  uStack_430 = auVar94._8_8_;
  local_218 = local_438;
  uStack_210 = uStack_430;
  local_228 = local_458._0_8_;
  uStack_220 = local_458._8_8_;
  auVar94 = psubsb(auVar94,local_458);
  local_438 = auVar94._0_8_;
  uStack_430 = auVar94._8_8_;
  local_328 = local_1108;
  uStack_320 = uStack_1100;
  local_318 = local_438;
  uStack_310 = uStack_430;
  local_378 = local_438 & local_1108;
  uStack_370 = uStack_430 & uStack_1100;
  auVar80._8_8_ = local_378;
  auVar80._0_8_ = local_378;
  auVar79._8_8_ = 0x303030303030303;
  auVar79._0_8_ = 0x404040404040404;
  auVar94 = paddsb(auVar80,auVar79);
  local_448 = auVar94._0_8_;
  uStack_440 = auVar94._8_8_;
  local_138 = local_448;
  uStack_130 = uStack_440;
  uVar18 = uStack_130;
  local_148 = local_448;
  uStack_140 = uStack_440;
  uStack_130._0_1_ = auVar94[8];
  uStack_130._1_1_ = auVar94[9];
  uStack_130._2_1_ = auVar94[10];
  uStack_130._3_1_ = auVar94[0xb];
  uStack_130._4_1_ = auVar94[0xc];
  uStack_130._5_1_ = auVar94[0xd];
  uStack_130._6_1_ = auVar94[0xe];
  uStack_130._7_1_ = auVar94[0xf];
  local_438._0_2_ = CONCAT11((undefined1)uStack_130,(undefined1)uStack_130);
  local_438._0_3_ = CONCAT12(uStack_130._1_1_,(undefined2)local_438);
  local_438._0_4_ = CONCAT13(uStack_130._1_1_,(undefined3)local_438);
  local_438._0_5_ = CONCAT14(uStack_130._2_1_,(undefined4)local_438);
  local_438._0_6_ = CONCAT15(uStack_130._2_1_,(undefined5)local_438);
  local_438._0_7_ = CONCAT16(uStack_130._3_1_,(undefined6)local_438);
  local_438 = CONCAT17(uStack_130._3_1_,(undefined7)local_438);
  uStack_430._0_1_ = uStack_130._4_1_;
  uStack_430._1_1_ = uStack_130._4_1_;
  uStack_430._2_1_ = uStack_130._5_1_;
  uStack_430._3_1_ = uStack_130._5_1_;
  uStack_430._4_1_ = uStack_130._6_1_;
  uStack_430._5_1_ = uStack_130._6_1_;
  uStack_430._6_1_ = uStack_130._7_1_;
  uStack_430._7_1_ = uStack_130._7_1_;
  local_3a8 = local_448;
  uVar17 = local_3a8;
  uStack_3a0 = uStack_440;
  local_3b8 = local_448;
  uStack_3b0 = uStack_440;
  local_3a8._0_1_ = auVar94[0];
  local_3a8._1_1_ = auVar94[1];
  local_3a8._2_1_ = auVar94[2];
  local_3a8._3_1_ = auVar94[3];
  local_3a8._4_1_ = auVar94[4];
  local_3a8._5_1_ = auVar94[5];
  local_3a8._6_1_ = auVar94[6];
  local_3a8._7_1_ = auVar94[7];
  local_448._0_2_ = CONCAT11((undefined1)local_3a8,(undefined1)local_3a8);
  local_448._0_3_ = CONCAT12(local_3a8._1_1_,(undefined2)local_448);
  local_448._0_4_ = CONCAT13(local_3a8._1_1_,(undefined3)local_448);
  local_448._0_5_ = CONCAT14(local_3a8._2_1_,(undefined4)local_448);
  local_448._0_6_ = CONCAT15(local_3a8._2_1_,(undefined5)local_448);
  local_448._0_7_ = CONCAT16(local_3a8._3_1_,(undefined6)local_448);
  local_448 = CONCAT17(local_3a8._3_1_,(undefined7)local_448);
  uStack_440._0_1_ = local_3a8._4_1_;
  uStack_440._1_1_ = local_3a8._4_1_;
  uStack_440._2_1_ = local_3a8._5_1_;
  uStack_440._3_1_ = local_3a8._5_1_;
  uStack_440._4_1_ = local_3a8._6_1_;
  uStack_440._5_1_ = local_3a8._6_1_;
  uStack_440._6_1_ = local_3a8._7_1_;
  uStack_440._7_1_ = local_3a8._7_1_;
  local_58 = local_448;
  uStack_50 = uStack_440;
  local_5c = 0xb;
  auVar83._8_8_ = uStack_440;
  auVar83._0_8_ = local_448;
  auVar94 = psraw(auVar83,ZEXT416(0xb));
  local_78 = local_438;
  uStack_70 = uStack_430;
  local_7c = 0xb;
  auVar82._8_8_ = uStack_430;
  auVar82._0_8_ = local_438;
  auVar95 = psraw(auVar82,ZEXT416(0xb));
  local_448 = auVar94._0_8_;
  uStack_440 = auVar94._8_8_;
  local_438 = auVar95._0_8_;
  uStack_430 = auVar95._8_8_;
  local_f8 = local_448;
  uStack_f0 = uStack_440;
  local_108 = local_438;
  uStack_100 = uStack_430;
  auVar95 = packsswb(auVar94,auVar95);
  local_448 = auVar95._0_8_;
  uStack_440 = auVar95._8_8_;
  uStack_380 = uStack_440;
  local_248 = 0xffffffffffffffff;
  uStack_240 = 0xffffffffffffffff;
  local_238 = local_448;
  uStack_230 = uStack_440;
  auVar73._8_8_ = 0xffffffffffffffff;
  auVar73._0_8_ = 0xffffffffffffffff;
  auVar94 = psubsb(auVar95,auVar73);
  local_438 = auVar94._0_8_;
  uStack_430 = auVar94._8_8_;
  local_3c8 = local_438;
  uVar16 = local_3c8;
  uStack_3c0 = uStack_430;
  local_3d8 = local_438;
  uStack_3d0 = uStack_430;
  local_3c8._0_1_ = auVar94[0];
  local_3c8._1_1_ = auVar94[1];
  local_3c8._2_1_ = auVar94[2];
  local_3c8._3_1_ = auVar94[3];
  local_3c8._4_1_ = auVar94[4];
  local_3c8._5_1_ = auVar94[5];
  local_3c8._6_1_ = auVar94[6];
  local_3c8._7_1_ = auVar94[7];
  local_438._0_2_ = CONCAT11((undefined1)local_3c8,(undefined1)local_3c8);
  local_438._0_3_ = CONCAT12(local_3c8._1_1_,(undefined2)local_438);
  local_438._0_4_ = CONCAT13(local_3c8._1_1_,(undefined3)local_438);
  local_438._0_5_ = CONCAT14(local_3c8._2_1_,(undefined4)local_438);
  local_438._0_6_ = CONCAT15(local_3c8._2_1_,(undefined5)local_438);
  local_438._0_7_ = CONCAT16(local_3c8._3_1_,(undefined6)local_438);
  local_438 = CONCAT17(local_3c8._3_1_,(undefined7)local_438);
  uStack_430._0_1_ = local_3c8._4_1_;
  uStack_430._1_1_ = local_3c8._4_1_;
  uStack_430._2_1_ = local_3c8._5_1_;
  uStack_430._3_1_ = local_3c8._5_1_;
  uStack_430._4_1_ = local_3c8._6_1_;
  uStack_430._5_1_ = local_3c8._6_1_;
  uStack_430._6_1_ = local_3c8._7_1_;
  uStack_430._7_1_ = local_3c8._7_1_;
  local_98 = local_438;
  uStack_90 = uStack_430;
  local_9c = 9;
  auVar81._8_8_ = uStack_430;
  auVar81._0_8_ = local_438;
  auVar94 = psraw(auVar81,ZEXT416(9));
  local_438 = auVar94._0_8_;
  uStack_430 = auVar94._8_8_;
  local_118 = local_438;
  uStack_110 = uStack_430;
  local_128 = local_438;
  uStack_120 = uStack_430;
  auVar94 = packsswb(auVar94,auVar94);
  local_158 = local_1118;
  uStack_150 = uStack_1110;
  local_438 = auVar94._0_8_;
  uStack_430 = auVar94._8_8_;
  local_168 = local_438;
  uStack_160 = uStack_430;
  local_398 = ~local_1118 & local_438;
  uStack_390 = ~uStack_1110 & uStack_430;
  uStack_430 = uStack_390;
  local_438 = local_398;
  auVar94 = _local_438;
  uStack_440._4_4_ = auVar95._12_4_;
  uVar10 = uStack_440._4_4_;
  local_438._0_4_ = (undefined4)local_398;
  uStack_430._4_4_ = (undefined4)(uStack_390 >> 0x20);
  uStack_2c = uStack_440._4_4_;
  local_28 = CONCAT44(local_28._4_4_,(undefined4)local_438);
  uStack_3c = uStack_430._4_4_;
  _local_38 = CONCAT44(auVar95._4_4_,0x80808080);
  uStack_480 = uStack_30;
  uStack_47c = uStack_440._4_4_;
  local_478._4_4_ = uStack_430._4_4_;
  local_478._0_4_ = uStack_40;
  local_388 = local_448;
  uStack_440 = local_398;
  local_258 = local_478._0_8_;
  local_268 = local_448;
  auVar72._8_8_ = uStack_250;
  auVar72._0_8_ = local_478._0_8_;
  auVar71._8_8_ = local_398;
  auVar71._0_8_ = local_448;
  local_478 = psubsb(auVar72,auVar71);
  uStack_1a0 = CONCAT44(uVar10,uStack_30);
  local_1a8 = local_488;
  auVar78._8_8_ = uStack_1b0;
  auVar78._0_8_ = local_1b8;
  auVar77._8_8_ = uStack_1a0;
  auVar77._0_8_ = local_488;
  local_468 = paddsb(auVar78,auVar77);
  local_2b8 = local_478._0_8_;
  uStack_2b0 = local_478._8_8_;
  uVar114 = local_478._8_8_ ^ 0x8080808080808080;
  local_e18 = uVar1;
  uStack_e10 = uVar2;
  local_e08 = uVar3;
  uStack_e00 = uVar4;
  local_d18 = uVar12;
  uStack_d10 = uVar15;
  _local_438 = auVar94;
  local_3f8 = &local_1108;
  local_3c8 = uVar16;
  local_3a8 = uVar17;
  local_368 = local_378;
  uStack_360 = uStack_370;
  local_348 = local_428;
  uStack_340 = uStack_420;
  local_338 = local_428;
  uStack_330 = uStack_420;
  local_2c8 = local_428;
  uStack_2c0 = uStack_420;
  local_2a8 = local_428;
  uStack_2a0 = uStack_420;
  local_288 = local_428;
  uStack_280 = uStack_420;
  uStack_260 = local_398;
  uStack_1c0 = uStack_250;
  local_198 = local_1b8;
  uStack_190 = uStack_1b0;
  local_188 = local_418;
  uStack_180 = uStack_410;
  local_178 = local_378;
  uStack_170 = local_378;
  uStack_130 = uVar18;
  local_e8 = local_428;
  uStack_e0 = uStack_420;
  local_c8 = local_418;
  uStack_c0 = uStack_410;
  local_48 = local_398;
  *local_10c0 = local_478._0_8_ ^ 0x8080808080808080;
  puVar85[1] = uVar114;
  puVar84 = local_408;
  local_2d8 = local_468._0_8_;
  uStack_2d0 = local_468._8_8_;
  local_2e8 = local_428;
  uStack_2e0 = uStack_420;
  uVar114 = local_468._8_8_ ^ uStack_420;
  *local_408 = local_468._0_8_ ^ local_428;
  puVar84[1] = uVar114;
  b_02[1] = (longlong)puVar85;
  b_02[0] = (longlong)&local_1108;
  a_03[1] = (longlong)puVar86;
  a_03[0] = (longlong)puVar87;
  alVar129 = abs_diff(a_03,b_02);
  b_03[0] = alVar129[1];
  b_03[1] = (longlong)puVar85;
  a_04[1] = (longlong)puVar86;
  a_04[0] = (longlong)puVar87;
  abs_diff(a_04,b_03);
  puVar86 = local_1090;
  local_d48 = (byte)extraout_XMM0_Qa_03;
  bStack_d47 = (byte)((ulong)extraout_XMM0_Qa_03 >> 8);
  bStack_d46 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x10);
  bStack_d45 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x18);
  bStack_d44 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x20);
  bStack_d43 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x28);
  bStack_d42 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x30);
  bStack_d41 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x38);
  bStack_d40 = (byte)extraout_XMM0_Qb_03;
  bStack_d3f = (byte)((ulong)extraout_XMM0_Qb_03 >> 8);
  bStack_d3e = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x10);
  bStack_d3d = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x18);
  bStack_d3c = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x20);
  bStack_d3b = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x28);
  bStack_d3a = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x30);
  bStack_d39 = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x38);
  local_d58 = (byte)extraout_XMM0_Qa_04;
  bStack_d57 = (byte)((ulong)extraout_XMM0_Qa_04 >> 8);
  bStack_d56 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x10);
  bStack_d55 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x18);
  bStack_d54 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x20);
  bStack_d53 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x28);
  bStack_d52 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x30);
  bStack_d51 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x38);
  bStack_d50 = (byte)extraout_XMM0_Qb_04;
  bStack_d4f = (byte)((ulong)extraout_XMM0_Qb_04 >> 8);
  bStack_d4e = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x10);
  bStack_d4d = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x18);
  bStack_d4c = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x20);
  bStack_d4b = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x28);
  bStack_d4a = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x30);
  bStack_d49 = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x38);
  bVar88 = (local_d48 < local_d58) * local_d58 | (local_d48 >= local_d58) * local_d48;
  bVar96 = (bStack_d47 < bStack_d57) * bStack_d57 | (bStack_d47 >= bStack_d57) * bStack_d47;
  bVar97 = (bStack_d46 < bStack_d56) * bStack_d56 | (bStack_d46 >= bStack_d56) * bStack_d46;
  bVar100 = (bStack_d45 < bStack_d55) * bStack_d55 | (bStack_d45 >= bStack_d55) * bStack_d45;
  bVar101 = (bStack_d44 < bStack_d54) * bStack_d54 | (bStack_d44 >= bStack_d54) * bStack_d44;
  bVar104 = (bStack_d43 < bStack_d53) * bStack_d53 | (bStack_d43 >= bStack_d53) * bStack_d43;
  bVar105 = (bStack_d42 < bStack_d52) * bStack_d52 | (bStack_d42 >= bStack_d52) * bStack_d42;
  bVar108 = (bStack_d41 < bStack_d51) * bStack_d51 | (bStack_d41 >= bStack_d51) * bStack_d41;
  bVar109 = (bStack_d40 < bStack_d50) * bStack_d50 | (bStack_d40 >= bStack_d50) * bStack_d40;
  bVar116 = (bStack_d3f < bStack_d4f) * bStack_d4f | (bStack_d3f >= bStack_d4f) * bStack_d3f;
  bVar117 = (bStack_d3e < bStack_d4e) * bStack_d4e | (bStack_d3e >= bStack_d4e) * bStack_d3e;
  bVar120 = (bStack_d3d < bStack_d4d) * bStack_d4d | (bStack_d3d >= bStack_d4d) * bStack_d3d;
  bVar121 = (bStack_d3c < bStack_d4c) * bStack_d4c | (bStack_d3c >= bStack_d4c) * bStack_d3c;
  bVar124 = (bStack_d3b < bStack_d4b) * bStack_d4b | (bStack_d3b >= bStack_d4b) * bStack_d3b;
  bVar125 = (bStack_d3a < bStack_d4a) * bStack_d4a | (bStack_d3a >= bStack_d4a) * bStack_d3a;
  bVar128 = (bStack_d39 < bStack_d49) * bStack_d49 | (bStack_d39 >= bStack_d49) * bStack_d39;
  local_1128._0_2_ = CONCAT11(bVar96,bVar88);
  local_1128._0_3_ = CONCAT12(bVar97,(undefined2)local_1128);
  local_1128._0_4_ = CONCAT13(bVar100,(undefined3)local_1128);
  local_1128._0_5_ = CONCAT14(bVar101,(undefined4)local_1128);
  local_1128._0_6_ = CONCAT15(bVar104,(undefined5)local_1128);
  local_1128._0_7_ = CONCAT16(bVar105,(undefined6)local_1128);
  local_1128 = CONCAT17(bVar108,(undefined7)local_1128);
  uStack_1120._0_1_ = bVar109;
  uStack_1120._1_1_ = bVar116;
  uStack_1120._2_1_ = bVar117;
  uStack_1120._3_1_ = bVar120;
  uStack_1120._4_1_ = bVar121;
  uStack_1120._5_1_ = bVar124;
  uStack_1120._6_1_ = bVar125;
  uStack_1120._7_1_ = bVar128;
  local_d68 = local_12e8;
  uVar12 = local_d68;
  uStack_d60 = uStack_12e0;
  uVar15 = uStack_d60;
  local_d78 = local_1128;
  uStack_d70 = uStack_1120;
  local_d68._0_1_ = (byte)local_12e8;
  local_d68._1_1_ = (byte)((ulong)local_12e8 >> 8);
  local_d68._2_1_ = (byte)((ulong)local_12e8 >> 0x10);
  local_d68._3_1_ = (byte)((ulong)local_12e8 >> 0x18);
  local_d68._4_1_ = (byte)((ulong)local_12e8 >> 0x20);
  local_d68._5_1_ = (byte)((ulong)local_12e8 >> 0x28);
  local_d68._6_1_ = (byte)((ulong)local_12e8 >> 0x30);
  local_d68._7_1_ = (byte)((ulong)local_12e8 >> 0x38);
  uStack_d60._0_1_ = (byte)uStack_12e0;
  uStack_d60._1_1_ = (byte)((ulong)uStack_12e0 >> 8);
  uStack_d60._2_1_ = (byte)((ulong)uStack_12e0 >> 0x10);
  uStack_d60._3_1_ = (byte)((ulong)uStack_12e0 >> 0x18);
  uStack_d60._4_1_ = (byte)((ulong)uStack_12e0 >> 0x20);
  uStack_d60._5_1_ = (byte)((ulong)uStack_12e0 >> 0x28);
  uStack_d60._6_1_ = (byte)((ulong)uStack_12e0 >> 0x30);
  uStack_d60._7_1_ = (byte)((ulong)uStack_12e0 >> 0x38);
  bVar88 = ((byte)local_d68 < bVar88) * bVar88 | ((byte)local_d68 >= bVar88) * (byte)local_d68;
  bVar96 = (local_d68._1_1_ < bVar96) * bVar96 | (local_d68._1_1_ >= bVar96) * local_d68._1_1_;
  bVar97 = (local_d68._2_1_ < bVar97) * bVar97 | (local_d68._2_1_ >= bVar97) * local_d68._2_1_;
  bVar100 = (local_d68._3_1_ < bVar100) * bVar100 | (local_d68._3_1_ >= bVar100) * local_d68._3_1_;
  bVar101 = (local_d68._4_1_ < bVar101) * bVar101 | (local_d68._4_1_ >= bVar101) * local_d68._4_1_;
  bVar104 = (local_d68._5_1_ < bVar104) * bVar104 | (local_d68._5_1_ >= bVar104) * local_d68._5_1_;
  bVar105 = (local_d68._6_1_ < bVar105) * bVar105 | (local_d68._6_1_ >= bVar105) * local_d68._6_1_;
  bVar108 = (local_d68._7_1_ < bVar108) * bVar108 | (local_d68._7_1_ >= bVar108) * local_d68._7_1_;
  bVar109 = ((byte)uStack_d60 < bVar109) * bVar109 |
            ((byte)uStack_d60 >= bVar109) * (byte)uStack_d60;
  bVar116 = (uStack_d60._1_1_ < bVar116) * bVar116 |
            (uStack_d60._1_1_ >= bVar116) * uStack_d60._1_1_;
  bVar117 = (uStack_d60._2_1_ < bVar117) * bVar117 |
            (uStack_d60._2_1_ >= bVar117) * uStack_d60._2_1_;
  bVar120 = (uStack_d60._3_1_ < bVar120) * bVar120 |
            (uStack_d60._3_1_ >= bVar120) * uStack_d60._3_1_;
  bVar121 = (uStack_d60._4_1_ < bVar121) * bVar121 |
            (uStack_d60._4_1_ >= bVar121) * uStack_d60._4_1_;
  bVar124 = (uStack_d60._5_1_ < bVar124) * bVar124 |
            (uStack_d60._5_1_ >= bVar124) * uStack_d60._5_1_;
  bVar125 = (uStack_d60._6_1_ < bVar125) * bVar125 |
            (uStack_d60._6_1_ >= bVar125) * uStack_d60._6_1_;
  bVar128 = (uStack_d60._7_1_ < bVar128) * bVar128 |
            (uStack_d60._7_1_ >= bVar128) * uStack_d60._7_1_;
  local_1128._0_2_ = CONCAT11(bVar96,bVar88);
  local_1128._0_3_ = CONCAT12(bVar97,(undefined2)local_1128);
  local_1128._0_4_ = CONCAT13(bVar100,(undefined3)local_1128);
  local_1128._0_5_ = CONCAT14(bVar101,(undefined4)local_1128);
  local_1128._0_6_ = CONCAT15(bVar104,(undefined5)local_1128);
  local_1128._0_7_ = CONCAT16(bVar105,(undefined6)local_1128);
  local_1128 = CONCAT17(bVar108,(undefined7)local_1128);
  uStack_1120._0_1_ = bVar109;
  uStack_1120._1_1_ = bVar116;
  uStack_1120._2_1_ = bVar117;
  uStack_1120._3_1_ = bVar120;
  uStack_1120._4_1_ = bVar121;
  uStack_1120._5_1_ = bVar124;
  uStack_1120._6_1_ = bVar125;
  uStack_1120._7_1_ = bVar128;
  local_d88 = local_1128;
  uStack_d80 = uStack_1120;
  local_d98 = uStack_1120;
  uStack_d90 = 0;
  local_1128._0_2_ =
       CONCAT11((bVar96 < bVar116) * bVar116 | (bVar96 >= bVar116) * bVar96,
                (bVar88 < bVar109) * bVar109 | (bVar88 >= bVar109) * bVar88);
  local_1128._0_3_ =
       CONCAT12((bVar97 < bVar117) * bVar117 | (bVar97 >= bVar117) * bVar97,(undefined2)local_1128);
  local_1128._0_4_ =
       CONCAT13((bVar100 < bVar120) * bVar120 | (bVar100 >= bVar120) * bVar100,
                (undefined3)local_1128);
  local_1128._0_5_ =
       CONCAT14((bVar101 < bVar121) * bVar121 | (bVar101 >= bVar121) * bVar101,
                (undefined4)local_1128);
  local_1128._0_6_ =
       CONCAT15((bVar104 < bVar124) * bVar124 | (bVar104 >= bVar124) * bVar104,
                (undefined5)local_1128);
  local_1128._0_7_ =
       CONCAT16((bVar105 < bVar125) * bVar125 | (bVar105 >= bVar125) * bVar105,
                (undefined6)local_1128);
  local_1128 = CONCAT17((bVar108 < bVar128) * bVar128 | (bVar108 >= bVar128) * bVar108,
                        (undefined7)local_1128);
  local_ac8 = local_1128;
  uStack_ac0 = uStack_1120;
  local_ad8 = local_1288;
  uStack_ad0 = uStack_1280;
  auVar67._8_8_ = uStack_1120;
  auVar67._0_8_ = local_1128;
  auVar66._8_8_ = uStack_1280;
  auVar66._0_8_ = local_1288;
  auVar94 = psubusb(auVar67,auVar66);
  local_1128 = auVar94._0_8_;
  uStack_1120 = auVar94._8_8_;
  local_e28 = local_1128;
  uVar3 = local_e28;
  uStack_e20 = uStack_1120;
  uVar4 = uStack_e20;
  local_e38 = local_10f8;
  uVar1 = local_e38;
  uStack_e30 = uStack_10f0;
  uVar2 = uStack_e30;
  local_e28._0_1_ = auVar94[0];
  local_e28._1_1_ = auVar94[1];
  local_e28._2_1_ = auVar94[2];
  local_e28._3_1_ = auVar94[3];
  local_e28._4_1_ = auVar94[4];
  local_e28._5_1_ = auVar94[5];
  local_e28._6_1_ = auVar94[6];
  local_e28._7_1_ = auVar94[7];
  uStack_e20._0_1_ = auVar94[8];
  uStack_e20._1_1_ = auVar94[9];
  uStack_e20._2_1_ = auVar94[10];
  uStack_e20._3_1_ = auVar94[0xb];
  uStack_e20._4_1_ = auVar94[0xc];
  uStack_e20._5_1_ = auVar94[0xd];
  uStack_e20._6_1_ = auVar94[0xe];
  uStack_e20._7_1_ = auVar94[0xf];
  local_e38._0_1_ = (char)local_10f8;
  local_e38._1_1_ = (char)((ulong)local_10f8 >> 8);
  local_e38._2_1_ = (char)((ulong)local_10f8 >> 0x10);
  local_e38._3_1_ = (char)((ulong)local_10f8 >> 0x18);
  local_e38._4_1_ = (char)((ulong)local_10f8 >> 0x20);
  local_e38._5_1_ = (char)((ulong)local_10f8 >> 0x28);
  local_e38._6_1_ = (char)((ulong)local_10f8 >> 0x30);
  local_e38._7_1_ = (char)((ulong)local_10f8 >> 0x38);
  uStack_e30._0_1_ = (char)uStack_10f0;
  uStack_e30._1_1_ = (char)((ulong)uStack_10f0 >> 8);
  uStack_e30._2_1_ = (char)((ulong)uStack_10f0 >> 0x10);
  uStack_e30._3_1_ = (char)((ulong)uStack_10f0 >> 0x18);
  uStack_e30._4_1_ = (char)((ulong)uStack_10f0 >> 0x20);
  uStack_e30._5_1_ = (char)((ulong)uStack_10f0 >> 0x28);
  uStack_e30._6_1_ = (char)((ulong)uStack_10f0 >> 0x30);
  uStack_e30._7_1_ = (char)((ulong)uStack_10f0 >> 0x38);
  local_1128._0_2_ =
       CONCAT11(-(local_e28._1_1_ == local_e38._1_1_),-((char)local_e28 == (char)local_e38));
  local_1128._0_3_ = CONCAT12(-(local_e28._2_1_ == local_e38._2_1_),(undefined2)local_1128);
  local_1128._0_4_ = CONCAT13(-(local_e28._3_1_ == local_e38._3_1_),(undefined3)local_1128);
  local_1128._0_5_ = CONCAT14(-(local_e28._4_1_ == local_e38._4_1_),(undefined4)local_1128);
  local_1128._0_6_ = CONCAT15(-(local_e28._5_1_ == local_e38._5_1_),(undefined5)local_1128);
  local_1128._0_7_ = CONCAT16(-(local_e28._6_1_ == local_e38._6_1_),(undefined6)local_1128);
  local_1128 = CONCAT17(-(local_e28._7_1_ == local_e38._7_1_),(undefined7)local_1128);
  uStack_1120._0_1_ = -((char)uStack_e20 == (char)uStack_e30);
  uStack_1120._1_1_ = -(uStack_e20._1_1_ == uStack_e30._1_1_);
  uStack_1120._2_1_ = -(uStack_e20._2_1_ == uStack_e30._2_1_);
  uStack_1120._3_1_ = -(uStack_e20._3_1_ == uStack_e30._3_1_);
  uStack_1120._4_1_ = -(uStack_e20._4_1_ == uStack_e30._4_1_);
  uStack_1120._5_1_ = -(uStack_e20._5_1_ == uStack_e30._5_1_);
  uStack_1120._6_1_ = -(uStack_e20._6_1_ == uStack_e30._6_1_);
  uStack_1120._7_1_ = -(uStack_e20._7_1_ == uStack_e30._7_1_);
  local_b08 = local_1128;
  uStack_b00 = uStack_1120;
  local_b18 = local_1108;
  uStack_b10 = uStack_1100;
  local_f68 = local_1128 & local_1108;
  uStack_f60 = uStack_1120 & uStack_1100;
  local_e58 = local_10f8;
  uStack_e50 = uStack_10f0;
  local_e48._0_1_ = (char)local_f68;
  local_e48._1_1_ = (char)(local_f68 >> 8);
  local_e48._2_1_ = (char)(local_f68 >> 0x10);
  local_e48._3_1_ = (char)(local_f68 >> 0x18);
  local_e48._4_1_ = (char)(local_f68 >> 0x20);
  local_e48._5_1_ = (char)(local_f68 >> 0x28);
  local_e48._6_1_ = (char)(local_f68 >> 0x30);
  local_e48._7_1_ = (char)(local_f68 >> 0x38);
  local_a18 = -((char)local_e48 == (char)local_e38);
  cStack_a17 = -(local_e48._1_1_ == local_e38._1_1_);
  cStack_a16 = -(local_e48._2_1_ == local_e38._2_1_);
  cStack_a15 = -(local_e48._3_1_ == local_e38._3_1_);
  cStack_a14 = -(local_e48._4_1_ == local_e38._4_1_);
  cStack_a13 = -(local_e48._5_1_ == local_e38._5_1_);
  cStack_a12 = -(local_e48._6_1_ == local_e38._6_1_);
  cStack_a11 = -(local_e48._7_1_ == local_e38._7_1_);
  cStack_a10 = -((char)local_e48 == (char)uStack_e30);
  cStack_a0f = -(local_e48._1_1_ == uStack_e30._1_1_);
  cStack_a0e = -(local_e48._2_1_ == uStack_e30._2_1_);
  cStack_a0d = -(local_e48._3_1_ == uStack_e30._3_1_);
  cStack_a0c = -(local_e48._4_1_ == uStack_e30._4_1_);
  cStack_a0b = -(local_e48._5_1_ == uStack_e30._5_1_);
  cStack_a0a = -(local_e48._6_1_ == uStack_e30._6_1_);
  bStack_a09 = -(local_e48._7_1_ == uStack_e30._7_1_);
  auVar70[1] = cStack_a17;
  auVar70[0] = local_a18;
  auVar70[2] = cStack_a16;
  auVar70[3] = cStack_a15;
  auVar70[4] = cStack_a14;
  auVar70[5] = cStack_a13;
  auVar70[6] = cStack_a12;
  auVar70[7] = cStack_a11;
  auVar70[8] = cStack_a10;
  auVar70[9] = cStack_a0f;
  auVar70[10] = cStack_a0e;
  auVar70[0xb] = cStack_a0d;
  auVar70[0xc] = cStack_a0c;
  auVar70[0xd] = cStack_a0b;
  auVar70[0xe] = cStack_a0a;
  auVar70[0xf] = bStack_a09;
  local_f58 = local_f68;
  uStack_f50 = uStack_f60;
  local_e48 = local_f68;
  uStack_e40 = local_f68;
  uStack_e30 = uVar2;
  local_e28 = uVar3;
  uStack_e20 = uVar4;
  local_d68 = uVar12;
  uStack_d60 = uVar15;
  local_1128 = local_f68;
  uStack_1120 = local_f68;
  if ((ushort)((ushort)(SUB161(auVar70 >> 7,0) & 1) | (ushort)(SUB161(auVar70 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar70 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar70 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar70 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar70 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar70 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar70 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar70 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar70 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar70 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar70 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar70 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar70 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar70 >> 0x77,0) & 1) << 0xe | (ushort)(bStack_a09 >> 7) << 0xf) !=
      0xffff) {
    local_93a = 4;
    local_2 = 4;
    local_4 = 4;
    local_6 = 4;
    local_8 = 4;
    local_a = 4;
    local_c = 4;
    local_e = 4;
    local_10 = 4;
    local_1308 = 0x4000400040004;
    uStack_1300 = 0x4000400040004;
    uVar114 = *local_1090;
    uStack_f70 = local_1090[1];
    local_f88 = local_10f8;
    uStack_f80 = uStack_10f0;
    local_f78._0_1_ = (undefined1)uVar114;
    local_f78._1_1_ = (undefined1)(uVar114 >> 8);
    local_f78._2_1_ = (undefined1)(uVar114 >> 0x10);
    local_f78._3_1_ = (undefined1)(uVar114 >> 0x18);
    local_f78._4_1_ = (undefined1)(uVar114 >> 0x20);
    local_f78._5_1_ = (undefined1)(uVar114 >> 0x28);
    local_f78._6_1_ = (undefined1)(uVar114 >> 0x30);
    local_f78._7_1_ = (undefined1)(uVar114 >> 0x38);
    local_1138 = (undefined1)local_f78;
    cStack_1137 = (char)local_e38;
    uStack_1136 = local_f78._1_1_;
    cStack_1135 = local_e38._1_1_;
    uStack_1134 = local_f78._2_1_;
    cStack_1133 = local_e38._2_1_;
    uStack_1132 = local_f78._3_1_;
    cStack_1131 = local_e38._3_1_;
    uStack_1130 = local_f78._4_1_;
    cStack_112f = local_e38._4_1_;
    uStack_112e = local_f78._5_1_;
    cStack_112d = local_e38._5_1_;
    uStack_112c = local_f78._6_1_;
    cStack_112b = local_e38._6_1_;
    uStack_112a = local_f78._7_1_;
    cStack_1129 = local_e38._7_1_;
    lVar5 = (*local_10a0)[0];
    lStack_f90 = (*local_10a0)[1];
    local_fa8 = local_10f8;
    uStack_fa0 = uStack_10f0;
    local_f98._0_1_ = (undefined1)lVar5;
    local_f98._1_1_ = (undefined1)((ulong)lVar5 >> 8);
    local_f98._2_1_ = (undefined1)((ulong)lVar5 >> 0x10);
    local_f98._3_1_ = (undefined1)((ulong)lVar5 >> 0x18);
    local_f98._4_1_ = (undefined1)((ulong)lVar5 >> 0x20);
    local_f98._5_1_ = (undefined1)((ulong)lVar5 >> 0x28);
    local_f98._6_1_ = (undefined1)((ulong)lVar5 >> 0x30);
    local_f98._7_1_ = (undefined1)((ulong)lVar5 >> 0x38);
    local_1158 = (undefined1)local_f98;
    cStack_1157 = (char)local_e38;
    uStack_1156 = local_f98._1_1_;
    cStack_1155 = local_e38._1_1_;
    uStack_1154 = local_f98._2_1_;
    cStack_1153 = local_e38._2_1_;
    uStack_1152 = local_f98._3_1_;
    cStack_1151 = local_e38._3_1_;
    uStack_1150 = local_f98._4_1_;
    cStack_114f = local_e38._4_1_;
    uStack_114e = local_f98._5_1_;
    cStack_114d = local_e38._5_1_;
    uStack_114c = local_f98._6_1_;
    cStack_114b = local_e38._6_1_;
    uStack_114a = local_f98._7_1_;
    cStack_1149 = local_e38._7_1_;
    uVar92 = *local_10b0;
    uStack_fb0 = local_10b0[1];
    local_fc8 = local_10f8;
    uStack_fc0 = uStack_10f0;
    local_fb8._0_1_ = (undefined1)uVar92;
    local_fb8._1_1_ = (undefined1)(uVar92 >> 8);
    local_fb8._2_1_ = (undefined1)(uVar92 >> 0x10);
    local_fb8._3_1_ = (undefined1)(uVar92 >> 0x18);
    local_fb8._4_1_ = (undefined1)(uVar92 >> 0x20);
    local_fb8._5_1_ = (undefined1)(uVar92 >> 0x28);
    local_fb8._6_1_ = (undefined1)(uVar92 >> 0x30);
    local_fb8._7_1_ = (undefined1)(uVar92 >> 0x38);
    local_1168 = (undefined1)local_fb8;
    cStack_1167 = (char)local_e38;
    uStack_1166 = local_fb8._1_1_;
    cStack_1165 = local_e38._1_1_;
    uStack_1164 = local_fb8._2_1_;
    cStack_1163 = local_e38._2_1_;
    uStack_1162 = local_fb8._3_1_;
    cStack_1161 = local_e38._3_1_;
    uStack_1160 = local_fb8._4_1_;
    cStack_115f = local_e38._4_1_;
    uStack_115e = local_fb8._5_1_;
    cStack_115d = local_e38._5_1_;
    uStack_115c = local_fb8._6_1_;
    cStack_115b = local_e38._6_1_;
    uStack_115a = local_fb8._7_1_;
    cStack_1159 = local_e38._7_1_;
    lVar6 = (*local_10b8)[0];
    lStack_fd0 = (*local_10b8)[1];
    local_fe8 = local_10f8;
    uStack_fe0 = uStack_10f0;
    local_fd8._0_1_ = (undefined1)lVar6;
    local_fd8._1_1_ = (undefined1)((ulong)lVar6 >> 8);
    local_fd8._2_1_ = (undefined1)((ulong)lVar6 >> 0x10);
    local_fd8._3_1_ = (undefined1)((ulong)lVar6 >> 0x18);
    local_fd8._4_1_ = (undefined1)((ulong)lVar6 >> 0x20);
    local_fd8._5_1_ = (undefined1)((ulong)lVar6 >> 0x28);
    local_fd8._6_1_ = (undefined1)((ulong)lVar6 >> 0x30);
    local_fd8._7_1_ = (undefined1)((ulong)lVar6 >> 0x38);
    local_1178 = (undefined1)local_fd8;
    cStack_1177 = (char)local_e38;
    uStack_1176 = local_fd8._1_1_;
    cStack_1175 = local_e38._1_1_;
    uStack_1174 = local_fd8._2_1_;
    cStack_1173 = local_e38._2_1_;
    uStack_1172 = local_fd8._3_1_;
    cStack_1171 = local_e38._3_1_;
    uStack_1170 = local_fd8._4_1_;
    cStack_116f = local_e38._4_1_;
    uStack_116e = local_fd8._5_1_;
    cStack_116d = local_e38._5_1_;
    uStack_116c = local_fd8._6_1_;
    cStack_116b = local_e38._6_1_;
    uStack_116a = local_fd8._7_1_;
    cStack_1169 = local_e38._7_1_;
    lVar7 = *local_10a8;
    lStack_ff0 = local_10a8[1];
    local_1008 = local_10f8;
    uStack_1000 = uStack_10f0;
    local_ff8._0_1_ = (undefined1)lVar7;
    local_ff8._1_1_ = (undefined1)((ulong)lVar7 >> 8);
    local_ff8._2_1_ = (undefined1)((ulong)lVar7 >> 0x10);
    local_ff8._3_1_ = (undefined1)((ulong)lVar7 >> 0x18);
    local_ff8._4_1_ = (undefined1)((ulong)lVar7 >> 0x20);
    local_ff8._5_1_ = (undefined1)((ulong)lVar7 >> 0x28);
    local_ff8._6_1_ = (undefined1)((ulong)lVar7 >> 0x30);
    local_ff8._7_1_ = (undefined1)((ulong)lVar7 >> 0x38);
    local_1188 = (undefined1)local_ff8;
    cStack_1187 = (char)local_e38;
    uStack_1186 = local_ff8._1_1_;
    cStack_1185 = local_e38._1_1_;
    uStack_1184 = local_ff8._2_1_;
    cStack_1183 = local_e38._2_1_;
    uStack_1182 = local_ff8._3_1_;
    cStack_1181 = local_e38._3_1_;
    uStack_1180 = local_ff8._4_1_;
    cStack_117f = local_e38._4_1_;
    uStack_117e = local_ff8._5_1_;
    cStack_117d = local_e38._5_1_;
    uStack_117c = local_ff8._6_1_;
    cStack_117b = local_e38._6_1_;
    uStack_117a = local_ff8._7_1_;
    cStack_1179 = local_e38._7_1_;
    uVar93 = *local_1098;
    uStack_1010 = local_1098[1];
    local_1028 = local_10f8;
    uStack_1020 = uStack_10f0;
    local_1018._0_1_ = (undefined1)uVar93;
    local_1018._1_1_ = (undefined1)(uVar93 >> 8);
    local_1018._2_1_ = (undefined1)(uVar93 >> 0x10);
    local_1018._3_1_ = (undefined1)(uVar93 >> 0x18);
    local_1018._4_1_ = (undefined1)(uVar93 >> 0x20);
    local_1018._5_1_ = (undefined1)(uVar93 >> 0x28);
    local_1018._6_1_ = (undefined1)(uVar93 >> 0x30);
    local_1018._7_1_ = (undefined1)(uVar93 >> 0x38);
    local_1148 = (undefined1)local_1018;
    cStack_1147 = (char)local_e38;
    uStack_1146 = local_1018._1_1_;
    cStack_1145 = local_e38._1_1_;
    uStack_1144 = local_1018._2_1_;
    cStack_1143 = local_e38._2_1_;
    uStack_1142 = local_1018._3_1_;
    cStack_1141 = local_e38._3_1_;
    uStack_1140 = local_1018._4_1_;
    cStack_113f = local_e38._4_1_;
    uStack_113e = local_1018._5_1_;
    cStack_113d = local_e38._5_1_;
    uStack_113c = local_1018._6_1_;
    cStack_113b = local_e38._6_1_;
    uStack_113a = local_1018._7_1_;
    cStack_1139 = local_e38._7_1_;
    lVar8 = (*local_1080)[0];
    lStack_1030 = (*local_1080)[1];
    local_1048 = local_10f8;
    uStack_1040 = uStack_10f0;
    local_1038._0_1_ = (undefined1)lVar8;
    local_1038._1_1_ = (undefined1)((ulong)lVar8 >> 8);
    local_1038._2_1_ = (undefined1)((ulong)lVar8 >> 0x10);
    local_1038._3_1_ = (undefined1)((ulong)lVar8 >> 0x18);
    local_1038._4_1_ = (undefined1)((ulong)lVar8 >> 0x20);
    local_1038._5_1_ = (undefined1)((ulong)lVar8 >> 0x28);
    local_1038._6_1_ = (undefined1)((ulong)lVar8 >> 0x30);
    local_1038._7_1_ = (undefined1)((ulong)lVar8 >> 0x38);
    local_1198 = (undefined1)local_1038;
    cStack_1197 = (char)local_e38;
    uStack_1196 = local_1038._1_1_;
    cStack_1195 = local_e38._1_1_;
    uStack_1194 = local_1038._2_1_;
    cStack_1193 = local_e38._2_1_;
    uStack_1192 = local_1038._3_1_;
    cStack_1191 = local_e38._3_1_;
    uStack_1190 = local_1038._4_1_;
    cStack_118f = local_e38._4_1_;
    uStack_118e = local_1038._5_1_;
    cStack_118d = local_e38._5_1_;
    uStack_118c = local_1038._6_1_;
    cStack_118b = local_e38._6_1_;
    uStack_118a = local_1038._7_1_;
    cStack_1189 = local_e38._7_1_;
    lVar9 = *local_1088;
    lStack_1050 = local_1088[1];
    local_1068 = local_10f8;
    uStack_1060 = uStack_10f0;
    local_1058._0_1_ = (undefined1)lVar9;
    local_1058._1_1_ = (undefined1)((ulong)lVar9 >> 8);
    local_1058._2_1_ = (undefined1)((ulong)lVar9 >> 0x10);
    local_1058._3_1_ = (undefined1)((ulong)lVar9 >> 0x18);
    local_1058._4_1_ = (undefined1)((ulong)lVar9 >> 0x20);
    local_1058._5_1_ = (undefined1)((ulong)lVar9 >> 0x28);
    local_1058._6_1_ = (undefined1)((ulong)lVar9 >> 0x30);
    local_1058._7_1_ = (undefined1)((ulong)lVar9 >> 0x38);
    local_11a8 = (undefined1)local_1058;
    cStack_11a7 = (char)local_e38;
    uStack_11a6 = local_1058._1_1_;
    cStack_11a5 = local_e38._1_1_;
    uStack_11a4 = local_1058._2_1_;
    cStack_11a3 = local_e38._2_1_;
    uStack_11a2 = local_1058._3_1_;
    cStack_11a1 = local_e38._3_1_;
    uStack_11a0 = local_1058._4_1_;
    cStack_119f = local_e38._4_1_;
    uStack_119e = local_1058._5_1_;
    cStack_119d = local_e38._5_1_;
    uStack_119c = local_1058._6_1_;
    cStack_119b = local_e38._6_1_;
    uStack_119a = local_1058._7_1_;
    cStack_1199 = local_e38._7_1_;
    uVar10 = CONCAT13(local_e38._1_1_,
                      CONCAT12(local_1038._1_1_,CONCAT11((char)local_e38,(undefined1)local_1038)));
    uVar11 = CONCAT15(local_e38._2_1_,CONCAT14(local_1038._2_1_,uVar10));
    local_678 = CONCAT17(local_e38._3_1_,CONCAT16(local_1038._3_1_,uVar11));
    uVar13 = CONCAT13(local_e38._5_1_,
                      CONCAT12(local_1038._5_1_,CONCAT11(local_e38._4_1_,local_1038._4_1_)));
    uVar14 = CONCAT15(local_e38._6_1_,CONCAT14(local_1038._6_1_,uVar13));
    uStack_670 = CONCAT17(local_e38._7_1_,CONCAT16(local_1038._7_1_,uVar14));
    local_668._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_668._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_668._6_2_ = (short)((ulong)local_678 >> 0x30);
    uStack_660._2_2_ = (short)((uint)uVar13 >> 0x10);
    uStack_660._4_2_ = (short)((uint6)uVar14 >> 0x20);
    uStack_660._6_2_ = (short)((ulong)uStack_670 >> 0x30);
    local_6a8 = CONCAT11((char)local_e38,(undefined1)local_1038) * 2;
    sStack_6a6 = local_668._2_2_ * 2;
    sStack_6a4 = local_668._4_2_ * 2;
    sStack_6a2 = local_668._6_2_ * 2;
    sStack_6a0 = CONCAT11(local_e38._4_1_,local_1038._4_1_) * 2;
    sStack_69e = uStack_660._2_2_ * 2;
    sStack_69c = uStack_660._4_2_ * 2;
    sStack_69a = uStack_660._6_2_ * 2;
    uVar31 = CONCAT13(local_e38._1_1_,
                      CONCAT12(local_f78._1_1_,CONCAT11((char)local_e38,(undefined1)local_f78)));
    uVar32 = CONCAT15(local_e38._2_1_,CONCAT14(local_f78._2_1_,uVar31));
    uVar59 = CONCAT17(local_e38._3_1_,CONCAT16(local_f78._3_1_,uVar32));
    uVar37 = CONCAT13(local_e38._5_1_,
                      CONCAT12(local_f78._5_1_,CONCAT11(local_e38._4_1_,local_f78._4_1_)));
    uVar38 = CONCAT15(local_e38._6_1_,CONCAT14(local_f78._6_1_,uVar37));
    uVar62 = CONCAT17(local_e38._7_1_,CONCAT16(local_f78._7_1_,uVar38));
    uVar10 = CONCAT13(local_e38._1_1_,
                      CONCAT12(local_f98._1_1_,CONCAT11((char)local_e38,(undefined1)local_f98)));
    uVar11 = CONCAT15(local_e38._2_1_,CONCAT14(local_f98._2_1_,uVar10));
    uVar47 = CONCAT17(local_e38._3_1_,CONCAT16(local_f98._3_1_,uVar11));
    uVar13 = CONCAT13(local_e38._5_1_,
                      CONCAT12(local_f98._5_1_,CONCAT11(local_e38._4_1_,local_f98._4_1_)));
    uVar14 = CONCAT15(local_e38._6_1_,CONCAT14(local_f98._6_1_,uVar13));
    uVar51 = CONCAT17(local_e38._7_1_,CONCAT16(local_f98._7_1_,uVar14));
    local_688._2_2_ = (short)((uint)uVar31 >> 0x10);
    local_688._4_2_ = (short)((uint6)uVar32 >> 0x20);
    local_688._6_2_ = (short)((ulong)uVar59 >> 0x30);
    uStack_680._2_2_ = (short)((uint)uVar37 >> 0x10);
    uStack_680._4_2_ = (short)((uint6)uVar38 >> 0x20);
    uStack_680._6_2_ = (short)((ulong)uVar62 >> 0x30);
    local_698._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_698._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_698._6_2_ = (short)((ulong)uVar47 >> 0x30);
    uStack_690._2_2_ = (short)((uint)uVar13 >> 0x10);
    uStack_690._4_2_ = (short)((uint6)uVar14 >> 0x20);
    uStack_690._6_2_ = (short)((ulong)uVar51 >> 0x30);
    local_6b8 = CONCAT11((char)local_e38,(undefined1)local_f78) +
                CONCAT11((char)local_e38,(undefined1)local_f98);
    sStack_6b6 = local_688._2_2_ + local_698._2_2_;
    sStack_6b4 = local_688._4_2_ + local_698._4_2_;
    sStack_6b2 = local_688._6_2_ + local_698._6_2_;
    sStack_6b0 = CONCAT11(local_e38._4_1_,local_f78._4_1_) +
                 CONCAT11(local_e38._4_1_,local_f98._4_1_);
    sStack_6ae = uStack_680._2_2_ + uStack_690._2_2_;
    sStack_6ac = uStack_680._4_2_ + uStack_690._4_2_;
    sStack_6aa = uStack_680._6_2_ + uStack_690._6_2_;
    local_6c8 = CONCAT26(sStack_6a2 + sStack_6b2,
                         CONCAT24(sStack_6a4 + sStack_6b4,
                                  CONCAT22(sStack_6a6 + sStack_6b6,local_6a8 + local_6b8)));
    uStack_6c0 = CONCAT26(sStack_69a + sStack_6aa,
                          CONCAT24(sStack_69c + sStack_6ac,
                                   CONCAT22(sStack_69e + sStack_6ae,sStack_6a0 + sStack_6b0)));
    local_6e8 = local_6a8 + local_6b8 + 4;
    sStack_6e6 = sStack_6a6 + sStack_6b6 + 4;
    sStack_6e4 = sStack_6a4 + sStack_6b4 + 4;
    sStack_6e2 = sStack_6a2 + sStack_6b2 + 4;
    sStack_6e0 = sStack_6a0 + sStack_6b0 + 4;
    sStack_6de = sStack_69e + sStack_6ae + 4;
    sStack_6dc = sStack_69c + sStack_6ac + 4;
    sStack_6da = sStack_69a + sStack_6aa + 4;
    uVar10 = CONCAT13(local_e38._1_1_,
                      CONCAT12(local_fb8._1_1_,CONCAT11((char)local_e38,(undefined1)local_fb8)));
    uVar11 = CONCAT15(local_e38._2_1_,CONCAT14(local_fb8._2_1_,uVar10));
    uVar41 = CONCAT17(local_e38._3_1_,CONCAT16(local_fb8._3_1_,uVar11));
    uVar13 = CONCAT13(local_e38._5_1_,
                      CONCAT12(local_fb8._5_1_,CONCAT11(local_e38._4_1_,local_fb8._4_1_)));
    uVar14 = CONCAT15(local_e38._6_1_,CONCAT14(local_fb8._6_1_,uVar13));
    uVar44 = CONCAT17(local_e38._7_1_,CONCAT16(local_fb8._7_1_,uVar14));
    local_6f8._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_6f8._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_6f8._6_2_ = (short)((ulong)uVar41 >> 0x30);
    uStack_6f0._2_2_ = (short)((uint)uVar13 >> 0x10);
    uStack_6f0._4_2_ = (short)((uint6)uVar14 >> 0x20);
    uStack_6f0._6_2_ = (short)((ulong)uVar44 >> 0x30);
    local_7c8 = local_6e8 + CONCAT11((char)local_e38,(undefined1)local_fb8);
    local_6f8._2_2_ = sStack_6e6 + local_6f8._2_2_;
    local_6f8._4_2_ = sStack_6e4 + local_6f8._4_2_;
    local_6f8._6_2_ = sStack_6e2 + local_6f8._6_2_;
    sStack_7c0 = sStack_6e0 + CONCAT11(local_e38._4_1_,local_fb8._4_1_);
    uStack_6f0._2_2_ = sStack_6de + uStack_6f0._2_2_;
    uStack_6f0._4_2_ = sStack_6dc + uStack_6f0._4_2_;
    uStack_6f0._6_2_ = sStack_6da + uStack_6f0._6_2_;
    uVar10 = CONCAT13(local_e38._1_1_,
                      CONCAT12(local_fd8._1_1_,CONCAT11((char)local_e38,(undefined1)local_fd8)));
    uVar11 = CONCAT15(local_e38._2_1_,CONCAT14(local_fd8._2_1_,uVar10));
    uVar29 = CONCAT17(local_e38._3_1_,CONCAT16(local_fd8._3_1_,uVar11));
    uVar13 = CONCAT13(local_e38._5_1_,
                      CONCAT12(local_fd8._5_1_,CONCAT11(local_e38._4_1_,local_fd8._4_1_)));
    uVar14 = CONCAT15(local_e38._6_1_,CONCAT14(local_fd8._6_1_,uVar13));
    uVar35 = CONCAT17(local_e38._7_1_,CONCAT16(local_fd8._7_1_,uVar14));
    uVar31 = CONCAT13(local_e38._1_1_,
                      CONCAT12(local_f78._1_1_,CONCAT11((char)local_e38,(undefined1)local_f78)));
    uVar32 = CONCAT15(local_e38._2_1_,CONCAT14(local_f78._2_1_,uVar31));
    uVar60 = CONCAT17(local_e38._3_1_,CONCAT16(local_f78._3_1_,uVar32));
    uVar37 = CONCAT13(local_e38._5_1_,
                      CONCAT12(local_f78._5_1_,CONCAT11(local_e38._4_1_,local_f78._4_1_)));
    uVar38 = CONCAT15(local_e38._6_1_,CONCAT14(local_f78._6_1_,uVar37));
    uVar63 = CONCAT17(local_e38._7_1_,CONCAT16(local_f78._7_1_,uVar38));
    local_708._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_708._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_708._6_2_ = (short)((ulong)uVar29 >> 0x30);
    uStack_700._2_2_ = (short)((uint)uVar13 >> 0x10);
    uStack_700._4_2_ = (short)((uint6)uVar14 >> 0x20);
    uStack_700._6_2_ = (short)((ulong)uVar35 >> 0x30);
    local_718._2_2_ = (short)((uint)uVar31 >> 0x10);
    local_718._4_2_ = (short)((uint6)uVar32 >> 0x20);
    local_718._6_2_ = (short)((ulong)uVar60 >> 0x30);
    uStack_710._2_2_ = (short)((uint)uVar37 >> 0x10);
    uStack_710._4_2_ = (short)((uint6)uVar38 >> 0x20);
    uStack_710._6_2_ = (short)((ulong)uVar63 >> 0x30);
    local_728 = CONCAT11((char)local_e38,(undefined1)local_fd8) +
                CONCAT11((char)local_e38,(undefined1)local_f78);
    sStack_726 = local_708._2_2_ + local_718._2_2_;
    sStack_724 = local_708._4_2_ + local_718._4_2_;
    sStack_722 = local_708._6_2_ + local_718._6_2_;
    sStack_720 = CONCAT11(local_e38._4_1_,local_fd8._4_1_) +
                 CONCAT11(local_e38._4_1_,local_f78._4_1_);
    sStack_71e = uStack_700._2_2_ + uStack_710._2_2_;
    sStack_71c = uStack_700._4_2_ + uStack_710._4_2_;
    sStack_71a = uStack_700._6_2_ + uStack_710._6_2_;
    uVar10 = CONCAT13(local_e38._1_1_,
                      CONCAT12(local_1038._1_1_,CONCAT11((char)local_e38,(undefined1)local_1038)));
    uVar11 = CONCAT15(local_e38._2_1_,CONCAT14(local_1038._2_1_,uVar10));
    uVar17 = CONCAT17(local_e38._3_1_,CONCAT16(local_1038._3_1_,uVar11));
    uVar13 = CONCAT13(local_e38._5_1_,
                      CONCAT12(local_1038._5_1_,CONCAT11(local_e38._4_1_,local_1038._4_1_)));
    uVar14 = CONCAT15(local_e38._6_1_,CONCAT14(local_1038._6_1_,uVar13));
    uVar20 = CONCAT17(local_e38._7_1_,CONCAT16(local_1038._7_1_,uVar14));
    local_738._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_738._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_738._6_2_ = (short)((ulong)uVar17 >> 0x30);
    uStack_730._2_2_ = (short)((uint)uVar13 >> 0x10);
    uStack_730._4_2_ = (short)((uint6)uVar14 >> 0x20);
    uStack_730._6_2_ = (short)((ulong)uVar20 >> 0x30);
    sVar89 = local_728 + CONCAT11((char)local_e38,(undefined1)local_1038);
    sVar110 = sStack_720 + CONCAT11(local_e38._4_1_,local_1038._4_1_);
    local_748 = CONCAT26(local_6f8._6_2_,
                         CONCAT24(local_6f8._4_2_,CONCAT22(local_6f8._2_2_,local_7c8)));
    uStack_740 = CONCAT26(uStack_6f0._6_2_,
                          CONCAT24(uStack_6f0._4_2_,CONCAT22(uStack_6f0._2_2_,sStack_7c0)));
    local_758 = CONCAT26(sStack_722 + local_738._6_2_,
                         CONCAT24(sStack_724 + local_738._4_2_,
                                  CONCAT22(sStack_726 + local_738._2_2_,sVar89)));
    uStack_750 = CONCAT26(sStack_71a + uStack_730._6_2_,
                          CONCAT24(sStack_71c + uStack_730._4_2_,
                                   CONCAT22(sStack_71e + uStack_730._2_2_,sVar110)));
    local_ba8 = local_7c8 + sVar89;
    uStack_ba6 = local_6f8._2_2_ + sStack_726 + local_738._2_2_;
    uStack_ba4 = local_6f8._4_2_ + sStack_724 + local_738._4_2_;
    uStack_ba2 = local_6f8._6_2_ + sStack_722 + local_738._6_2_;
    uStack_ba0 = sStack_7c0 + sVar110;
    uStack_b9e = uStack_6f0._2_2_ + sStack_71e + uStack_730._2_2_;
    uStack_b9c = uStack_6f0._4_2_ + sStack_71c + uStack_730._4_2_;
    uStack_b9a = uStack_6f0._6_2_ + sStack_71a + uStack_730._6_2_;
    local_bac = 3;
    local_1358 = local_ba8 >> 3;
    uStack_1356 = uStack_ba6 >> 3;
    uStack_1354 = uStack_ba4 >> 3;
    uStack_1352 = uStack_ba2 >> 3;
    uStack_1350 = uStack_ba0 >> 3;
    uStack_134e = uStack_b9e >> 3;
    uStack_134c = uStack_b9c >> 3;
    uStack_134a = uStack_b9a >> 3;
    uVar31 = CONCAT13(local_e38._1_1_,
                      CONCAT12(local_fd8._1_1_,CONCAT11((char)local_e38,(undefined1)local_fd8)));
    uVar32 = CONCAT15(local_e38._2_1_,CONCAT14(local_fd8._2_1_,uVar31));
    uVar30 = CONCAT17(local_e38._3_1_,CONCAT16(local_fd8._3_1_,uVar32));
    uVar37 = CONCAT13(local_e38._5_1_,
                      CONCAT12(local_fd8._5_1_,CONCAT11(local_e38._4_1_,local_fd8._4_1_)));
    uVar38 = CONCAT15(local_e38._6_1_,CONCAT14(local_fd8._6_1_,uVar37));
    uVar36 = CONCAT17(local_e38._7_1_,CONCAT16(local_fd8._7_1_,uVar38));
    uVar10 = CONCAT13(local_e38._1_1_,
                      CONCAT12(local_ff8._1_1_,CONCAT11((char)local_e38,(undefined1)local_ff8)));
    uVar11 = CONCAT15(local_e38._2_1_,CONCAT14(local_ff8._2_1_,uVar10));
    uVar23 = CONCAT17(local_e38._3_1_,CONCAT16(local_ff8._3_1_,uVar11));
    uVar13 = CONCAT13(local_e38._5_1_,
                      CONCAT12(local_ff8._5_1_,CONCAT11(local_e38._4_1_,local_ff8._4_1_)));
    uVar14 = CONCAT15(local_e38._6_1_,CONCAT14(local_ff8._6_1_,uVar13));
    uVar26 = CONCAT17(local_e38._7_1_,CONCAT16(local_ff8._7_1_,uVar14));
    local_768._2_2_ = (short)((uint)uVar31 >> 0x10);
    local_768._4_2_ = (short)((uint6)uVar32 >> 0x20);
    local_768._6_2_ = (short)((ulong)uVar30 >> 0x30);
    uStack_760._2_2_ = (short)((uint)uVar37 >> 0x10);
    uStack_760._4_2_ = (short)((uint6)uVar38 >> 0x20);
    uStack_760._6_2_ = (short)((ulong)uVar36 >> 0x30);
    local_778._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_778._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_778._6_2_ = (short)((ulong)uVar23 >> 0x30);
    uStack_770._2_2_ = (short)((uint)uVar13 >> 0x10);
    uStack_770._4_2_ = (short)((uint6)uVar14 >> 0x20);
    uStack_770._6_2_ = (short)((ulong)uVar26 >> 0x30);
    local_788 = CONCAT11((char)local_e38,(undefined1)local_fd8) +
                CONCAT11((char)local_e38,(undefined1)local_ff8);
    sStack_786 = local_768._2_2_ + local_778._2_2_;
    sStack_784 = local_768._4_2_ + local_778._4_2_;
    sStack_782 = local_768._6_2_ + local_778._6_2_;
    sStack_780 = CONCAT11(local_e38._4_1_,local_fd8._4_1_) +
                 CONCAT11(local_e38._4_1_,local_ff8._4_1_);
    sStack_77e = uStack_760._2_2_ + uStack_770._2_2_;
    sStack_77c = uStack_760._4_2_ + uStack_770._4_2_;
    sStack_77a = uStack_760._6_2_ + uStack_770._6_2_;
    uVar10 = CONCAT13(local_e38._1_1_,
                      CONCAT12(local_f98._1_1_,CONCAT11((char)local_e38,(undefined1)local_f98)));
    uVar11 = CONCAT15(local_e38._2_1_,CONCAT14(local_f98._2_1_,uVar10));
    uVar48 = CONCAT17(local_e38._3_1_,CONCAT16(local_f98._3_1_,uVar11));
    uVar13 = CONCAT13(local_e38._5_1_,
                      CONCAT12(local_f98._5_1_,CONCAT11(local_e38._4_1_,local_f98._4_1_)));
    uVar14 = CONCAT15(local_e38._6_1_,CONCAT14(local_f98._6_1_,uVar13));
    uVar52 = CONCAT17(local_e38._7_1_,CONCAT16(local_f98._7_1_,uVar14));
    local_798._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_798._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_798._6_2_ = (short)((ulong)uVar48 >> 0x30);
    uStack_790._2_2_ = (short)((uint)uVar13 >> 0x10);
    uStack_790._4_2_ = (short)((uint6)uVar14 >> 0x20);
    uStack_790._6_2_ = (short)((ulong)uVar52 >> 0x30);
    local_7e8 = local_788 + CONCAT11((char)local_e38,(undefined1)local_f98);
    local_798._2_2_ = sStack_786 + local_798._2_2_;
    local_798._4_2_ = sStack_784 + local_798._4_2_;
    local_798._6_2_ = sStack_782 + local_798._6_2_;
    sStack_7e0 = sStack_780 + CONCAT11(local_e38._4_1_,local_f98._4_1_);
    uStack_790._2_2_ = sStack_77e + uStack_790._2_2_;
    uStack_790._4_2_ = sStack_77c + uStack_790._4_2_;
    uStack_790._6_2_ = sStack_77a + uStack_790._6_2_;
    local_7a8 = CONCAT26(local_6f8._6_2_,
                         CONCAT24(local_6f8._4_2_,CONCAT22(local_6f8._2_2_,local_7c8)));
    uStack_7a0 = CONCAT26(uStack_6f0._6_2_,
                          CONCAT24(uStack_6f0._4_2_,CONCAT22(uStack_6f0._2_2_,sStack_7c0)));
    local_7b8 = CONCAT26(local_798._6_2_,
                         CONCAT24(local_798._4_2_,CONCAT22(local_798._2_2_,local_7e8)));
    uStack_7b0 = CONCAT26(uStack_790._6_2_,
                          CONCAT24(uStack_790._4_2_,CONCAT22(uStack_790._2_2_,sStack_7e0)));
    local_bc8 = local_7c8 + local_7e8;
    uStack_bc6 = local_6f8._2_2_ + local_798._2_2_;
    uStack_bc4 = local_6f8._4_2_ + local_798._4_2_;
    uStack_bc2 = local_6f8._6_2_ + local_798._6_2_;
    uStack_bc0 = sStack_7c0 + sStack_7e0;
    uStack_bbe = uStack_6f0._2_2_ + uStack_790._2_2_;
    uStack_bbc = uStack_6f0._4_2_ + uStack_790._4_2_;
    uStack_bba = uStack_6f0._6_2_ + uStack_790._6_2_;
    local_bcc = 3;
    uVar90 = local_bc8 >> 3;
    uVar98 = uStack_bc6 >> 3;
    uVar102 = uStack_bc4 >> 3;
    uVar106 = uStack_bc2 >> 3;
    uVar111 = uStack_bc0 >> 3;
    uVar118 = uStack_bbe >> 3;
    uVar122 = uStack_bbc >> 3;
    uVar126 = uStack_bba >> 3;
    local_568 = CONCAT26(local_6f8._6_2_,
                         CONCAT24(local_6f8._4_2_,CONCAT22(local_6f8._2_2_,local_7c8)));
    uStack_560 = CONCAT26(uStack_6f0._6_2_,
                          CONCAT24(uStack_6f0._4_2_,CONCAT22(uStack_6f0._2_2_,sStack_7c0)));
    uVar10 = CONCAT13(local_e38._1_1_,
                      CONCAT12(local_1038._1_1_,CONCAT11((char)local_e38,(undefined1)local_1038)));
    uVar11 = CONCAT15(local_e38._2_1_,CONCAT14(local_1038._2_1_,uVar10));
    uVar18 = CONCAT17(local_e38._3_1_,CONCAT16(local_1038._3_1_,uVar11));
    uVar13 = CONCAT13(local_e38._5_1_,
                      CONCAT12(local_1038._5_1_,CONCAT11(local_e38._4_1_,local_1038._4_1_)));
    uVar14 = CONCAT15(local_e38._6_1_,CONCAT14(local_1038._6_1_,uVar13));
    uVar21 = CONCAT17(local_e38._7_1_,CONCAT16(local_1038._7_1_,uVar14));
    local_578._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_578._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_578._6_2_ = (short)((ulong)uVar18 >> 0x30);
    uStack_570._2_2_ = (short)((uint)uVar13 >> 0x10);
    uStack_570._4_2_ = (short)((uint6)uVar14 >> 0x20);
    uStack_570._6_2_ = (short)((ulong)uVar21 >> 0x30);
    local_7c8 = local_7c8 - CONCAT11((char)local_e38,(undefined1)local_1038);
    sStack_7c6 = local_6f8._2_2_ - local_578._2_2_;
    sStack_7c4 = local_6f8._4_2_ - local_578._4_2_;
    sStack_7c2 = local_6f8._6_2_ - local_578._6_2_;
    sStack_7c0 = sStack_7c0 - CONCAT11(local_e38._4_1_,local_1038._4_1_);
    sStack_7be = uStack_6f0._2_2_ - uStack_570._2_2_;
    sStack_7bc = uStack_6f0._4_2_ - uStack_570._4_2_;
    sStack_7ba = uStack_6f0._6_2_ - uStack_570._6_2_;
    uVar10 = CONCAT13(local_e38._1_1_,
                      CONCAT12(local_1018._1_1_,CONCAT11((char)local_e38,(undefined1)local_1018)));
    uVar11 = CONCAT15(local_e38._2_1_,CONCAT14(local_1018._2_1_,uVar10));
    uVar55 = CONCAT17(local_e38._3_1_,CONCAT16(local_1018._3_1_,uVar11));
    uVar13 = CONCAT13(local_e38._5_1_,
                      CONCAT12(local_1018._5_1_,CONCAT11(local_e38._4_1_,local_1018._4_1_)));
    uVar14 = CONCAT15(local_e38._6_1_,CONCAT14(local_1018._6_1_,uVar13));
    uVar57 = CONCAT17(local_e38._7_1_,CONCAT16(local_1018._7_1_,uVar14));
    local_7d8._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_7d8._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_7d8._6_2_ = (short)((ulong)uVar55 >> 0x30);
    uStack_7d0._2_2_ = (short)((uint)uVar13 >> 0x10);
    uStack_7d0._4_2_ = (short)((uint6)uVar14 >> 0x20);
    uStack_7d0._6_2_ = (short)((ulong)uVar57 >> 0x30);
    local_828 = local_7c8 + CONCAT11((char)local_e38,(undefined1)local_1018);
    local_7d8._2_2_ = sStack_7c6 + local_7d8._2_2_;
    local_7d8._4_2_ = sStack_7c4 + local_7d8._4_2_;
    local_7d8._6_2_ = sStack_7c2 + local_7d8._6_2_;
    sStack_820 = sStack_7c0 + CONCAT11(local_e38._4_1_,local_1018._4_1_);
    uStack_7d0._2_2_ = sStack_7be + uStack_7d0._2_2_;
    uStack_7d0._4_2_ = sStack_7bc + uStack_7d0._4_2_;
    uStack_7d0._6_2_ = sStack_7ba + uStack_7d0._6_2_;
    local_588 = CONCAT26(local_798._6_2_,
                         CONCAT24(local_798._4_2_,CONCAT22(local_798._2_2_,local_7e8)));
    uStack_580 = CONCAT26(uStack_790._6_2_,
                          CONCAT24(uStack_790._4_2_,CONCAT22(uStack_790._2_2_,sStack_7e0)));
    uVar10 = CONCAT13(local_e38._1_1_,
                      CONCAT12(local_f98._1_1_,CONCAT11((char)local_e38,(undefined1)local_f98)));
    uVar11 = CONCAT15(local_e38._2_1_,CONCAT14(local_f98._2_1_,uVar10));
    uVar49 = CONCAT17(local_e38._3_1_,CONCAT16(local_f98._3_1_,uVar11));
    uVar13 = CONCAT13(local_e38._5_1_,
                      CONCAT12(local_f98._5_1_,CONCAT11(local_e38._4_1_,local_f98._4_1_)));
    uVar14 = CONCAT15(local_e38._6_1_,CONCAT14(local_f98._6_1_,uVar13));
    uVar53 = CONCAT17(local_e38._7_1_,CONCAT16(local_f98._7_1_,uVar14));
    local_598._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_598._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_598._6_2_ = (short)((ulong)uVar49 >> 0x30);
    uStack_590._2_2_ = (short)((uint)uVar13 >> 0x10);
    uStack_590._4_2_ = (short)((uint6)uVar14 >> 0x20);
    uStack_590._6_2_ = (short)((ulong)uVar53 >> 0x30);
    local_7e8 = local_7e8 - CONCAT11((char)local_e38,(undefined1)local_f98);
    sStack_7e6 = local_798._2_2_ - local_598._2_2_;
    sStack_7e4 = local_798._4_2_ - local_598._4_2_;
    sStack_7e2 = local_798._6_2_ - local_598._6_2_;
    sStack_7e0 = sStack_7e0 - CONCAT11(local_e38._4_1_,local_f98._4_1_);
    sStack_7de = uStack_790._2_2_ - uStack_590._2_2_;
    sStack_7dc = uStack_790._4_2_ - uStack_590._4_2_;
    sStack_7da = uStack_790._6_2_ - uStack_590._6_2_;
    uVar10 = CONCAT13(local_e38._1_1_,
                      CONCAT12(local_fb8._1_1_,CONCAT11((char)local_e38,(undefined1)local_fb8)));
    uVar11 = CONCAT15(local_e38._2_1_,CONCAT14(local_fb8._2_1_,uVar10));
    uVar42 = CONCAT17(local_e38._3_1_,CONCAT16(local_fb8._3_1_,uVar11));
    uVar13 = CONCAT13(local_e38._5_1_,
                      CONCAT12(local_fb8._5_1_,CONCAT11(local_e38._4_1_,local_fb8._4_1_)));
    uVar14 = CONCAT15(local_e38._6_1_,CONCAT14(local_fb8._6_1_,uVar13));
    uVar45 = CONCAT17(local_e38._7_1_,CONCAT16(local_fb8._7_1_,uVar14));
    local_7f8._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_7f8._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_7f8._6_2_ = (short)((ulong)uVar42 >> 0x30);
    uStack_7f0._2_2_ = (short)((uint)uVar13 >> 0x10);
    uStack_7f0._4_2_ = (short)((uint6)uVar14 >> 0x20);
    uStack_7f0._6_2_ = (short)((ulong)uVar45 >> 0x30);
    local_848 = local_7e8 + CONCAT11((char)local_e38,(undefined1)local_fb8);
    local_7f8._2_2_ = sStack_7e6 + local_7f8._2_2_;
    local_7f8._4_2_ = sStack_7e4 + local_7f8._4_2_;
    local_7f8._6_2_ = sStack_7e2 + local_7f8._6_2_;
    sStack_840 = sStack_7e0 + CONCAT11(local_e38._4_1_,local_fb8._4_1_);
    uStack_7f0._2_2_ = sStack_7de + uStack_7f0._2_2_;
    uStack_7f0._4_2_ = sStack_7dc + uStack_7f0._4_2_;
    uStack_7f0._6_2_ = sStack_7da + uStack_7f0._6_2_;
    local_808 = CONCAT26(local_7d8._6_2_,
                         CONCAT24(local_7d8._4_2_,CONCAT22(local_7d8._2_2_,local_828)));
    uStack_800 = CONCAT26(uStack_7d0._6_2_,
                          CONCAT24(uStack_7d0._4_2_,CONCAT22(uStack_7d0._2_2_,sStack_820)));
    local_818 = CONCAT26(local_7f8._6_2_,
                         CONCAT24(local_7f8._4_2_,CONCAT22(local_7f8._2_2_,local_848)));
    uStack_810 = CONCAT26(uStack_7f0._6_2_,
                          CONCAT24(uStack_7f0._4_2_,CONCAT22(uStack_7f0._2_2_,sStack_840)));
    local_be8 = local_828 + local_848;
    uStack_be6 = local_7d8._2_2_ + local_7f8._2_2_;
    uStack_be4 = local_7d8._4_2_ + local_7f8._4_2_;
    uStack_be2 = local_7d8._6_2_ + local_7f8._6_2_;
    uStack_be0 = sStack_820 + sStack_840;
    uStack_bde = uStack_7d0._2_2_ + uStack_7f0._2_2_;
    uStack_bdc = uStack_7d0._4_2_ + uStack_7f0._4_2_;
    uStack_bda = uStack_7d0._6_2_ + uStack_7f0._6_2_;
    local_bec = 3;
    uVar91 = local_be8 >> 3;
    uVar99 = uStack_be6 >> 3;
    uVar103 = uStack_be4 >> 3;
    uVar107 = uStack_be2 >> 3;
    uVar112 = uStack_be0 >> 3;
    uVar119 = uStack_bde >> 3;
    uVar123 = uStack_bdc >> 3;
    uVar127 = uStack_bda >> 3;
    local_4c8 = CONCAT26(uVar107,CONCAT24(uVar103,CONCAT22(uVar99,uVar91)));
    uStack_4c0 = CONCAT26(uVar127,CONCAT24(uVar123,CONCAT22(uVar119,uVar112)));
    local_4d8 = CONCAT26(uVar106,CONCAT24(uVar102,CONCAT22(uVar98,uVar90)));
    uStack_4d0 = CONCAT26(uVar126,CONCAT24(uVar122,CONCAT22(uVar118,uVar111)));
    local_11c8 = (uVar91 != 0) * (uVar91 < 0x100) * (char)uVar91 - (0xff < uVar91);
    cStack_11c7 = (uVar99 != 0) * (uVar99 < 0x100) * (char)uVar99 - (0xff < uVar99);
    cStack_11c6 = (uVar103 != 0) * (uVar103 < 0x100) * (char)uVar103 - (0xff < uVar103);
    cStack_11c5 = (uVar107 != 0) * (uVar107 < 0x100) * (char)uVar107 - (0xff < uVar107);
    cStack_11c4 = (uVar112 != 0) * (uVar112 < 0x100) * (char)uVar112 - (0xff < uVar112);
    cStack_11c3 = (uVar119 != 0) * (uVar119 < 0x100) * (char)uVar119 - (0xff < uVar119);
    cStack_11c2 = (uVar123 != 0) * (uVar123 < 0x100) * (char)uVar123 - (0xff < uVar123);
    cStack_11c1 = (uVar127 != 0) * (uVar127 < 0x100) * (char)uVar127 - (0xff < uVar127);
    cStack_11c0 = (uVar90 != 0) * (uVar90 < 0x100) * (char)uVar90 - (0xff < uVar90);
    cStack_11bf = (uVar98 != 0) * (uVar98 < 0x100) * (char)uVar98 - (0xff < uVar98);
    cStack_11be = (uVar102 != 0) * (uVar102 < 0x100) * (char)uVar102 - (0xff < uVar102);
    cStack_11bd = (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 - (0xff < uVar106);
    cStack_11bc = (uVar111 != 0) * (uVar111 < 0x100) * (char)uVar111 - (0xff < uVar111);
    cStack_11bb = (uVar118 != 0) * (uVar118 < 0x100) * (char)uVar118 - (0xff < uVar118);
    cStack_11ba = (uVar122 != 0) * (uVar122 < 0x100) * (char)uVar122 - (0xff < uVar122);
    cStack_11b9 = (uVar126 != 0) * (uVar126 < 0x100) * (char)uVar126 - (0xff < uVar126);
    local_5a8 = CONCAT26(local_7d8._6_2_,
                         CONCAT24(local_7d8._4_2_,CONCAT22(local_7d8._2_2_,local_828)));
    uStack_5a0 = CONCAT26(uStack_7d0._6_2_,
                          CONCAT24(uStack_7d0._4_2_,CONCAT22(uStack_7d0._2_2_,sStack_820)));
    uVar10 = CONCAT13(local_e38._1_1_,
                      CONCAT12(local_1038._1_1_,CONCAT11((char)local_e38,(undefined1)local_1038)));
    uVar11 = CONCAT15(local_e38._2_1_,CONCAT14(local_1038._2_1_,uVar10));
    uVar19 = CONCAT17(local_e38._3_1_,CONCAT16(local_1038._3_1_,uVar11));
    uVar13 = CONCAT13(local_e38._5_1_,
                      CONCAT12(local_1038._5_1_,CONCAT11(local_e38._4_1_,local_1038._4_1_)));
    uVar14 = CONCAT15(local_e38._6_1_,CONCAT14(local_1038._6_1_,uVar13));
    uVar22 = CONCAT17(local_e38._7_1_,CONCAT16(local_1038._7_1_,uVar14));
    local_5b8._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_5b8._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_5b8._6_2_ = (short)((ulong)uVar19 >> 0x30);
    uStack_5b0._2_2_ = (short)((uint)uVar13 >> 0x10);
    uStack_5b0._4_2_ = (short)((uint6)uVar14 >> 0x20);
    uStack_5b0._6_2_ = (short)((ulong)uVar22 >> 0x30);
    local_828 = local_828 - CONCAT11((char)local_e38,(undefined1)local_1038);
    sStack_826 = local_7d8._2_2_ - local_5b8._2_2_;
    sStack_824 = local_7d8._4_2_ - local_5b8._4_2_;
    sStack_822 = local_7d8._6_2_ - local_5b8._6_2_;
    sStack_820 = sStack_820 - CONCAT11(local_e38._4_1_,local_1038._4_1_);
    sStack_81e = uStack_7d0._2_2_ - uStack_5b0._2_2_;
    sStack_81c = uStack_7d0._4_2_ - uStack_5b0._4_2_;
    sStack_81a = uStack_7d0._6_2_ - uStack_5b0._6_2_;
    uVar10 = CONCAT13(local_e38._1_1_,
                      CONCAT12(local_1058._1_1_,CONCAT11((char)local_e38,(undefined1)local_1058)));
    uVar11 = CONCAT15(local_e38._2_1_,CONCAT14(local_1058._2_1_,uVar10));
    uVar2 = CONCAT17(local_e38._3_1_,CONCAT16(local_1058._3_1_,uVar11));
    uVar13 = CONCAT13(local_e38._5_1_,
                      CONCAT12(local_1058._5_1_,CONCAT11(local_e38._4_1_,local_1058._4_1_)));
    uVar14 = CONCAT15(local_e38._6_1_,CONCAT14(local_1058._6_1_,uVar13));
    uVar12 = CONCAT17(local_e38._7_1_,CONCAT16(local_1058._7_1_,uVar14));
    local_838._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_838._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_838._6_2_ = (short)((ulong)uVar2 >> 0x30);
    uStack_830._2_2_ = (short)((uint)uVar13 >> 0x10);
    uStack_830._4_2_ = (short)((uint6)uVar14 >> 0x20);
    uStack_830._6_2_ = (short)((ulong)uVar12 >> 0x30);
    local_888 = local_828 + CONCAT11((char)local_e38,(undefined1)local_1058);
    local_838._2_2_ = sStack_826 + local_838._2_2_;
    local_838._4_2_ = sStack_824 + local_838._4_2_;
    local_838._6_2_ = sStack_822 + local_838._6_2_;
    sStack_880 = sStack_820 + CONCAT11(local_e38._4_1_,local_1058._4_1_);
    uStack_830._2_2_ = sStack_81e + uStack_830._2_2_;
    uStack_830._4_2_ = sStack_81c + uStack_830._4_2_;
    uStack_830._6_2_ = sStack_81a + uStack_830._6_2_;
    local_5c8 = CONCAT26(local_7f8._6_2_,
                         CONCAT24(local_7f8._4_2_,CONCAT22(local_7f8._2_2_,local_848)));
    uStack_5c0 = CONCAT26(uStack_7f0._6_2_,
                          CONCAT24(uStack_7f0._4_2_,CONCAT22(uStack_7f0._2_2_,sStack_840)));
    uVar10 = CONCAT13(local_e38._1_1_,
                      CONCAT12(local_fb8._1_1_,CONCAT11((char)local_e38,(undefined1)local_fb8)));
    uVar11 = CONCAT15(local_e38._2_1_,CONCAT14(local_fb8._2_1_,uVar10));
    uVar43 = CONCAT17(local_e38._3_1_,CONCAT16(local_fb8._3_1_,uVar11));
    uVar13 = CONCAT13(local_e38._5_1_,
                      CONCAT12(local_fb8._5_1_,CONCAT11(local_e38._4_1_,local_fb8._4_1_)));
    uVar14 = CONCAT15(local_e38._6_1_,CONCAT14(local_fb8._6_1_,uVar13));
    uVar46 = CONCAT17(local_e38._7_1_,CONCAT16(local_fb8._7_1_,uVar14));
    local_5d8._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_5d8._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_5d8._6_2_ = (short)((ulong)uVar43 >> 0x30);
    uStack_5d0._2_2_ = (short)((uint)uVar13 >> 0x10);
    uStack_5d0._4_2_ = (short)((uint6)uVar14 >> 0x20);
    uStack_5d0._6_2_ = (short)((ulong)uVar46 >> 0x30);
    local_848 = local_848 - CONCAT11((char)local_e38,(undefined1)local_fb8);
    sStack_846 = local_7f8._2_2_ - local_5d8._2_2_;
    sStack_844 = local_7f8._4_2_ - local_5d8._4_2_;
    sStack_842 = local_7f8._6_2_ - local_5d8._6_2_;
    sStack_840 = sStack_840 - CONCAT11(local_e38._4_1_,local_fb8._4_1_);
    sStack_83e = uStack_7f0._2_2_ - uStack_5d0._2_2_;
    sStack_83c = uStack_7f0._4_2_ - uStack_5d0._4_2_;
    sStack_83a = uStack_7f0._6_2_ - uStack_5d0._6_2_;
    uVar10 = CONCAT13(local_e38._1_1_,
                      CONCAT12(local_fd8._1_1_,CONCAT11((char)local_e38,(undefined1)local_fd8)));
    uVar11 = CONCAT15(local_e38._2_1_,CONCAT14(local_fd8._2_1_,uVar10));
    uVar33 = CONCAT17(local_e38._3_1_,CONCAT16(local_fd8._3_1_,uVar11));
    uVar13 = CONCAT13(local_e38._5_1_,
                      CONCAT12(local_fd8._5_1_,CONCAT11(local_e38._4_1_,local_fd8._4_1_)));
    uVar14 = CONCAT15(local_e38._6_1_,CONCAT14(local_fd8._6_1_,uVar13));
    uVar39 = CONCAT17(local_e38._7_1_,CONCAT16(local_fd8._7_1_,uVar14));
    local_858._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_858._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_858._6_2_ = (short)((ulong)uVar33 >> 0x30);
    uStack_850._2_2_ = (short)((uint)uVar13 >> 0x10);
    uStack_850._4_2_ = (short)((uint6)uVar14 >> 0x20);
    uStack_850._6_2_ = (short)((ulong)uVar39 >> 0x30);
    local_8a8 = local_848 + CONCAT11((char)local_e38,(undefined1)local_fd8);
    local_858._2_2_ = sStack_846 + local_858._2_2_;
    local_858._4_2_ = sStack_844 + local_858._4_2_;
    local_858._6_2_ = sStack_842 + local_858._6_2_;
    sStack_8a0 = sStack_840 + CONCAT11(local_e38._4_1_,local_fd8._4_1_);
    uStack_850._2_2_ = sStack_83e + uStack_850._2_2_;
    uStack_850._4_2_ = sStack_83c + uStack_850._4_2_;
    uStack_850._6_2_ = sStack_83a + uStack_850._6_2_;
    local_868 = CONCAT26(local_838._6_2_,
                         CONCAT24(local_838._4_2_,CONCAT22(local_838._2_2_,local_888)));
    uStack_860 = CONCAT26(uStack_830._6_2_,
                          CONCAT24(uStack_830._4_2_,CONCAT22(uStack_830._2_2_,sStack_880)));
    local_878 = CONCAT26(local_858._6_2_,
                         CONCAT24(local_858._4_2_,CONCAT22(local_858._2_2_,local_8a8)));
    uStack_870 = CONCAT26(uStack_850._6_2_,
                          CONCAT24(uStack_850._4_2_,CONCAT22(uStack_850._2_2_,sStack_8a0)));
    local_c08 = local_888 + local_8a8;
    uStack_c06 = local_838._2_2_ + local_858._2_2_;
    uStack_c04 = local_838._4_2_ + local_858._4_2_;
    uStack_c02 = local_838._6_2_ + local_858._6_2_;
    uStack_c00 = sStack_880 + sStack_8a0;
    uStack_bfe = uStack_830._2_2_ + uStack_850._2_2_;
    uStack_bfc = uStack_830._4_2_ + uStack_850._4_2_;
    uStack_bfa = uStack_830._6_2_ + uStack_850._6_2_;
    local_c0c = 3;
    local_1338 = local_c08 >> 3;
    uStack_1336 = uStack_c06 >> 3;
    uStack_1334 = uStack_c04 >> 3;
    uStack_1332 = uStack_c02 >> 3;
    uStack_1330 = uStack_c00 >> 3;
    uStack_132e = uStack_bfe >> 3;
    uStack_132c = uStack_bfc >> 3;
    uStack_132a = uStack_bfa >> 3;
    local_5e8 = CONCAT26(local_838._6_2_,
                         CONCAT24(local_838._4_2_,CONCAT22(local_838._2_2_,local_888)));
    uStack_5e0 = CONCAT26(uStack_830._6_2_,
                          CONCAT24(uStack_830._4_2_,CONCAT22(uStack_830._2_2_,sStack_880)));
    uVar10 = CONCAT13(local_e38._1_1_,
                      CONCAT12(local_f78._1_1_,CONCAT11((char)local_e38,(undefined1)local_f78)));
    uVar11 = CONCAT15(local_e38._2_1_,CONCAT14(local_f78._2_1_,uVar10));
    uVar61 = CONCAT17(local_e38._3_1_,CONCAT16(local_f78._3_1_,uVar11));
    uVar13 = CONCAT13(local_e38._5_1_,
                      CONCAT12(local_f78._5_1_,CONCAT11(local_e38._4_1_,local_f78._4_1_)));
    uVar14 = CONCAT15(local_e38._6_1_,CONCAT14(local_f78._6_1_,uVar13));
    uVar64 = CONCAT17(local_e38._7_1_,CONCAT16(local_f78._7_1_,uVar14));
    local_5f8._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_5f8._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_5f8._6_2_ = (short)((ulong)uVar61 >> 0x30);
    uStack_5f0._2_2_ = (short)((uint)uVar13 >> 0x10);
    uStack_5f0._4_2_ = (short)((uint6)uVar14 >> 0x20);
    uStack_5f0._6_2_ = (short)((ulong)uVar64 >> 0x30);
    local_888 = local_888 - CONCAT11((char)local_e38,(undefined1)local_f78);
    sStack_886 = local_838._2_2_ - local_5f8._2_2_;
    sStack_884 = local_838._4_2_ - local_5f8._4_2_;
    sStack_882 = local_838._6_2_ - local_5f8._6_2_;
    sStack_880 = sStack_880 - CONCAT11(local_e38._4_1_,local_f78._4_1_);
    sStack_87e = uStack_830._2_2_ - uStack_5f0._2_2_;
    sStack_87c = uStack_830._4_2_ - uStack_5f0._4_2_;
    sStack_87a = uStack_830._6_2_ - uStack_5f0._6_2_;
    uVar10 = CONCAT13(local_e38._1_1_,
                      CONCAT12(local_1058._1_1_,CONCAT11((char)local_e38,(undefined1)local_1058)));
    uVar11 = CONCAT15(local_e38._2_1_,CONCAT14(local_1058._2_1_,uVar10));
    uVar3 = CONCAT17(local_e38._3_1_,CONCAT16(local_1058._3_1_,uVar11));
    uVar13 = CONCAT13(local_e38._5_1_,
                      CONCAT12(local_1058._5_1_,CONCAT11(local_e38._4_1_,local_1058._4_1_)));
    uVar14 = CONCAT15(local_e38._6_1_,CONCAT14(local_1058._6_1_,uVar13));
    uVar15 = CONCAT17(local_e38._7_1_,CONCAT16(local_1058._7_1_,uVar14));
    local_898._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_898._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_898._6_2_ = (short)((ulong)uVar3 >> 0x30);
    uStack_890._2_2_ = (short)((uint)uVar13 >> 0x10);
    uStack_890._4_2_ = (short)((uint6)uVar14 >> 0x20);
    uStack_890._6_2_ = (short)((ulong)uVar15 >> 0x30);
    local_8e8 = local_888 + CONCAT11((char)local_e38,(undefined1)local_1058);
    local_898._2_2_ = sStack_886 + local_898._2_2_;
    local_898._4_2_ = sStack_884 + local_898._4_2_;
    local_898._6_2_ = sStack_882 + local_898._6_2_;
    sStack_8e0 = sStack_880 + CONCAT11(local_e38._4_1_,local_1058._4_1_);
    uStack_890._2_2_ = sStack_87e + uStack_890._2_2_;
    uStack_890._4_2_ = sStack_87c + uStack_890._4_2_;
    uStack_890._6_2_ = sStack_87a + uStack_890._6_2_;
    local_608 = CONCAT26(local_858._6_2_,
                         CONCAT24(local_858._4_2_,CONCAT22(local_858._2_2_,local_8a8)));
    uStack_600 = CONCAT26(uStack_850._6_2_,
                          CONCAT24(uStack_850._4_2_,CONCAT22(uStack_850._2_2_,sStack_8a0)));
    uVar10 = CONCAT13(local_e38._1_1_,
                      CONCAT12(local_fd8._1_1_,CONCAT11((char)local_e38,(undefined1)local_fd8)));
    uVar11 = CONCAT15(local_e38._2_1_,CONCAT14(local_fd8._2_1_,uVar10));
    uVar34 = CONCAT17(local_e38._3_1_,CONCAT16(local_fd8._3_1_,uVar11));
    uVar13 = CONCAT13(local_e38._5_1_,
                      CONCAT12(local_fd8._5_1_,CONCAT11(local_e38._4_1_,local_fd8._4_1_)));
    uVar14 = CONCAT15(local_e38._6_1_,CONCAT14(local_fd8._6_1_,uVar13));
    uVar40 = CONCAT17(local_e38._7_1_,CONCAT16(local_fd8._7_1_,uVar14));
    local_618._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_618._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_618._6_2_ = (short)((ulong)uVar34 >> 0x30);
    uStack_610._2_2_ = (short)((uint)uVar13 >> 0x10);
    uStack_610._4_2_ = (short)((uint6)uVar14 >> 0x20);
    uStack_610._6_2_ = (short)((ulong)uVar40 >> 0x30);
    local_8a8 = local_8a8 - CONCAT11((char)local_e38,(undefined1)local_fd8);
    sStack_8a6 = local_858._2_2_ - local_618._2_2_;
    sStack_8a4 = local_858._4_2_ - local_618._4_2_;
    sStack_8a2 = local_858._6_2_ - local_618._6_2_;
    sStack_8a0 = sStack_8a0 - CONCAT11(local_e38._4_1_,local_fd8._4_1_);
    sStack_89e = uStack_850._2_2_ - uStack_610._2_2_;
    sStack_89c = uStack_850._4_2_ - uStack_610._4_2_;
    sStack_89a = uStack_850._6_2_ - uStack_610._6_2_;
    uVar10 = CONCAT13(local_e38._1_1_,
                      CONCAT12(local_ff8._1_1_,CONCAT11((char)local_e38,(undefined1)local_ff8)));
    uVar11 = CONCAT15(local_e38._2_1_,CONCAT14(local_ff8._2_1_,uVar10));
    uVar24 = CONCAT17(local_e38._3_1_,CONCAT16(local_ff8._3_1_,uVar11));
    uVar13 = CONCAT13(local_e38._5_1_,
                      CONCAT12(local_ff8._5_1_,CONCAT11(local_e38._4_1_,local_ff8._4_1_)));
    uVar14 = CONCAT15(local_e38._6_1_,CONCAT14(local_ff8._6_1_,uVar13));
    uVar27 = CONCAT17(local_e38._7_1_,CONCAT16(local_ff8._7_1_,uVar14));
    local_8b8._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_8b8._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_8b8._6_2_ = (short)((ulong)uVar24 >> 0x30);
    uStack_8b0._2_2_ = (short)((uint)uVar13 >> 0x10);
    uStack_8b0._4_2_ = (short)((uint6)uVar14 >> 0x20);
    uStack_8b0._6_2_ = (short)((ulong)uVar27 >> 0x30);
    local_908 = local_8a8 + CONCAT11((char)local_e38,(undefined1)local_ff8);
    local_8b8._2_2_ = sStack_8a6 + local_8b8._2_2_;
    local_8b8._4_2_ = sStack_8a4 + local_8b8._4_2_;
    local_8b8._6_2_ = sStack_8a2 + local_8b8._6_2_;
    sStack_900 = sStack_8a0 + CONCAT11(local_e38._4_1_,local_ff8._4_1_);
    uStack_8b0._2_2_ = sStack_89e + uStack_8b0._2_2_;
    uStack_8b0._4_2_ = sStack_89c + uStack_8b0._4_2_;
    uStack_8b0._6_2_ = sStack_89a + uStack_8b0._6_2_;
    local_8c8 = CONCAT26(local_898._6_2_,
                         CONCAT24(local_898._4_2_,CONCAT22(local_898._2_2_,local_8e8)));
    uStack_8c0 = CONCAT26(uStack_890._6_2_,
                          CONCAT24(uStack_890._4_2_,CONCAT22(uStack_890._2_2_,sStack_8e0)));
    local_8d8 = CONCAT26(local_8b8._6_2_,
                         CONCAT24(local_8b8._4_2_,CONCAT22(local_8b8._2_2_,local_908)));
    uStack_8d0 = CONCAT26(uStack_8b0._6_2_,
                          CONCAT24(uStack_8b0._4_2_,CONCAT22(uStack_8b0._2_2_,sStack_900)));
    local_c28 = local_8e8 + local_908;
    uStack_c26 = local_898._2_2_ + local_8b8._2_2_;
    uStack_c24 = local_898._4_2_ + local_8b8._4_2_;
    uStack_c22 = local_898._6_2_ + local_8b8._6_2_;
    uStack_c20 = sStack_8e0 + sStack_900;
    uStack_c1e = uStack_890._2_2_ + uStack_8b0._2_2_;
    uStack_c1c = uStack_890._4_2_ + uStack_8b0._4_2_;
    uStack_c1a = uStack_890._6_2_ + uStack_8b0._6_2_;
    local_c2c = 3;
    uVar90 = local_c28 >> 3;
    uVar91 = uStack_c26 >> 3;
    uVar98 = uStack_c24 >> 3;
    uVar99 = uStack_c22 >> 3;
    uVar102 = uStack_c20 >> 3;
    uVar103 = uStack_c1e >> 3;
    uVar106 = uStack_c1c >> 3;
    uVar107 = uStack_c1a >> 3;
    local_4e8 = CONCAT26(uStack_1332,CONCAT24(uStack_1334,CONCAT22(uStack_1336,local_1338)));
    uStack_4e0 = CONCAT26(uStack_132a,CONCAT24(uStack_132c,CONCAT22(uStack_132e,uStack_1330)));
    local_4f8 = CONCAT26(uVar99,CONCAT24(uVar98,CONCAT22(uVar91,uVar90)));
    uStack_4f0 = CONCAT26(uVar107,CONCAT24(uVar106,CONCAT22(uVar103,uVar102)));
    local_11d8 = (local_1338 != 0) * (local_1338 < 0x100) * (char)local_1338 - (0xff < local_1338);
    cStack_11d7 = (uStack_1336 != 0) * (uStack_1336 < 0x100) * (char)uStack_1336 -
                  (0xff < uStack_1336);
    cStack_11d6 = (uStack_1334 != 0) * (uStack_1334 < 0x100) * (char)uStack_1334 -
                  (0xff < uStack_1334);
    cStack_11d5 = (uStack_1332 != 0) * (uStack_1332 < 0x100) * (char)uStack_1332 -
                  (0xff < uStack_1332);
    cStack_11d4 = (uStack_1330 != 0) * (uStack_1330 < 0x100) * (char)uStack_1330 -
                  (0xff < uStack_1330);
    cStack_11d3 = (uStack_132e != 0) * (uStack_132e < 0x100) * (char)uStack_132e -
                  (0xff < uStack_132e);
    cStack_11d2 = (uStack_132c != 0) * (uStack_132c < 0x100) * (char)uStack_132c -
                  (0xff < uStack_132c);
    cStack_11d1 = (uStack_132a != 0) * (uStack_132a < 0x100) * (char)uStack_132a -
                  (0xff < uStack_132a);
    cStack_11d0 = (uVar90 != 0) * (uVar90 < 0x100) * (char)uVar90 - (0xff < uVar90);
    cStack_11cf = (uVar91 != 0) * (uVar91 < 0x100) * (char)uVar91 - (0xff < uVar91);
    cStack_11ce = (uVar98 != 0) * (uVar98 < 0x100) * (char)uVar98 - (0xff < uVar98);
    cStack_11cd = (uVar99 != 0) * (uVar99 < 0x100) * (char)uVar99 - (0xff < uVar99);
    cStack_11cc = (uVar102 != 0) * (uVar102 < 0x100) * (char)uVar102 - (0xff < uVar102);
    cStack_11cb = (uVar103 != 0) * (uVar103 < 0x100) * (char)uVar103 - (0xff < uVar103);
    cStack_11ca = (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 - (0xff < uVar106);
    cStack_11c9 = (uVar107 != 0) * (uVar107 < 0x100) * (char)uVar107 - (0xff < uVar107);
    local_628 = CONCAT26(local_898._6_2_,
                         CONCAT24(local_898._4_2_,CONCAT22(local_898._2_2_,local_8e8)));
    uStack_620 = CONCAT26(uStack_890._6_2_,
                          CONCAT24(uStack_890._4_2_,CONCAT22(uStack_890._2_2_,sStack_8e0)));
    uVar10 = CONCAT13(local_e38._1_1_,
                      CONCAT12(local_f98._1_1_,CONCAT11((char)local_e38,(undefined1)local_f98)));
    uVar11 = CONCAT15(local_e38._2_1_,CONCAT14(local_f98._2_1_,uVar10));
    uVar50 = CONCAT17(local_e38._3_1_,CONCAT16(local_f98._3_1_,uVar11));
    uVar13 = CONCAT13(local_e38._5_1_,
                      CONCAT12(local_f98._5_1_,CONCAT11(local_e38._4_1_,local_f98._4_1_)));
    uVar14 = CONCAT15(local_e38._6_1_,CONCAT14(local_f98._6_1_,uVar13));
    uVar54 = CONCAT17(local_e38._7_1_,CONCAT16(local_f98._7_1_,uVar14));
    local_638._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_638._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_638._6_2_ = (short)((ulong)uVar50 >> 0x30);
    uStack_630._2_2_ = (short)((uint)uVar13 >> 0x10);
    uStack_630._4_2_ = (short)((uint6)uVar14 >> 0x20);
    uStack_630._6_2_ = (short)((ulong)uVar54 >> 0x30);
    local_8e8 = local_8e8 - CONCAT11((char)local_e38,(undefined1)local_f98);
    sStack_8e6 = local_898._2_2_ - local_638._2_2_;
    sStack_8e4 = local_898._4_2_ - local_638._4_2_;
    sStack_8e2 = local_898._6_2_ - local_638._6_2_;
    sStack_8e0 = sStack_8e0 - CONCAT11(local_e38._4_1_,local_f98._4_1_);
    sStack_8de = uStack_890._2_2_ - uStack_630._2_2_;
    sStack_8dc = uStack_890._4_2_ - uStack_630._4_2_;
    sStack_8da = uStack_890._6_2_ - uStack_630._6_2_;
    uVar10 = CONCAT13(local_e38._1_1_,
                      CONCAT12(local_1058._1_1_,CONCAT11((char)local_e38,(undefined1)local_1058)));
    uVar11 = CONCAT15(local_e38._2_1_,CONCAT14(local_1058._2_1_,uVar10));
    uVar4 = CONCAT17(local_e38._3_1_,CONCAT16(local_1058._3_1_,uVar11));
    uVar13 = CONCAT13(local_e38._5_1_,
                      CONCAT12(local_1058._5_1_,CONCAT11(local_e38._4_1_,local_1058._4_1_)));
    uVar14 = CONCAT15(local_e38._6_1_,CONCAT14(local_1058._6_1_,uVar13));
    uVar16 = CONCAT17(local_e38._7_1_,CONCAT16(local_1058._7_1_,uVar14));
    local_8f8._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_8f8._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_8f8._6_2_ = (short)((ulong)uVar4 >> 0x30);
    uStack_8f0._2_2_ = (short)((uint)uVar13 >> 0x10);
    uStack_8f0._4_2_ = (short)((uint6)uVar14 >> 0x20);
    uStack_8f0._6_2_ = (short)((ulong)uVar16 >> 0x30);
    local_1318 = local_8e8 + CONCAT11((char)local_e38,(undefined1)local_1058);
    sStack_1316 = sStack_8e6 + local_8f8._2_2_;
    sStack_1314 = sStack_8e4 + local_8f8._4_2_;
    sStack_1312 = sStack_8e2 + local_8f8._6_2_;
    sStack_1310 = sStack_8e0 + CONCAT11(local_e38._4_1_,local_1058._4_1_);
    sStack_130e = sStack_8de + uStack_8f0._2_2_;
    sStack_130c = sStack_8dc + uStack_8f0._4_2_;
    sStack_130a = sStack_8da + uStack_8f0._6_2_;
    local_648 = CONCAT26(local_8b8._6_2_,
                         CONCAT24(local_8b8._4_2_,CONCAT22(local_8b8._2_2_,local_908)));
    uStack_640 = CONCAT26(uStack_8b0._6_2_,
                          CONCAT24(uStack_8b0._4_2_,CONCAT22(uStack_8b0._2_2_,sStack_900)));
    uVar10 = CONCAT13(local_e38._1_1_,
                      CONCAT12(local_ff8._1_1_,CONCAT11((char)local_e38,(undefined1)local_ff8)));
    uVar11 = CONCAT15(local_e38._2_1_,CONCAT14(local_ff8._2_1_,uVar10));
    uVar25 = CONCAT17(local_e38._3_1_,CONCAT16(local_ff8._3_1_,uVar11));
    uVar13 = CONCAT13(local_e38._5_1_,
                      CONCAT12(local_ff8._5_1_,CONCAT11(local_e38._4_1_,local_ff8._4_1_)));
    uVar14 = CONCAT15(local_e38._6_1_,CONCAT14(local_ff8._6_1_,uVar13));
    uVar28 = CONCAT17(local_e38._7_1_,CONCAT16(local_ff8._7_1_,uVar14));
    local_658._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_658._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_658._6_2_ = (short)((ulong)uVar25 >> 0x30);
    uStack_650._2_2_ = (short)((uint)uVar13 >> 0x10);
    uStack_650._4_2_ = (short)((uint6)uVar14 >> 0x20);
    uStack_650._6_2_ = (short)((ulong)uVar28 >> 0x30);
    local_908 = local_908 - CONCAT11((char)local_e38,(undefined1)local_ff8);
    sStack_906 = local_8b8._2_2_ - local_658._2_2_;
    sStack_904 = local_8b8._4_2_ - local_658._4_2_;
    sStack_902 = local_8b8._6_2_ - local_658._6_2_;
    sStack_900 = sStack_900 - CONCAT11(local_e38._4_1_,local_ff8._4_1_);
    sStack_8fe = uStack_8b0._2_2_ - uStack_650._2_2_;
    sStack_8fc = uStack_8b0._4_2_ - uStack_650._4_2_;
    sStack_8fa = uStack_8b0._6_2_ - uStack_650._6_2_;
    uVar10 = CONCAT13(local_e38._1_1_,
                      CONCAT12(local_1018._1_1_,CONCAT11((char)local_e38,(undefined1)local_1018)));
    uVar11 = CONCAT15(local_e38._2_1_,CONCAT14(local_1018._2_1_,uVar10));
    uVar56 = CONCAT17(local_e38._3_1_,CONCAT16(local_1018._3_1_,uVar11));
    uVar13 = CONCAT13(local_e38._5_1_,
                      CONCAT12(local_1018._5_1_,CONCAT11(local_e38._4_1_,local_1018._4_1_)));
    uVar14 = CONCAT15(local_e38._6_1_,CONCAT14(local_1018._6_1_,uVar13));
    uVar58 = CONCAT17(local_e38._7_1_,CONCAT16(local_1018._7_1_,uVar14));
    local_918._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_918._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_918._6_2_ = (short)((ulong)uVar56 >> 0x30);
    uStack_910._2_2_ = (short)((uint)uVar13 >> 0x10);
    uStack_910._4_2_ = (short)((uint6)uVar14 >> 0x20);
    uStack_910._6_2_ = (short)((ulong)uVar58 >> 0x30);
    local_1328 = local_908 + CONCAT11((char)local_e38,(undefined1)local_1018);
    sStack_1326 = sStack_906 + local_918._2_2_;
    sStack_1324 = sStack_904 + local_918._4_2_;
    sStack_1322 = sStack_902 + local_918._6_2_;
    sStack_1320 = sStack_900 + CONCAT11(local_e38._4_1_,local_1018._4_1_);
    sStack_131e = sStack_8fe + uStack_910._2_2_;
    sStack_131c = sStack_8fc + uStack_910._4_2_;
    sStack_131a = sStack_8fa + uStack_910._6_2_;
    local_928 = CONCAT26(sStack_1312,CONCAT24(sStack_1314,CONCAT22(sStack_1316,local_1318)));
    uStack_920 = CONCAT26(sStack_130a,CONCAT24(sStack_130c,CONCAT22(sStack_130e,sStack_1310)));
    local_938 = CONCAT26(sStack_1322,CONCAT24(sStack_1324,CONCAT22(sStack_1326,local_1328)));
    uStack_930 = CONCAT26(sStack_131a,CONCAT24(sStack_131c,CONCAT22(sStack_131e,sStack_1320)));
    local_c48 = local_1318 + local_1328;
    uStack_c46 = sStack_1316 + sStack_1326;
    uStack_c44 = sStack_1314 + sStack_1324;
    uStack_c42 = sStack_1312 + sStack_1322;
    uStack_c40 = sStack_1310 + sStack_1320;
    uStack_c3e = sStack_130e + sStack_131e;
    uStack_c3c = sStack_130c + sStack_131c;
    uStack_c3a = sStack_130a + sStack_131a;
    local_c4c = 3;
    local_1348 = local_c48 >> 3;
    uStack_1346 = uStack_c46 >> 3;
    uStack_1344 = uStack_c44 >> 3;
    uStack_1342 = uStack_c42 >> 3;
    uStack_1340 = uStack_c40 >> 3;
    uStack_133e = uStack_c3e >> 3;
    uStack_133c = uStack_c3c >> 3;
    uStack_133a = uStack_c3a >> 3;
    local_508 = CONCAT26(uStack_1352,CONCAT24(uStack_1354,CONCAT22(uStack_1356,local_1358)));
    uStack_500 = CONCAT26(uStack_134a,CONCAT24(uStack_134c,CONCAT22(uStack_134e,uStack_1350)));
    local_518 = CONCAT26(uStack_1342,CONCAT24(uStack_1344,CONCAT22(uStack_1346,local_1348)));
    uStack_510 = CONCAT26(uStack_133a,CONCAT24(uStack_133c,CONCAT22(uStack_133e,uStack_1340)));
    local_1268 = (local_1358 != 0) * (local_1358 < 0x100) * (char)local_1358 - (0xff < local_1358);
    cStack_1267 = (uStack_1356 != 0) * (uStack_1356 < 0x100) * (char)uStack_1356 -
                  (0xff < uStack_1356);
    cStack_1266 = (uStack_1354 != 0) * (uStack_1354 < 0x100) * (char)uStack_1354 -
                  (0xff < uStack_1354);
    cStack_1265 = (uStack_1352 != 0) * (uStack_1352 < 0x100) * (char)uStack_1352 -
                  (0xff < uStack_1352);
    cStack_1264 = (uStack_1350 != 0) * (uStack_1350 < 0x100) * (char)uStack_1350 -
                  (0xff < uStack_1350);
    cStack_1263 = (uStack_134e != 0) * (uStack_134e < 0x100) * (char)uStack_134e -
                  (0xff < uStack_134e);
    cStack_1262 = (uStack_134c != 0) * (uStack_134c < 0x100) * (char)uStack_134c -
                  (0xff < uStack_134c);
    cStack_1261 = (uStack_134a != 0) * (uStack_134a < 0x100) * (char)uStack_134a -
                  (0xff < uStack_134a);
    cStack_1260 = (local_1348 != 0) * (local_1348 < 0x100) * (char)local_1348 - (0xff < local_1348);
    cStack_125f = (uStack_1346 != 0) * (uStack_1346 < 0x100) * (char)uStack_1346 -
                  (0xff < uStack_1346);
    cStack_125e = (uStack_1344 != 0) * (uStack_1344 < 0x100) * (char)uStack_1344 -
                  (0xff < uStack_1344);
    cStack_125d = (uStack_1342 != 0) * (uStack_1342 < 0x100) * (char)uStack_1342 -
                  (0xff < uStack_1342);
    cStack_125c = (uStack_1340 != 0) * (uStack_1340 < 0x100) * (char)uStack_1340 -
                  (0xff < uStack_1340);
    cStack_125b = (uStack_133e != 0) * (uStack_133e < 0x100) * (char)uStack_133e -
                  (0xff < uStack_133e);
    cStack_125a = (uStack_133c != 0) * (uStack_133c < 0x100) * (char)uStack_133c -
                  (0xff < uStack_133c);
    cStack_1259 = (uStack_133a != 0) * (uStack_133a < 0x100) * (char)uStack_133a -
                  (0xff < uStack_133a);
    local_968 = local_11e8;
    uStack_960 = uStack_11e0;
    local_1258 = ~local_f68 & local_11e8;
    uStack_1250 = ~local_f68 & uStack_11e0;
    local_b38 = CONCAT17(cStack_1261,
                         CONCAT16(cStack_1262,
                                  CONCAT15(cStack_1263,
                                           CONCAT14(cStack_1264,
                                                    CONCAT13(cStack_1265,
                                                             CONCAT12(cStack_1266,
                                                                      CONCAT11(cStack_1267,
                                                                               local_1268)))))));
    uStack_b30 = CONCAT17(cStack_1259,
                          CONCAT16(cStack_125a,
                                   CONCAT15(cStack_125b,
                                            CONCAT14(cStack_125c,
                                                     CONCAT13(cStack_125d,
                                                              CONCAT12(cStack_125e,
                                                                       CONCAT11(cStack_125f,
                                                                                cStack_1260)))))));
    local_1278 = local_f68 & local_b38;
    uStack_1270 = local_f68 & uStack_b30;
    uVar113 = uStack_1250 | uStack_1270;
    local_1058 = lVar9;
    local_1038 = lVar8;
    local_1018 = uVar93;
    local_ff8 = lVar7;
    local_fd8 = lVar6;
    local_fb8 = uVar92;
    local_f98 = lVar5;
    local_f78 = uVar114;
    local_e38 = uVar1;
    local_b28 = local_f68;
    uStack_b20 = local_f68;
    local_9c8 = local_1278;
    uStack_9c0 = uStack_1270;
    local_9b8 = local_1258;
    uStack_9b0 = uStack_1250;
    local_958 = local_f68;
    uStack_950 = local_f68;
    local_918 = uVar56;
    uStack_910 = uVar58;
    local_8f8 = uVar4;
    uStack_8f0 = uVar16;
    local_8b8 = uVar24;
    uStack_8b0 = uVar27;
    local_898 = uVar3;
    uStack_890 = uVar15;
    local_858 = uVar33;
    uStack_850 = uVar39;
    local_838 = uVar2;
    uStack_830 = uVar12;
    local_7f8 = uVar42;
    uStack_7f0 = uVar45;
    local_7d8 = uVar55;
    uStack_7d0 = uVar57;
    local_798 = uVar48;
    uStack_790 = uVar52;
    local_778 = uVar23;
    uStack_770 = uVar26;
    local_768 = uVar30;
    uStack_760 = uVar36;
    local_738 = uVar17;
    uStack_730 = uVar20;
    local_718 = uVar60;
    uStack_710 = uVar63;
    local_708 = uVar29;
    uStack_700 = uVar35;
    local_6f8 = uVar41;
    uStack_6f0 = uVar44;
    local_6d8 = local_1308;
    uStack_6d0 = uStack_1300;
    local_698 = uVar47;
    uStack_690 = uVar51;
    local_688 = uVar59;
    uStack_680 = uVar62;
    local_668 = local_678;
    uStack_660 = uStack_670;
    local_658 = uVar25;
    uStack_650 = uVar28;
    local_638 = uVar50;
    uStack_630 = uVar54;
    local_618 = uVar34;
    uStack_610 = uVar40;
    local_5f8 = uVar61;
    uStack_5f0 = uVar64;
    local_5d8 = uVar43;
    uStack_5d0 = uVar46;
    local_5b8 = uVar19;
    uStack_5b0 = uVar22;
    local_598 = uVar49;
    uStack_590 = uVar53;
    local_578 = uVar18;
    uStack_570 = uVar21;
    local_28 = local_1308;
    uStack_20 = uStack_1300;
    *local_1090 = local_1258 | local_1278;
    puVar86[1] = uVar113;
    puVar86 = local_1098;
    *local_1098 = local_1090[1];
    puVar86[1] = 0;
    puVar86 = local_10c0;
    local_988 = *local_10c0;
    uStack_980 = local_10c0[1];
    local_978 = local_1128;
    uStack_970 = uStack_1120;
    local_1248 = ~local_1128 & local_988;
    uStack_1240 = ~uStack_1120 & uStack_980;
    local_b58 = CONCAT17(cStack_11d1,
                         CONCAT16(cStack_11d2,
                                  CONCAT15(cStack_11d3,
                                           CONCAT14(cStack_11d4,
                                                    CONCAT13(cStack_11d5,
                                                             CONCAT12(cStack_11d6,
                                                                      CONCAT11(cStack_11d7,
                                                                               local_11d8)))))));
    uStack_b50 = CONCAT17(cStack_11c9,
                          CONCAT16(cStack_11ca,
                                   CONCAT15(cStack_11cb,
                                            CONCAT14(cStack_11cc,
                                                     CONCAT13(cStack_11cd,
                                                              CONCAT12(cStack_11ce,
                                                                       CONCAT11(cStack_11cf,
                                                                                cStack_11d0)))))));
    local_b48 = local_1128;
    uStack_b40 = uStack_1120;
    local_1218 = local_1128 & local_b58;
    uStack_1210 = uStack_1120 & uStack_b50;
    uVar114 = uStack_1240 | uStack_1210;
    local_9e8 = local_1218;
    uStack_9e0 = uStack_1210;
    local_9d8 = local_1248;
    uStack_9d0 = uStack_1240;
    *local_10c0 = local_1248 | local_1218;
    puVar86[1] = uVar114;
    puVar86 = local_10c8;
    uVar114 = *local_10c8;
    uVar92 = local_10c8[1];
    local_998 = local_1128;
    uVar93 = local_998;
    uStack_990 = uStack_1120;
    uVar113 = uStack_990;
    local_998._0_4_ = (uint)local_1128;
    local_998._4_4_ = (uint)(local_1128 >> 0x20);
    uStack_990._0_4_ = (uint)uStack_1120;
    uStack_990._4_4_ = (uint)(uStack_1120 >> 0x20);
    local_9a8._0_4_ = (uint)uVar114;
    local_9a8._4_4_ = (uint)(uVar114 >> 0x20);
    uStack_9a0._0_4_ = (uint)uVar92;
    uStack_9a0._4_4_ = (uint)(uVar92 >> 0x20);
    local_1238 = ((uint)local_998 ^ 0xffffffff) & (uint)local_9a8;
    uStack_1234 = (local_998._4_4_ ^ 0xffffffff) & local_9a8._4_4_;
    uStack_1230 = ((uint)uStack_990 ^ 0xffffffff) & (uint)uStack_9a0;
    uStack_122c = (uStack_990._4_4_ ^ 0xffffffff) & uStack_9a0._4_4_;
    local_b78 = CONCAT17(cStack_11c1,
                         CONCAT16(cStack_11c2,
                                  CONCAT15(cStack_11c3,
                                           CONCAT14(cStack_11c4,
                                                    CONCAT13(cStack_11c5,
                                                             CONCAT12(cStack_11c6,
                                                                      CONCAT11(cStack_11c7,
                                                                               local_11c8)))))));
    uStack_b70 = CONCAT17(cStack_11b9,
                          CONCAT16(cStack_11ba,
                                   CONCAT15(cStack_11bb,
                                            CONCAT14(cStack_11bc,
                                                     CONCAT13(cStack_11bd,
                                                              CONCAT12(cStack_11be,
                                                                       CONCAT11(cStack_11bf,
                                                                                cStack_11c0)))))));
    local_b68 = local_1128;
    uStack_b60 = uStack_1120;
    local_1228 = local_1128 & local_b78;
    uStack_1220 = uStack_1120 & uStack_b70;
    local_9f8 = CONCAT44(uStack_1234,local_1238);
    uStack_9f0 = CONCAT44(uStack_122c,uStack_1230);
    uVar115 = uStack_9f0 | uStack_1220;
    local_a08 = local_1228;
    uStack_a00 = uStack_1220;
    local_9a8 = uVar114;
    uStack_9a0 = uVar92;
    local_998 = uVar93;
    uStack_990 = uVar113;
    *local_10c8 = local_9f8 | local_1228;
    puVar86[1] = uVar115;
    uVar1 = local_e38;
  }
  local_e38 = uVar1;
  local_1738 = uStack_1720;
  uStack_1730 = 0;
  local_1748 = uStack_1710;
  uStack_1740 = 0;
  transpose8x8_sse2((__m128i *)&local_1778,(__m128i *)&local_1768,(__m128i *)&local_1758,
                    (__m128i *)local_1708,(__m128i *)&local_1788,(__m128i *)0x3ec03d,x6_00,x7_00,
                    d0d1_00,(__m128i *)CONCAT44(uVar131,uVar130),
                    (__m128i *)CONCAT44(uVar133,uVar132),(__m128i *)CONCAT44(uVar135,uVar134));
  *(longlong *)(local_15f0 + -4) = local_1758;
  *(ulong *)(local_15f0 + -4 + (long)local_15f4) = uStack_1750;
  *(ulong *)(local_15f0 + -4 + (long)(local_15f4 * 2)) = local_1768;
  *(ulong *)(local_15f0 + -4 + (long)(local_15f4 * 3)) = uStack_1760;
  *(longlong *)(local_15f0 + -4 + (long)(local_15f4 << 2)) = local_1778;
  *(longlong *)(local_15f0 + -4 + (long)(local_15f4 * 5)) = lStack_1770;
  *(ulong *)(local_15f0 + -4 + (long)(local_15f4 * 6)) = local_1788;
  *(longlong *)(local_15f0 + -4 + (long)(local_15f4 * 7)) = lStack_1780;
  return;
}

Assistant:

void aom_lpf_vertical_8_dual_sse2(uint8_t *s, int p, const uint8_t *_blimit0,
                                  const uint8_t *_limit0,
                                  const uint8_t *_thresh0,
                                  const uint8_t *_blimit1,
                                  const uint8_t *_limit1,
                                  const uint8_t *_thresh1) {
  __m128i blimit = _mm_unpacklo_epi32(_mm_load_si128((__m128i *)_blimit0),
                                      _mm_load_si128((__m128i *)_blimit1));
  __m128i limit = _mm_unpacklo_epi32(_mm_load_si128((__m128i *)_limit0),
                                     _mm_load_si128((__m128i *)_limit1));
  __m128i thresh = _mm_unpacklo_epi32(_mm_load_si128((__m128i *)_thresh0),
                                      _mm_load_si128((__m128i *)_thresh1));

  __m128i x0, x1, x2, x3, x4, x5, x6, x7;
  __m128i d1, d3, d5, d7;
  __m128i q1q0, p1p0;
  __m128i p1, q1;
  __m128i d0d1, d2d3, d4d5, d6d7;

  x0 = _mm_loadl_epi64((__m128i *)(s - 4 + 0 * p));
  x1 = _mm_loadl_epi64((__m128i *)(s - 4 + 1 * p));
  x2 = _mm_loadl_epi64((__m128i *)(s - 4 + 2 * p));
  x3 = _mm_loadl_epi64((__m128i *)(s - 4 + 3 * p));
  x4 = _mm_loadl_epi64((__m128i *)(s - 4 + 4 * p));
  x5 = _mm_loadl_epi64((__m128i *)(s - 4 + 5 * p));
  x6 = _mm_loadl_epi64((__m128i *)(s - 4 + 6 * p));
  x7 = _mm_loadl_epi64((__m128i *)(s - 4 + 7 * p));

  transpose8x8_sse2(&x0, &x1, &x2, &x3, &x4, &x5, &x6, &x7, &d0d1, &d2d3, &d4d5,
                    &d6d7);

  d1 = _mm_srli_si128(d0d1, 8);
  d3 = _mm_srli_si128(d2d3, 8);
  d5 = _mm_srli_si128(d4d5, 8);
  d7 = _mm_srli_si128(d6d7, 8);

  lpf_internal_8_dual_sse2(&d0d1, &d7, &d1, &d6d7, &d2d3, &d5, &d3, &d4d5,
                           &q1q0, &p1p0, &blimit, &limit, &thresh);

  p1 = _mm_srli_si128(p1p0, 8);
  q1 = _mm_srli_si128(q1q0, 8);

  transpose8x8_sse2(&d0d1, &d1, &p1, &p1p0, &q1q0, &q1, &d6d7, &d7, &d0d1,
                    &d2d3, &d4d5, &d6d7);

  _mm_storel_epi64((__m128i *)(s - 4 + 0 * p), d0d1);
  _mm_storel_epi64((__m128i *)(s - 4 + 1 * p), _mm_srli_si128(d0d1, 8));
  _mm_storel_epi64((__m128i *)(s - 4 + 2 * p), d2d3);
  _mm_storel_epi64((__m128i *)(s - 4 + 3 * p), _mm_srli_si128(d2d3, 8));
  _mm_storel_epi64((__m128i *)(s - 4 + 4 * p), d4d5);
  _mm_storel_epi64((__m128i *)(s - 4 + 5 * p), _mm_srli_si128(d4d5, 8));
  _mm_storel_epi64((__m128i *)(s - 4 + 6 * p), d6d7);
  _mm_storel_epi64((__m128i *)(s - 4 + 7 * p), _mm_srli_si128(d6d7, 8));
}